

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  code *pcVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  uint uVar122;
  int iVar123;
  RTCIntersectArguments *pRVar124;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar149 [32];
  undefined1 auVar161 [16];
  long lVar125;
  ulong uVar126;
  undefined1 auVar127 [8];
  ulong uVar128;
  bool bVar129;
  long lVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [28];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar158;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar165;
  undefined1 auVar153 [32];
  float fVar159;
  float fVar164;
  float fVar166;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar176;
  undefined1 auVar175 [32];
  float fVar177;
  float fVar178;
  float fVar198;
  undefined1 auVar180 [16];
  float fVar179;
  float fVar194;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar193;
  float fVar196;
  float fVar200;
  float fVar203;
  float fVar205;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar195;
  float fVar197;
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  float fVar207;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar220;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [64];
  float fVar221;
  float fVar230;
  float fVar231;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar225 [32];
  float fVar232;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar246;
  undefined1 auVar245 [32];
  float fVar247;
  undefined1 auVar248 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar263;
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar277;
  float fVar278;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar280;
  undefined1 auVar266 [32];
  float fVar271;
  float fVar275;
  float fVar276;
  float fVar279;
  float fVar281;
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  float fVar282;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float in_register_0000151c;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar316;
  float fVar319;
  float fVar320;
  float fVar321;
  float in_register_0000159c;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar322;
  float fVar327;
  float fVar328;
  undefined1 auVar323 [16];
  float fVar329;
  float in_register_000015dc;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7ac;
  Precalculations *local_7a8;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  ulong local_6e8;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  undefined1 auStack_658 [24];
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 auStack_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar138 [32];
  
  PVar19 = prim[1];
  uVar128 = (ulong)(byte)PVar19;
  lVar125 = uVar128 * 5;
  fVar178 = *(float *)(prim + uVar128 * 0x19 + 0x12);
  auVar161 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar128 * 0x19 + 6));
  auVar222._0_4_ = fVar178 * (ray->dir).field_0.m128[0];
  auVar222._4_4_ = fVar178 * (ray->dir).field_0.m128[1];
  auVar222._8_4_ = fVar178 * (ray->dir).field_0.m128[2];
  auVar222._12_4_ = fVar178 * (ray->dir).field_0.m128[3];
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 10)));
  auVar147._0_4_ = fVar178 * auVar161._0_4_;
  auVar147._4_4_ = fVar178 * auVar161._4_4_;
  auVar147._8_4_ = fVar178 * auVar161._8_4_;
  auVar147._12_4_ = fVar178 * auVar161._12_4_;
  auVar135._16_16_ = auVar182;
  auVar135._0_16_ = auVar168;
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar125 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar125 + 10)));
  auVar172._16_16_ = auVar182;
  auVar172._0_16_ = auVar168;
  auVar284 = vcvtdq2ps_avx(auVar172);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 10)));
  auVar185._16_16_ = auVar182;
  auVar185._0_16_ = auVar168;
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 10)));
  auVar24 = vcvtdq2ps_avx(auVar185);
  auVar186._16_16_ = auVar182;
  auVar186._0_16_ = auVar168;
  auVar25 = vcvtdq2ps_avx(auVar186);
  uVar126 = (ulong)((uint)(byte)PVar19 * 0xc);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 10)));
  auVar237._16_16_ = auVar182;
  auVar237._0_16_ = auVar168;
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + uVar128 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar237);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + uVar128 + 10)));
  auVar249._16_16_ = auVar182;
  auVar249._0_16_ = auVar168;
  lVar130 = uVar128 * 9;
  uVar126 = (ulong)(uint)((int)lVar130 * 2);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar249);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 10)));
  auVar250._16_16_ = auVar182;
  auVar250._0_16_ = auVar168;
  auVar28 = vcvtdq2ps_avx(auVar250);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + uVar128 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + uVar128 + 10)));
  auVar283._16_16_ = auVar182;
  auVar283._0_16_ = auVar168;
  uVar126 = (ulong)(uint)((int)lVar125 << 2);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar283);
  auVar298._16_16_ = auVar182;
  auVar298._0_16_ = auVar168;
  auVar30 = vcvtdq2ps_avx(auVar298);
  auVar168 = vshufps_avx(auVar222,auVar222,0);
  auVar182 = vshufps_avx(auVar222,auVar222,0x55);
  auVar161 = vshufps_avx(auVar222,auVar222,0xaa);
  fVar178 = auVar161._0_4_;
  fVar193 = auVar161._4_4_;
  fVar196 = auVar161._8_4_;
  fVar198 = auVar161._12_4_;
  fVar200 = auVar182._0_4_;
  fVar203 = auVar182._4_4_;
  fVar205 = auVar182._8_4_;
  fVar207 = auVar182._12_4_;
  fVar214 = auVar168._0_4_;
  fVar215 = auVar168._4_4_;
  fVar216 = auVar168._8_4_;
  fVar217 = auVar168._12_4_;
  auVar304._0_4_ = fVar214 * auVar135._0_4_ + fVar200 * auVar284._0_4_ + fVar178 * auVar24._0_4_;
  auVar304._4_4_ = fVar215 * auVar135._4_4_ + fVar203 * auVar284._4_4_ + fVar193 * auVar24._4_4_;
  auVar304._8_4_ = fVar216 * auVar135._8_4_ + fVar205 * auVar284._8_4_ + fVar196 * auVar24._8_4_;
  auVar304._12_4_ = fVar217 * auVar135._12_4_ + fVar207 * auVar284._12_4_ + fVar198 * auVar24._12_4_
  ;
  auVar304._16_4_ = fVar214 * auVar135._16_4_ + fVar200 * auVar284._16_4_ + fVar178 * auVar24._16_4_
  ;
  auVar304._20_4_ = fVar215 * auVar135._20_4_ + fVar203 * auVar284._20_4_ + fVar193 * auVar24._20_4_
  ;
  auVar304._24_4_ = fVar216 * auVar135._24_4_ + fVar205 * auVar284._24_4_ + fVar196 * auVar24._24_4_
  ;
  auVar304._28_4_ = fVar207 + in_register_000015dc + in_register_0000151c;
  auVar302._0_4_ = fVar214 * auVar25._0_4_ + fVar200 * auVar26._0_4_ + auVar27._0_4_ * fVar178;
  auVar302._4_4_ = fVar215 * auVar25._4_4_ + fVar203 * auVar26._4_4_ + auVar27._4_4_ * fVar193;
  auVar302._8_4_ = fVar216 * auVar25._8_4_ + fVar205 * auVar26._8_4_ + auVar27._8_4_ * fVar196;
  auVar302._12_4_ = fVar217 * auVar25._12_4_ + fVar207 * auVar26._12_4_ + auVar27._12_4_ * fVar198;
  auVar302._16_4_ = fVar214 * auVar25._16_4_ + fVar200 * auVar26._16_4_ + auVar27._16_4_ * fVar178;
  auVar302._20_4_ = fVar215 * auVar25._20_4_ + fVar203 * auVar26._20_4_ + auVar27._20_4_ * fVar193;
  auVar302._24_4_ = fVar216 * auVar25._24_4_ + fVar205 * auVar26._24_4_ + auVar27._24_4_ * fVar196;
  auVar302._28_4_ = fVar207 + in_register_000015dc + in_register_0000159c;
  auVar225._0_4_ = fVar214 * auVar28._0_4_ + fVar200 * auVar29._0_4_ + auVar30._0_4_ * fVar178;
  auVar225._4_4_ = fVar215 * auVar28._4_4_ + fVar203 * auVar29._4_4_ + auVar30._4_4_ * fVar193;
  auVar225._8_4_ = fVar216 * auVar28._8_4_ + fVar205 * auVar29._8_4_ + auVar30._8_4_ * fVar196;
  auVar225._12_4_ = fVar217 * auVar28._12_4_ + fVar207 * auVar29._12_4_ + auVar30._12_4_ * fVar198;
  auVar225._16_4_ = fVar214 * auVar28._16_4_ + fVar200 * auVar29._16_4_ + auVar30._16_4_ * fVar178;
  auVar225._20_4_ = fVar215 * auVar28._20_4_ + fVar203 * auVar29._20_4_ + auVar30._20_4_ * fVar193;
  auVar225._24_4_ = fVar216 * auVar28._24_4_ + fVar205 * auVar29._24_4_ + auVar30._24_4_ * fVar196;
  auVar225._28_4_ = fVar217 + fVar207 + fVar198;
  auVar168 = vshufps_avx(auVar147,auVar147,0);
  auVar182 = vshufps_avx(auVar147,auVar147,0x55);
  auVar161 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar193 = auVar161._0_4_;
  fVar196 = auVar161._4_4_;
  fVar198 = auVar161._8_4_;
  fVar200 = auVar161._12_4_;
  fVar215 = auVar182._0_4_;
  fVar216 = auVar182._4_4_;
  fVar217 = auVar182._8_4_;
  fVar218 = auVar182._12_4_;
  fVar203 = auVar168._0_4_;
  fVar205 = auVar168._4_4_;
  fVar207 = auVar168._8_4_;
  fVar214 = auVar168._12_4_;
  fVar178 = auVar135._28_4_;
  auVar238._0_4_ = fVar203 * auVar135._0_4_ + fVar215 * auVar284._0_4_ + fVar193 * auVar24._0_4_;
  auVar238._4_4_ = fVar205 * auVar135._4_4_ + fVar216 * auVar284._4_4_ + fVar196 * auVar24._4_4_;
  auVar238._8_4_ = fVar207 * auVar135._8_4_ + fVar217 * auVar284._8_4_ + fVar198 * auVar24._8_4_;
  auVar238._12_4_ = fVar214 * auVar135._12_4_ + fVar218 * auVar284._12_4_ + fVar200 * auVar24._12_4_
  ;
  auVar238._16_4_ = fVar203 * auVar135._16_4_ + fVar215 * auVar284._16_4_ + fVar193 * auVar24._16_4_
  ;
  auVar238._20_4_ = fVar205 * auVar135._20_4_ + fVar216 * auVar284._20_4_ + fVar196 * auVar24._20_4_
  ;
  auVar238._24_4_ = fVar207 * auVar135._24_4_ + fVar217 * auVar284._24_4_ + fVar198 * auVar24._24_4_
  ;
  auVar238._28_4_ = fVar178 + auVar284._28_4_ + auVar24._28_4_;
  auVar149._0_4_ = fVar203 * auVar25._0_4_ + auVar27._0_4_ * fVar193 + fVar215 * auVar26._0_4_;
  auVar149._4_4_ = fVar205 * auVar25._4_4_ + auVar27._4_4_ * fVar196 + fVar216 * auVar26._4_4_;
  auVar149._8_4_ = fVar207 * auVar25._8_4_ + auVar27._8_4_ * fVar198 + fVar217 * auVar26._8_4_;
  auVar149._12_4_ = fVar214 * auVar25._12_4_ + auVar27._12_4_ * fVar200 + fVar218 * auVar26._12_4_;
  auVar149._16_4_ = fVar203 * auVar25._16_4_ + auVar27._16_4_ * fVar193 + fVar215 * auVar26._16_4_;
  auVar149._20_4_ = fVar205 * auVar25._20_4_ + auVar27._20_4_ * fVar196 + fVar216 * auVar26._20_4_;
  auVar149._24_4_ = fVar207 * auVar25._24_4_ + auVar27._24_4_ * fVar198 + fVar217 * auVar26._24_4_;
  auVar149._28_4_ = fVar178 + auVar27._28_4_ + auVar24._28_4_;
  auVar251._8_4_ = 0x7fffffff;
  auVar251._0_8_ = 0x7fffffff7fffffff;
  auVar251._12_4_ = 0x7fffffff;
  auVar251._16_4_ = 0x7fffffff;
  auVar251._20_4_ = 0x7fffffff;
  auVar251._24_4_ = 0x7fffffff;
  auVar251._28_4_ = 0x7fffffff;
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar173._16_4_ = 0x219392ef;
  auVar173._20_4_ = 0x219392ef;
  auVar173._24_4_ = 0x219392ef;
  auVar173._28_4_ = 0x219392ef;
  auVar135 = vandps_avx(auVar304,auVar251);
  auVar135 = vcmpps_avx(auVar135,auVar173,1);
  auVar284 = vblendvps_avx(auVar304,auVar173,auVar135);
  auVar135 = vandps_avx(auVar302,auVar251);
  auVar135 = vcmpps_avx(auVar135,auVar173,1);
  auVar24 = vblendvps_avx(auVar302,auVar173,auVar135);
  auVar135 = vandps_avx(auVar225,auVar251);
  auVar135 = vcmpps_avx(auVar135,auVar173,1);
  auVar135 = vblendvps_avx(auVar225,auVar173,auVar135);
  auVar174._0_4_ = fVar215 * auVar29._0_4_ + auVar30._0_4_ * fVar193 + fVar203 * auVar28._0_4_;
  auVar174._4_4_ = fVar216 * auVar29._4_4_ + auVar30._4_4_ * fVar196 + fVar205 * auVar28._4_4_;
  auVar174._8_4_ = fVar217 * auVar29._8_4_ + auVar30._8_4_ * fVar198 + fVar207 * auVar28._8_4_;
  auVar174._12_4_ = fVar218 * auVar29._12_4_ + auVar30._12_4_ * fVar200 + fVar214 * auVar28._12_4_;
  auVar174._16_4_ = fVar215 * auVar29._16_4_ + auVar30._16_4_ * fVar193 + fVar203 * auVar28._16_4_;
  auVar174._20_4_ = fVar216 * auVar29._20_4_ + auVar30._20_4_ * fVar196 + fVar205 * auVar28._20_4_;
  auVar174._24_4_ = fVar217 * auVar29._24_4_ + auVar30._24_4_ * fVar198 + fVar207 * auVar28._24_4_;
  auVar174._28_4_ = auVar26._28_4_ + fVar200 + fVar178;
  auVar25 = vrcpps_avx(auVar284);
  fVar178 = auVar25._0_4_;
  fVar193 = auVar25._4_4_;
  auVar26._4_4_ = auVar284._4_4_ * fVar193;
  auVar26._0_4_ = auVar284._0_4_ * fVar178;
  fVar196 = auVar25._8_4_;
  auVar26._8_4_ = auVar284._8_4_ * fVar196;
  fVar198 = auVar25._12_4_;
  auVar26._12_4_ = auVar284._12_4_ * fVar198;
  fVar200 = auVar25._16_4_;
  auVar26._16_4_ = auVar284._16_4_ * fVar200;
  fVar203 = auVar25._20_4_;
  auVar26._20_4_ = auVar284._20_4_ * fVar203;
  fVar205 = auVar25._24_4_;
  auVar26._24_4_ = auVar284._24_4_ * fVar205;
  auVar26._28_4_ = auVar284._28_4_;
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = 0x3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar264._16_4_ = 0x3f800000;
  auVar264._20_4_ = 0x3f800000;
  auVar264._24_4_ = 0x3f800000;
  auVar264._28_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar264,auVar26);
  auVar284 = vrcpps_avx(auVar24);
  fVar178 = fVar178 + fVar178 * auVar26._0_4_;
  fVar193 = fVar193 + fVar193 * auVar26._4_4_;
  fVar196 = fVar196 + fVar196 * auVar26._8_4_;
  fVar198 = fVar198 + fVar198 * auVar26._12_4_;
  fVar200 = fVar200 + fVar200 * auVar26._16_4_;
  fVar203 = fVar203 + fVar203 * auVar26._20_4_;
  fVar205 = fVar205 + fVar205 * auVar26._24_4_;
  fVar221 = auVar284._0_4_;
  fVar230 = auVar284._4_4_;
  auVar27._4_4_ = fVar230 * auVar24._4_4_;
  auVar27._0_4_ = fVar221 * auVar24._0_4_;
  fVar231 = auVar284._8_4_;
  auVar27._8_4_ = fVar231 * auVar24._8_4_;
  fVar232 = auVar284._12_4_;
  auVar27._12_4_ = fVar232 * auVar24._12_4_;
  fVar233 = auVar284._16_4_;
  auVar27._16_4_ = fVar233 * auVar24._16_4_;
  fVar234 = auVar284._20_4_;
  auVar27._20_4_ = fVar234 * auVar24._20_4_;
  fVar235 = auVar284._24_4_;
  auVar27._24_4_ = fVar235 * auVar24._24_4_;
  auVar27._28_4_ = auVar25._28_4_;
  auVar284 = vsubps_avx(auVar264,auVar27);
  fVar221 = fVar221 + fVar221 * auVar284._0_4_;
  fVar230 = fVar230 + fVar230 * auVar284._4_4_;
  fVar231 = fVar231 + fVar231 * auVar284._8_4_;
  fVar232 = fVar232 + fVar232 * auVar284._12_4_;
  fVar233 = fVar233 + fVar233 * auVar284._16_4_;
  fVar234 = fVar234 + fVar234 * auVar284._20_4_;
  fVar235 = fVar235 + fVar235 * auVar284._24_4_;
  auVar284 = vrcpps_avx(auVar135);
  fVar207 = auVar284._0_4_;
  fVar214 = auVar284._4_4_;
  auVar28._4_4_ = fVar214 * auVar135._4_4_;
  auVar28._0_4_ = fVar207 * auVar135._0_4_;
  fVar215 = auVar284._8_4_;
  auVar28._8_4_ = fVar215 * auVar135._8_4_;
  fVar216 = auVar284._12_4_;
  auVar28._12_4_ = fVar216 * auVar135._12_4_;
  fVar217 = auVar284._16_4_;
  auVar28._16_4_ = fVar217 * auVar135._16_4_;
  fVar218 = auVar284._20_4_;
  auVar28._20_4_ = fVar218 * auVar135._20_4_;
  fVar219 = auVar284._24_4_;
  auVar28._24_4_ = fVar219 * auVar135._24_4_;
  auVar28._28_4_ = auVar24._28_4_;
  auVar135 = vsubps_avx(auVar264,auVar28);
  fVar207 = fVar207 + fVar207 * auVar135._0_4_;
  fVar214 = fVar214 + fVar214 * auVar135._4_4_;
  fVar215 = fVar215 + fVar215 * auVar135._8_4_;
  fVar216 = fVar216 + fVar216 * auVar135._12_4_;
  fVar217 = fVar217 + fVar217 * auVar135._16_4_;
  fVar218 = fVar218 + fVar218 * auVar135._20_4_;
  fVar219 = fVar219 + fVar219 * auVar135._24_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar168 = vpmovsxwd_avx(auVar168);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar128 * 7 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar182);
  auVar136._16_16_ = auVar182;
  auVar136._0_16_ = auVar168;
  auVar135 = vcvtdq2ps_avx(auVar136);
  auVar135 = vsubps_avx(auVar135,auVar238);
  auVar131._0_4_ = fVar178 * auVar135._0_4_;
  auVar131._4_4_ = fVar193 * auVar135._4_4_;
  auVar131._8_4_ = fVar196 * auVar135._8_4_;
  auVar131._12_4_ = fVar198 * auVar135._12_4_;
  auVar24._16_4_ = fVar200 * auVar135._16_4_;
  auVar24._0_16_ = auVar131;
  auVar24._20_4_ = fVar203 * auVar135._20_4_;
  auVar24._24_4_ = fVar205 * auVar135._24_4_;
  auVar24._28_4_ = auVar135._28_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + lVar130 + 6);
  auVar168 = vpmovsxwd_avx(auVar161);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar130 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar10);
  auVar252._16_16_ = auVar182;
  auVar252._0_16_ = auVar168;
  auVar135 = vcvtdq2ps_avx(auVar252);
  auVar135 = vsubps_avx(auVar135,auVar238);
  auVar180._0_4_ = fVar178 * auVar135._0_4_;
  auVar180._4_4_ = fVar193 * auVar135._4_4_;
  auVar180._8_4_ = fVar196 * auVar135._8_4_;
  auVar180._12_4_ = fVar198 * auVar135._12_4_;
  auVar29._16_4_ = fVar200 * auVar135._16_4_;
  auVar29._0_16_ = auVar180;
  auVar29._20_4_ = fVar203 * auVar135._20_4_;
  auVar29._24_4_ = fVar205 * auVar135._24_4_;
  auVar29._28_4_ = auVar25._28_4_ + auVar26._28_4_;
  lVar125 = (ulong)(byte)PVar19 * 0x10;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar168 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar12);
  lVar125 = lVar125 + uVar128 * -2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar161 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar10 = vpmovsxwd_avx(auVar14);
  auVar239._16_16_ = auVar10;
  auVar239._0_16_ = auVar161;
  auVar135 = vcvtdq2ps_avx(auVar239);
  auVar135 = vsubps_avx(auVar135,auVar149);
  auVar236._0_4_ = fVar221 * auVar135._0_4_;
  auVar236._4_4_ = fVar230 * auVar135._4_4_;
  auVar236._8_4_ = fVar231 * auVar135._8_4_;
  auVar236._12_4_ = fVar232 * auVar135._12_4_;
  auVar25._16_4_ = fVar233 * auVar135._16_4_;
  auVar25._0_16_ = auVar236;
  auVar25._20_4_ = fVar234 * auVar135._20_4_;
  auVar25._24_4_ = fVar235 * auVar135._24_4_;
  auVar25._28_4_ = auVar135._28_4_;
  auVar253._16_16_ = auVar182;
  auVar253._0_16_ = auVar168;
  auVar135 = vcvtdq2ps_avx(auVar253);
  auVar135 = vsubps_avx(auVar135,auVar149);
  auVar148._0_4_ = fVar221 * auVar135._0_4_;
  auVar148._4_4_ = fVar230 * auVar135._4_4_;
  auVar148._8_4_ = fVar231 * auVar135._8_4_;
  auVar148._12_4_ = fVar232 * auVar135._12_4_;
  auVar284._16_4_ = fVar233 * auVar135._16_4_;
  auVar284._0_16_ = auVar148;
  auVar284._20_4_ = fVar234 * auVar135._20_4_;
  auVar284._24_4_ = fVar235 * auVar135._24_4_;
  auVar284._28_4_ = auVar135._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar126 + uVar128 + 6);
  auVar168 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar126 + uVar128 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar16);
  auVar226._16_16_ = auVar182;
  auVar226._0_16_ = auVar168;
  auVar135 = vcvtdq2ps_avx(auVar226);
  auVar135 = vsubps_avx(auVar135,auVar174);
  auVar223._0_4_ = fVar207 * auVar135._0_4_;
  auVar223._4_4_ = fVar214 * auVar135._4_4_;
  auVar223._8_4_ = fVar215 * auVar135._8_4_;
  auVar223._12_4_ = fVar216 * auVar135._12_4_;
  auVar30._16_4_ = fVar217 * auVar135._16_4_;
  auVar30._0_16_ = auVar223;
  auVar30._20_4_ = fVar218 * auVar135._20_4_;
  auVar30._24_4_ = fVar219 * auVar135._24_4_;
  auVar30._28_4_ = auVar135._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 6);
  auVar168 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 0xe);
  auVar182 = vpmovsxwd_avx(auVar18);
  auVar254._16_16_ = auVar182;
  auVar254._0_16_ = auVar168;
  auVar135 = vcvtdq2ps_avx(auVar254);
  auVar135 = vsubps_avx(auVar135,auVar174);
  auVar167._0_4_ = fVar207 * auVar135._0_4_;
  auVar167._4_4_ = fVar214 * auVar135._4_4_;
  auVar167._8_4_ = fVar215 * auVar135._8_4_;
  auVar167._12_4_ = fVar216 * auVar135._12_4_;
  auVar31._16_4_ = fVar217 * auVar135._16_4_;
  auVar31._0_16_ = auVar167;
  auVar31._20_4_ = fVar218 * auVar135._20_4_;
  auVar31._24_4_ = fVar219 * auVar135._24_4_;
  auVar31._28_4_ = auVar135._28_4_;
  auVar168 = vpminsd_avx(auVar24._16_16_,auVar29._16_16_);
  auVar182 = vpminsd_avx(auVar131,auVar180);
  auVar265._16_16_ = auVar168;
  auVar265._0_16_ = auVar182;
  auVar161 = auVar284._16_16_;
  auVar290 = ZEXT1664(auVar161);
  auVar168 = vpminsd_avx(auVar25._16_16_,auVar161);
  auVar182 = vpminsd_avx(auVar236,auVar148);
  auVar303._16_16_ = auVar168;
  auVar303._0_16_ = auVar182;
  auVar135 = vmaxps_avx(auVar265,auVar303);
  auVar168 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar182 = vpminsd_avx(auVar223,auVar167);
  auVar310._16_16_ = auVar168;
  auVar310._0_16_ = auVar182;
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar317._4_4_ = uVar8;
  auVar317._0_4_ = uVar8;
  auVar317._8_4_ = uVar8;
  auVar317._12_4_ = uVar8;
  auVar317._16_4_ = uVar8;
  auVar317._20_4_ = uVar8;
  auVar317._24_4_ = uVar8;
  auVar317._28_4_ = uVar8;
  auVar284 = vmaxps_avx(auVar310,auVar317);
  auVar135 = vmaxps_avx(auVar135,auVar284);
  local_80._4_4_ = auVar135._4_4_ * 0.99999964;
  local_80._0_4_ = auVar135._0_4_ * 0.99999964;
  local_80._8_4_ = auVar135._8_4_ * 0.99999964;
  local_80._12_4_ = auVar135._12_4_ * 0.99999964;
  local_80._16_4_ = auVar135._16_4_ * 0.99999964;
  local_80._20_4_ = auVar135._20_4_ * 0.99999964;
  local_80._24_4_ = auVar135._24_4_ * 0.99999964;
  local_80._28_4_ = auVar135._28_4_;
  auVar268 = ZEXT3264(local_80);
  auVar168 = vpmaxsd_avx(auVar24._16_16_,auVar29._16_16_);
  auVar182 = vpmaxsd_avx(auVar131,auVar180);
  auVar137._16_16_ = auVar168;
  auVar137._0_16_ = auVar182;
  auVar168 = vpmaxsd_avx(auVar25._16_16_,auVar161);
  auVar182 = vpmaxsd_avx(auVar236,auVar148);
  auVar150._16_16_ = auVar168;
  auVar150._0_16_ = auVar182;
  auVar135 = vminps_avx(auVar137,auVar150);
  auVar168 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar182 = vpmaxsd_avx(auVar223,auVar167);
  fVar178 = ray->tfar;
  auVar187._4_4_ = fVar178;
  auVar187._0_4_ = fVar178;
  auVar187._8_4_ = fVar178;
  auVar187._12_4_ = fVar178;
  auVar187._16_4_ = fVar178;
  auVar187._20_4_ = fVar178;
  auVar187._24_4_ = fVar178;
  auVar187._28_4_ = fVar178;
  auVar151._16_16_ = auVar168;
  auVar151._0_16_ = auVar182;
  auVar284 = vminps_avx(auVar151,auVar187);
  auVar135 = vminps_avx(auVar135,auVar284);
  auVar32._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar32._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar32._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar32._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar32._16_4_ = auVar135._16_4_ * 1.0000004;
  auVar32._20_4_ = auVar135._20_4_ * 1.0000004;
  auVar32._24_4_ = auVar135._24_4_ * 1.0000004;
  auVar32._28_4_ = auVar135._28_4_;
  auVar135 = vcmpps_avx(local_80,auVar32,2);
  auVar168 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar152._16_16_ = auVar168;
  auVar152._0_16_ = auVar168;
  auVar284 = vcvtdq2ps_avx(auVar152);
  auVar284 = vcmpps_avx(_DAT_01faff40,auVar284,1);
  auVar135 = vandps_avx(auVar135,auVar284);
  uVar122 = vmovmskps_avx(auVar135);
  if (uVar122 != 0) {
    uVar122 = uVar122 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_7a8 = pre;
    do {
      uVar128 = (ulong)uVar122;
      auVar284 = auVar290._0_32_;
      auVar135 = auVar268._0_32_;
      lVar125 = 0;
      if (uVar128 != 0) {
        for (; (uVar122 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
        }
      }
      uVar128 = uVar128 - 1 & uVar128;
      local_6e8 = (ulong)*(uint *)(prim + 2);
      pGVar20 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_608 = (ulong)*(uint *)(prim + lVar125 * 4 + 6);
      uVar126 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                                pGVar20[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i *
                                (ulong)*(uint *)(prim + lVar125 * 4 + 6));
      p_Var21 = pGVar20[1].intersectionFilterN;
      lVar125 = *(long *)&pGVar20[1].time_range.upper;
      _local_7a0 = *(undefined1 (*) [16])(lVar125 + (long)p_Var21 * uVar126);
      _local_790 = *(undefined1 (*) [16])(lVar125 + (uVar126 + 1) * (long)p_Var21);
      _local_590 = *(undefined1 (*) [16])(lVar125 + (uVar126 + 2) * (long)p_Var21);
      lVar130 = 0;
      if (uVar128 != 0) {
        for (; (uVar128 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
        }
      }
      _local_6a0 = *(undefined1 (*) [16])(lVar125 + (uVar126 + 3) * (long)p_Var21);
      if (((uVar128 != 0) && (uVar126 = uVar128 - 1 & uVar128, uVar126 != 0)) &&
         (lVar125 = 0, uVar126 != 0)) {
        for (; (uVar126 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
        }
      }
      uVar122 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar9 = (ray->org).field_0;
      auVar161 = vsubps_avx(_local_7a0,(undefined1  [16])aVar9);
      auVar14 = _local_7a0;
      auVar168 = vshufps_avx(auVar161,auVar161,0);
      auVar182 = vshufps_avx(auVar161,auVar161,0x55);
      auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
      fVar178 = (local_7a8->ray_space).vx.field_0.m128[0];
      fVar193 = (local_7a8->ray_space).vx.field_0.m128[1];
      fVar196 = (local_7a8->ray_space).vx.field_0.m128[2];
      fVar198 = (local_7a8->ray_space).vx.field_0.m128[3];
      fVar200 = (local_7a8->ray_space).vy.field_0.m128[0];
      fVar203 = (local_7a8->ray_space).vy.field_0.m128[1];
      fVar205 = (local_7a8->ray_space).vy.field_0.m128[2];
      fVar207 = (local_7a8->ray_space).vy.field_0.m128[3];
      fVar214 = (local_7a8->ray_space).vz.field_0.m128[0];
      fVar215 = (local_7a8->ray_space).vz.field_0.m128[1];
      fVar216 = (local_7a8->ray_space).vz.field_0.m128[2];
      fVar217 = (local_7a8->ray_space).vz.field_0.m128[3];
      auVar132._0_4_ =
           auVar168._0_4_ * fVar178 + auVar161._0_4_ * fVar214 + auVar182._0_4_ * fVar200;
      auVar132._4_4_ =
           auVar168._4_4_ * fVar193 + auVar161._4_4_ * fVar215 + auVar182._4_4_ * fVar203;
      auVar132._8_4_ =
           auVar168._8_4_ * fVar196 + auVar161._8_4_ * fVar216 + auVar182._8_4_ * fVar205;
      auVar132._12_4_ =
           auVar168._12_4_ * fVar198 + auVar161._12_4_ * fVar217 + auVar182._12_4_ * fVar207;
      auVar168 = vblendps_avx(auVar132,_local_7a0,8);
      auVar10 = vsubps_avx(_local_790,(undefined1  [16])aVar9);
      auVar182 = vshufps_avx(auVar10,auVar10,0);
      auVar161 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar323._0_4_ = auVar182._0_4_ * fVar178 + auVar10._0_4_ * fVar214 + auVar161._0_4_ * fVar200
      ;
      auVar323._4_4_ = auVar182._4_4_ * fVar193 + auVar10._4_4_ * fVar215 + auVar161._4_4_ * fVar203
      ;
      auVar323._8_4_ = auVar182._8_4_ * fVar196 + auVar10._8_4_ * fVar216 + auVar161._8_4_ * fVar205
      ;
      auVar323._12_4_ =
           auVar182._12_4_ * fVar198 + auVar10._12_4_ * fVar217 + auVar161._12_4_ * fVar207;
      auVar182 = vblendps_avx(auVar323,_local_790,8);
      auVar11 = vsubps_avx(_local_590,(undefined1  [16])aVar9);
      auVar161 = vshufps_avx(auVar11,auVar11,0);
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar224._0_4_ = auVar161._0_4_ * fVar178 + auVar10._0_4_ * fVar200 + auVar11._0_4_ * fVar214;
      auVar224._4_4_ = auVar161._4_4_ * fVar193 + auVar10._4_4_ * fVar203 + auVar11._4_4_ * fVar215;
      auVar224._8_4_ = auVar161._8_4_ * fVar196 + auVar10._8_4_ * fVar205 + auVar11._8_4_ * fVar216;
      auVar224._12_4_ =
           auVar161._12_4_ * fVar198 + auVar10._12_4_ * fVar207 + auVar11._12_4_ * fVar217;
      auVar12 = vshufps_avx(_local_590,_local_590,0xff);
      auVar16 = _local_590;
      auVar161 = vblendps_avx(auVar224,_local_590,8);
      local_4e0._0_16_ = (undefined1  [16])aVar9;
      auVar13 = vsubps_avx(_local_6a0,(undefined1  [16])aVar9);
      auVar10 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar248._0_4_ = auVar10._0_4_ * fVar178 + auVar13._0_4_ * fVar214 + auVar11._0_4_ * fVar200;
      auVar248._4_4_ = auVar10._4_4_ * fVar193 + auVar13._4_4_ * fVar215 + auVar11._4_4_ * fVar203;
      auVar248._8_4_ = auVar10._8_4_ * fVar196 + auVar13._8_4_ * fVar216 + auVar11._8_4_ * fVar205;
      auVar248._12_4_ =
           auVar10._12_4_ * fVar198 + auVar13._12_4_ * fVar217 + auVar11._12_4_ * fVar207;
      auVar10 = vblendps_avx(auVar248,_local_6a0,8);
      auVar208._8_4_ = 0x7fffffff;
      auVar208._0_8_ = 0x7fffffff7fffffff;
      auVar208._12_4_ = 0x7fffffff;
      auVar168 = vandps_avx(auVar168,auVar208);
      auVar182 = vandps_avx(auVar182,auVar208);
      auVar11 = vmaxps_avx(auVar168,auVar182);
      auVar168 = vandps_avx(auVar161,auVar208);
      auVar182 = vandps_avx(auVar10,auVar208);
      auVar168 = vmaxps_avx(auVar168,auVar182);
      auVar168 = vmaxps_avx(auVar11,auVar168);
      auVar182 = vmovshdup_avx(auVar168);
      auVar182 = vmaxss_avx(auVar182,auVar168);
      auVar168 = vshufpd_avx(auVar168,auVar168,1);
      auVar168 = vmaxss_avx(auVar168,auVar182);
      lVar125 = (long)(int)uVar122 * 0x44;
      fVar193 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0x908);
      fVar198 = *(float *)(catmullrom_basis0 + lVar125 + 0x90c);
      fVar203 = *(float *)(catmullrom_basis0 + lVar125 + 0x910);
      fVar207 = *(float *)(catmullrom_basis0 + lVar125 + 0x914);
      fVar214 = *(float *)(catmullrom_basis0 + lVar125 + 0x918);
      fVar215 = *(float *)(catmullrom_basis0 + lVar125 + 0x91c);
      fVar216 = *(float *)(catmullrom_basis0 + lVar125 + 0x920);
      auVar117 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0x908);
      auVar182 = vshufps_avx(auVar224,auVar224,0);
      register0x000012d0 = auVar182;
      _local_440 = auVar182;
      auVar161 = vshufps_avx(auVar224,auVar224,0x55);
      register0x00001350 = auVar161;
      _local_3c0 = auVar161;
      fVar217 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0xd8c);
      fVar218 = *(float *)(catmullrom_basis0 + lVar125 + 0xd90);
      fVar219 = *(float *)(catmullrom_basis0 + lVar125 + 0xd94);
      fVar221 = *(float *)(catmullrom_basis0 + lVar125 + 0xd98);
      fVar230 = *(float *)(catmullrom_basis0 + lVar125 + 0xd9c);
      fVar231 = *(float *)(catmullrom_basis0 + lVar125 + 0xda0);
      fVar232 = *(float *)(catmullrom_basis0 + lVar125 + 0xda4);
      auVar116 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0xd8c);
      auVar10 = vshufps_avx(auVar248,auVar248,0);
      register0x00001490 = auVar10;
      _local_400 = auVar10;
      auVar11 = vshufps_avx(auVar248,auVar248,0x55);
      register0x00001290 = auVar11;
      _local_720 = auVar11;
      fVar279 = auVar10._0_4_;
      fVar247 = auVar10._4_4_;
      fVar257 = auVar10._8_4_;
      fVar258 = auVar10._12_4_;
      fVar178 = auVar11._0_4_;
      fVar196 = auVar11._4_4_;
      fVar200 = auVar11._8_4_;
      fVar205 = auVar11._12_4_;
      fVar179 = auVar182._0_4_;
      fVar194 = auVar182._4_4_;
      fVar177 = auVar182._8_4_;
      fVar158 = auVar182._12_4_;
      fVar164 = auVar161._0_4_;
      fVar246 = auVar161._4_4_;
      fVar197 = auVar161._8_4_;
      fVar201 = auVar161._12_4_;
      auVar15 = _local_6a0;
      auVar182 = vshufps_avx(_local_6a0,_local_6a0,0xff);
      register0x00001350 = auVar12;
      _local_120 = auVar12;
      register0x00001410 = auVar182;
      _local_140 = auVar182;
      fVar280 = auVar182._0_4_;
      fVar206 = auVar182._4_4_;
      fVar281 = auVar182._8_4_;
      fVar270 = auVar182._12_4_;
      fVar166 = auVar12._0_4_;
      fVar195 = auVar12._4_4_;
      fVar165 = auVar12._8_4_;
      auVar182 = vshufps_avx(auVar323,auVar323,0);
      register0x000015d0 = auVar182;
      _local_360 = auVar182;
      fVar233 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0x484);
      fVar234 = *(float *)(catmullrom_basis0 + lVar125 + 0x488);
      fVar235 = *(float *)(catmullrom_basis0 + lVar125 + 0x48c);
      fVar163 = *(float *)(catmullrom_basis0 + lVar125 + 0x490);
      fVar263 = *(float *)(catmullrom_basis0 + lVar125 + 0x494);
      fVar199 = *(float *)(catmullrom_basis0 + lVar125 + 0x498);
      fVar274 = *(float *)(catmullrom_basis0 + lVar125 + 0x49c);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar125 + 0x484);
      fVar269 = *(float *)(catmullrom_basis0 + lVar125 + 0x4a0);
      fVar322 = auVar182._0_4_;
      fVar327 = auVar182._4_4_;
      fVar328 = auVar182._8_4_;
      fVar329 = auVar182._12_4_;
      auVar161 = vshufps_avx(auVar323,auVar323,0x55);
      register0x00001550 = auVar161;
      _local_a0 = auVar161;
      fVar282 = auVar161._0_4_;
      fVar291 = auVar161._4_4_;
      fVar292 = auVar161._8_4_;
      fVar293 = auVar161._12_4_;
      auVar13 = _local_790;
      auVar161 = vshufps_avx(_local_790,_local_790,0xff);
      register0x00001590 = auVar161;
      _local_160 = auVar161;
      fVar294 = auVar161._0_4_;
      fVar295 = auVar161._4_4_;
      fVar297 = auVar161._8_4_;
      fVar313 = auVar161._12_4_;
      auVar161 = vshufps_avx(auVar132,auVar132,0);
      register0x00001310 = auVar161;
      _local_3e0 = auVar161;
      fVar271 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar125);
      fVar202 = *(float *)(catmullrom_basis0 + lVar125 + 4);
      fVar296 = *(float *)(catmullrom_basis0 + lVar125 + 8);
      fVar273 = *(float *)(catmullrom_basis0 + lVar125 + 0xc);
      fVar276 = *(float *)(catmullrom_basis0 + lVar125 + 0x10);
      fVar204 = *(float *)(catmullrom_basis0 + lVar125 + 0x14);
      fVar278 = *(float *)(catmullrom_basis0 + lVar125 + 0x18);
      auVar119 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar125);
      fVar220 = auVar161._0_4_;
      fVar159 = auVar161._4_4_;
      fVar160 = auVar161._8_4_;
      fVar162 = auVar161._12_4_;
      auVar305._0_4_ = fVar220 * fVar271 + fVar322 * fVar233 + fVar179 * fVar193 + fVar279 * fVar217
      ;
      auVar305._4_4_ = fVar159 * fVar202 + fVar327 * fVar234 + fVar194 * fVar198 + fVar247 * fVar218
      ;
      auVar305._8_4_ = fVar160 * fVar296 + fVar328 * fVar235 + fVar177 * fVar203 + fVar257 * fVar219
      ;
      auVar305._12_4_ =
           fVar162 * fVar273 + fVar329 * fVar163 + fVar158 * fVar207 + fVar258 * fVar221;
      auVar305._16_4_ =
           fVar220 * fVar276 + fVar322 * fVar263 + fVar179 * fVar214 + fVar279 * fVar230;
      auVar305._20_4_ =
           fVar159 * fVar204 + fVar327 * fVar199 + fVar194 * fVar215 + fVar247 * fVar231;
      auVar305._24_4_ =
           fVar160 * fVar278 + fVar328 * fVar274 + fVar177 * fVar216 + fVar257 * fVar232;
      auVar305._28_4_ = fVar269 + fVar158 + 0.0 + 0.0;
      auVar161 = vshufps_avx(auVar132,auVar132,0x55);
      register0x000014d0 = auVar161;
      _local_100 = auVar161;
      fVar259 = auVar161._0_4_;
      fVar260 = auVar161._4_4_;
      fVar261 = auVar161._8_4_;
      fVar262 = auVar161._12_4_;
      auVar255._0_4_ = fVar282 * fVar233 + fVar164 * fVar193 + fVar217 * fVar178 + fVar259 * fVar271
      ;
      auVar255._4_4_ = fVar291 * fVar234 + fVar246 * fVar198 + fVar218 * fVar196 + fVar260 * fVar202
      ;
      auVar255._8_4_ = fVar292 * fVar235 + fVar197 * fVar203 + fVar219 * fVar200 + fVar261 * fVar296
      ;
      auVar255._12_4_ =
           fVar293 * fVar163 + fVar201 * fVar207 + fVar221 * fVar205 + fVar262 * fVar273;
      auVar255._16_4_ =
           fVar282 * fVar263 + fVar164 * fVar214 + fVar230 * fVar178 + fVar259 * fVar276;
      auVar255._20_4_ =
           fVar291 * fVar199 + fVar246 * fVar215 + fVar231 * fVar196 + fVar260 * fVar204;
      auVar255._24_4_ =
           fVar292 * fVar274 + fVar197 * fVar216 + fVar232 * fVar200 + fVar261 * fVar278;
      auVar255._28_4_ = fVar158 + fVar205 + 0.0 + 0.0;
      auVar161 = vpermilps_avx(_local_7a0,0xff);
      register0x00001450 = auVar161;
      _local_180 = auVar161;
      fVar272 = auVar161._0_4_;
      fVar275 = auVar161._4_4_;
      fVar277 = auVar161._8_4_;
      auVar134._0_4_ = fVar272 * fVar271 + fVar294 * fVar233 + fVar166 * fVar193 + fVar280 * fVar217
      ;
      auVar134._4_4_ = fVar275 * fVar202 + fVar295 * fVar234 + fVar195 * fVar198 + fVar206 * fVar218
      ;
      auVar134._8_4_ = fVar277 * fVar296 + fVar297 * fVar235 + fVar165 * fVar203 + fVar281 * fVar219
      ;
      auVar134._12_4_ =
           auVar161._12_4_ * fVar273 +
           fVar313 * fVar163 + auVar12._12_4_ * fVar207 + fVar270 * fVar221;
      auVar134._16_4_ =
           fVar272 * fVar276 + fVar294 * fVar263 + fVar166 * fVar214 + fVar280 * fVar230;
      auVar134._20_4_ =
           fVar275 * fVar204 + fVar295 * fVar199 + fVar195 * fVar215 + fVar206 * fVar231;
      auVar134._24_4_ =
           fVar277 * fVar278 + fVar297 * fVar274 + fVar165 * fVar216 + fVar281 * fVar232;
      auVar138._28_4_ = 0;
      auVar138._0_28_ = auVar134;
      fVar217 = *(float *)(catmullrom_basis1 + lVar125 + 0x908);
      fVar218 = *(float *)(catmullrom_basis1 + lVar125 + 0x90c);
      fVar219 = *(float *)(catmullrom_basis1 + lVar125 + 0x910);
      fVar221 = *(float *)(catmullrom_basis1 + lVar125 + 0x914);
      fVar230 = *(float *)(catmullrom_basis1 + lVar125 + 0x918);
      fVar231 = *(float *)(catmullrom_basis1 + lVar125 + 0x91c);
      fVar232 = *(float *)(catmullrom_basis1 + lVar125 + 0x920);
      fVar193 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar125 + 0xd8c);
      fVar198 = *(float *)(catmullrom_basis1 + lVar125 + 0xd90);
      fVar203 = *(float *)(catmullrom_basis1 + lVar125 + 0xd94);
      fVar207 = *(float *)(catmullrom_basis1 + lVar125 + 0xd98);
      fVar214 = *(float *)(catmullrom_basis1 + lVar125 + 0xd9c);
      fVar215 = *(float *)(catmullrom_basis1 + lVar125 + 0xda0);
      fVar216 = *(float *)(catmullrom_basis1 + lVar125 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar125 + 0xd8c);
      fVar233 = *(float *)(catmullrom_basis1 + lVar125 + 0x484);
      fVar234 = *(float *)(catmullrom_basis1 + lVar125 + 0x488);
      fVar235 = *(float *)(catmullrom_basis1 + lVar125 + 0x48c);
      fVar163 = *(float *)(catmullrom_basis1 + lVar125 + 0x490);
      fVar263 = *(float *)(catmullrom_basis1 + lVar125 + 0x494);
      fVar199 = *(float *)(catmullrom_basis1 + lVar125 + 0x498);
      fVar274 = *(float *)(catmullrom_basis1 + lVar125 + 0x49c);
      fVar176 = fVar293 + *(float *)(catmullrom_basis0 + lVar125 + 0x1c) + 0.0;
      fVar271 = *(float *)(catmullrom_basis1 + lVar125);
      fVar202 = *(float *)(catmullrom_basis1 + lVar125 + 4);
      fVar296 = *(float *)(catmullrom_basis1 + lVar125 + 8);
      fVar273 = *(float *)(catmullrom_basis1 + lVar125 + 0xc);
      fVar276 = *(float *)(catmullrom_basis1 + lVar125 + 0x10);
      fVar204 = *(float *)(catmullrom_basis1 + lVar125 + 0x14);
      fVar278 = *(float *)(catmullrom_basis1 + lVar125 + 0x18);
      local_460._0_4_ =
           fVar271 * fVar220 + fVar322 * fVar233 + fVar217 * fVar179 + fVar279 * fVar193;
      local_460._4_4_ =
           fVar202 * fVar159 + fVar327 * fVar234 + fVar218 * fVar194 + fVar247 * fVar198;
      fStack_458 = fVar296 * fVar160 + fVar328 * fVar235 + fVar219 * fVar177 + fVar257 * fVar203;
      fStack_454 = fVar273 * fVar162 + fVar329 * fVar163 + fVar221 * fVar158 + fVar258 * fVar207;
      fStack_450 = fVar276 * fVar220 + fVar322 * fVar263 + fVar230 * fVar179 + fVar279 * fVar214;
      fStack_44c = fVar204 * fVar159 + fVar327 * fVar199 + fVar231 * fVar194 + fVar247 * fVar215;
      fStack_448 = fVar278 * fVar160 + fVar328 * fVar274 + fVar232 * fVar177 + fVar257 * fVar216;
      fStack_444 = fVar313 + fVar176;
      local_340._0_4_ =
           fVar259 * fVar271 + fVar282 * fVar233 + fVar217 * fVar164 + fVar193 * fVar178;
      local_340._4_4_ =
           fVar260 * fVar202 + fVar291 * fVar234 + fVar218 * fVar246 + fVar198 * fVar196;
      fStack_338 = fVar261 * fVar296 + fVar292 * fVar235 + fVar219 * fVar197 + fVar203 * fVar200;
      fStack_334 = fVar262 * fVar273 + fVar293 * fVar163 + fVar221 * fVar201 + fVar207 * fVar205;
      fStack_330 = fVar259 * fVar276 + fVar282 * fVar263 + fVar230 * fVar164 + fVar214 * fVar178;
      fStack_32c = fVar260 * fVar204 + fVar291 * fVar199 + fVar231 * fVar246 + fVar215 * fVar196;
      fStack_328 = fVar261 * fVar278 + fVar292 * fVar274 + fVar232 * fVar197 + fVar216 * fVar200;
      register0x000012dc = fVar176 + fVar293 + fVar269 + 0.0;
      auVar285._0_4_ = fVar294 * fVar233 + fVar166 * fVar217 + fVar280 * fVar193 + fVar272 * fVar271
      ;
      auVar285._4_4_ = fVar295 * fVar234 + fVar195 * fVar218 + fVar206 * fVar198 + fVar275 * fVar202
      ;
      auVar285._8_4_ = fVar297 * fVar235 + fVar165 * fVar219 + fVar281 * fVar203 + fVar277 * fVar296
      ;
      auVar285._12_4_ =
           fVar313 * fVar163 + auVar12._12_4_ * fVar221 + fVar270 * fVar207 +
           auVar161._12_4_ * fVar273;
      auVar285._16_4_ =
           fVar294 * fVar263 + fVar166 * fVar230 + fVar280 * fVar214 + fVar272 * fVar276;
      auVar285._20_4_ =
           fVar295 * fVar199 + fVar195 * fVar231 + fVar206 * fVar215 + fVar275 * fVar204;
      auVar285._24_4_ =
           fVar297 * fVar274 + fVar165 * fVar232 + fVar281 * fVar216 + fVar277 * fVar278;
      auVar285._28_4_ = fVar293 + fVar270 + fVar269 + fVar176;
      auVar26 = vsubps_avx(_local_460,auVar305);
      auVar27 = vsubps_avx(_local_340,auVar255);
      _auStack_470 = auVar27._16_16_;
      fVar269 = auVar26._0_4_;
      fVar166 = auVar26._4_4_;
      auVar33._4_4_ = fVar166 * auVar255._4_4_;
      auVar33._0_4_ = fVar269 * auVar255._0_4_;
      fVar195 = auVar26._8_4_;
      auVar33._8_4_ = fVar195 * auVar255._8_4_;
      fVar165 = auVar26._12_4_;
      auVar33._12_4_ = fVar165 * auVar255._12_4_;
      fVar280 = auVar26._16_4_;
      auVar33._16_4_ = fVar280 * auVar255._16_4_;
      fVar206 = auVar26._20_4_;
      auVar33._20_4_ = fVar206 * auVar255._20_4_;
      fVar281 = auVar26._24_4_;
      auVar33._24_4_ = fVar281 * auVar255._24_4_;
      auVar33._28_4_ = fVar176;
      fVar193 = auVar27._0_4_;
      fVar198 = auVar27._4_4_;
      auVar34._4_4_ = auVar305._4_4_ * fVar198;
      auVar34._0_4_ = auVar305._0_4_ * fVar193;
      fVar203 = auVar27._8_4_;
      auVar34._8_4_ = auVar305._8_4_ * fVar203;
      fVar207 = auVar27._12_4_;
      auVar34._12_4_ = auVar305._12_4_ * fVar207;
      fVar214 = auVar27._16_4_;
      auVar34._16_4_ = auVar305._16_4_ * fVar214;
      fVar215 = auVar27._20_4_;
      auVar34._20_4_ = auVar305._20_4_ * fVar215;
      fVar216 = auVar27._24_4_;
      auVar34._24_4_ = auVar305._24_4_ * fVar216;
      auVar34._28_4_ = register0x000012dc;
      auVar25 = vsubps_avx(auVar33,auVar34);
      auVar24 = vmaxps_avx(auVar138,auVar285);
      auVar35._4_4_ = auVar24._4_4_ * auVar24._4_4_ * (fVar166 * fVar166 + fVar198 * fVar198);
      auVar35._0_4_ = auVar24._0_4_ * auVar24._0_4_ * (fVar269 * fVar269 + fVar193 * fVar193);
      auVar35._8_4_ = auVar24._8_4_ * auVar24._8_4_ * (fVar195 * fVar195 + fVar203 * fVar203);
      auVar35._12_4_ = auVar24._12_4_ * auVar24._12_4_ * (fVar165 * fVar165 + fVar207 * fVar207);
      auVar35._16_4_ = auVar24._16_4_ * auVar24._16_4_ * (fVar280 * fVar280 + fVar214 * fVar214);
      auVar35._20_4_ = auVar24._20_4_ * auVar24._20_4_ * (fVar206 * fVar206 + fVar215 * fVar215);
      auVar35._24_4_ = auVar24._24_4_ * auVar24._24_4_ * (fVar281 * fVar281 + fVar216 * fVar216);
      auVar35._28_4_ = auVar27._28_4_ + register0x000012dc;
      auVar36._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar36._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar36._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar36._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar36._16_4_ = auVar25._16_4_ * auVar25._16_4_;
      auVar36._20_4_ = auVar25._20_4_ * auVar25._20_4_;
      auVar36._24_4_ = auVar25._24_4_ * auVar25._24_4_;
      auVar36._28_4_ = auVar25._28_4_;
      auVar24 = vcmpps_avx(auVar36,auVar35,2);
      auVar181._0_4_ = (float)(int)uVar122;
      auVar181._4_12_ = auVar182._4_12_;
      _local_420 = auVar181;
      auVar182 = vshufps_avx(auVar181,auVar181,0);
      auVar188._16_16_ = auVar182;
      auVar188._0_16_ = auVar182;
      auVar25 = vcmpps_avx(_DAT_01faff40,auVar188,1);
      auVar192 = ZEXT3264(auVar25);
      auVar182 = vpermilps_avx(auVar132,0xaa);
      register0x00001450 = auVar182;
      _local_540 = auVar182;
      auVar161 = vpermilps_avx(auVar323,0xaa);
      register0x00001550 = auVar161;
      _local_320 = auVar161;
      auVar10 = vpermilps_avx(auVar224,0xaa);
      register0x00001590 = auVar10;
      _local_c0 = auVar10;
      auVar11 = vpermilps_avx(auVar248,0xaa);
      auVar213 = ZEXT1664(auVar11);
      register0x00001510 = auVar11;
      _local_600 = auVar11;
      auVar28 = auVar25 & auVar24;
      auVar168 = ZEXT416((uint)(auVar168._0_4_ * 4.7683716e-07));
      local_6c0._0_16_ = auVar168;
      fVar193 = fVar178;
      fVar198 = fVar196;
      fVar203 = fVar200;
      fVar207 = fVar205;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0x7f,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0xbf,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
      {
        bVar129 = false;
        auVar268 = ZEXT3264(auVar135);
        auVar290 = ZEXT3264(auVar284);
        _local_590 = auVar16;
      }
      else {
        auVar24 = vandps_avx(auVar24,auVar25);
        fVar206 = auVar182._0_4_;
        fVar281 = auVar182._4_4_;
        fVar270 = auVar182._8_4_;
        fVar272 = auVar182._12_4_;
        fVar297 = auVar161._0_4_;
        fVar313 = auVar161._4_4_;
        fVar314 = auVar161._8_4_;
        fVar315 = auVar161._12_4_;
        fVar316 = auVar10._0_4_;
        fVar319 = auVar10._4_4_;
        fVar320 = auVar10._8_4_;
        fVar321 = auVar10._12_4_;
        local_4c0._0_4_ = auVar120._0_4_;
        local_4c0._4_4_ = auVar120._4_4_;
        fStack_4b8 = auVar120._8_4_;
        fStack_4b4 = auVar120._12_4_;
        fStack_4b0 = auVar120._16_4_;
        fStack_4ac = auVar120._20_4_;
        fStack_4a8 = auVar120._24_4_;
        fVar275 = auVar11._0_4_;
        fVar277 = auVar11._4_4_;
        fVar294 = auVar11._8_4_;
        fVar295 = auVar11._12_4_;
        local_4c0._0_4_ =
             fVar206 * fVar271 +
             fVar297 * fVar233 + fVar316 * fVar217 + fVar275 * (float)local_4c0._0_4_;
        local_4c0._4_4_ =
             fVar281 * fVar202 +
             fVar313 * fVar234 + fVar319 * fVar218 + fVar277 * (float)local_4c0._4_4_;
        fStack_4b8 = fVar270 * fVar296 +
                     fVar314 * fVar235 + fVar320 * fVar219 + fVar294 * fStack_4b8;
        fStack_4b4 = fVar272 * fVar273 +
                     fVar315 * fVar163 + fVar321 * fVar221 + fVar295 * fStack_4b4;
        fStack_4b0 = fVar206 * fVar276 +
                     fVar297 * fVar263 + fVar316 * fVar230 + fVar275 * fStack_4b0;
        fStack_4ac = fVar281 * fVar204 +
                     fVar313 * fVar199 + fVar319 * fVar231 + fVar277 * fStack_4ac;
        fStack_4a8 = fVar270 * fVar278 +
                     fVar314 * fVar274 + fVar320 * fVar232 + fVar294 * fStack_4a8;
        fStack_4a4 = auVar24._28_4_ +
                     auVar25._28_4_ + *(float *)(catmullrom_basis1 + lVar125 + 0x924) + 0.0;
        local_4a0._0_4_ = auVar119._0_4_;
        local_4a0._4_4_ = auVar119._4_4_;
        fStack_498 = auVar119._8_4_;
        fStack_494 = auVar119._12_4_;
        fStack_490 = auVar119._16_4_;
        fStack_48c = auVar119._20_4_;
        fStack_488 = auVar119._24_4_;
        local_500._0_4_ = auVar118._0_4_;
        local_500._4_4_ = auVar118._4_4_;
        fStack_4f8 = auVar118._8_4_;
        fStack_4f4 = auVar118._12_4_;
        fStack_4f0 = auVar118._16_4_;
        fStack_4ec = auVar118._20_4_;
        fStack_4e8 = auVar118._24_4_;
        local_580._0_4_ = auVar117._0_4_;
        local_580._4_4_ = auVar117._4_4_;
        fStack_578 = auVar117._8_4_;
        fStack_574 = auVar117._12_4_;
        fStack_570 = auVar117._16_4_;
        fStack_56c = auVar117._20_4_;
        fStack_568 = auVar117._24_4_;
        local_5e0._0_4_ = auVar116._0_4_;
        local_5e0._4_4_ = auVar116._4_4_;
        fStack_5d8 = auVar116._8_4_;
        fStack_5d4 = auVar116._12_4_;
        fStack_5d0 = auVar116._16_4_;
        fStack_5cc = auVar116._20_4_;
        fStack_5c8 = auVar116._24_4_;
        local_580._0_4_ =
             fVar206 * (float)local_4a0._0_4_ +
             fVar297 * (float)local_500._0_4_ +
             fVar316 * (float)local_580._0_4_ + fVar275 * (float)local_5e0._0_4_;
        local_580._4_4_ =
             fVar281 * (float)local_4a0._4_4_ +
             fVar313 * (float)local_500._4_4_ +
             fVar319 * (float)local_580._4_4_ + fVar277 * (float)local_5e0._4_4_;
        fStack_578 = fVar270 * fStack_498 +
                     fVar314 * fStack_4f8 + fVar320 * fStack_578 + fVar294 * fStack_5d8;
        fStack_574 = fVar272 * fStack_494 +
                     fVar315 * fStack_4f4 + fVar321 * fStack_574 + fVar295 * fStack_5d4;
        fStack_570 = fVar206 * fStack_490 +
                     fVar297 * fStack_4f0 + fVar316 * fStack_570 + fVar275 * fStack_5d0;
        fStack_56c = fVar281 * fStack_48c +
                     fVar313 * fStack_4ec + fVar319 * fStack_56c + fVar277 * fStack_5cc;
        fStack_568 = fVar270 * fStack_488 +
                     fVar314 * fStack_4e8 + fVar320 * fStack_568 + fVar294 * fStack_5c8;
        fStack_564 = fVar262 + fStack_4a4 + auVar24._28_4_ + auVar25._28_4_;
        fVar214 = *(float *)(catmullrom_basis0 + lVar125 + 0x1210);
        fVar215 = *(float *)(catmullrom_basis0 + lVar125 + 0x1214);
        fVar216 = *(float *)(catmullrom_basis0 + lVar125 + 0x1218);
        fVar217 = *(float *)(catmullrom_basis0 + lVar125 + 0x121c);
        fVar218 = *(float *)(catmullrom_basis0 + lVar125 + 0x1220);
        fVar219 = *(float *)(catmullrom_basis0 + lVar125 + 0x1224);
        fVar221 = *(float *)(catmullrom_basis0 + lVar125 + 0x1228);
        fVar230 = *(float *)(catmullrom_basis0 + lVar125 + 0x1694);
        fVar231 = *(float *)(catmullrom_basis0 + lVar125 + 0x1698);
        fVar232 = *(float *)(catmullrom_basis0 + lVar125 + 0x169c);
        fVar233 = *(float *)(catmullrom_basis0 + lVar125 + 0x16a0);
        fVar234 = *(float *)(catmullrom_basis0 + lVar125 + 0x16a4);
        fVar235 = *(float *)(catmullrom_basis0 + lVar125 + 0x16a8);
        fVar163 = *(float *)(catmullrom_basis0 + lVar125 + 0x16ac);
        fVar263 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b18);
        fVar199 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b1c);
        fVar274 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b20);
        fVar269 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b24);
        fVar271 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b28);
        fVar202 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b2c);
        fVar296 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b30);
        fVar273 = *(float *)(catmullrom_basis0 + lVar125 + 0x1f9c);
        fVar276 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fa0);
        fVar204 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fa4);
        fVar278 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fa8);
        fVar176 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fac);
        fVar166 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fb0);
        fVar195 = *(float *)(catmullrom_basis0 + lVar125 + 0x1fb4);
        fVar165 = *(float *)(catmullrom_basis0 + lVar125 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar125 + 0x1fb8);
        fVar280 = *(float *)(catmullrom_basis0 + lVar125 + 0x16b0) + fVar165;
        local_500._4_4_ =
             fVar159 * fVar215 + fVar327 * fVar231 + fVar194 * fVar199 + fVar247 * fVar276;
        local_500._0_4_ =
             fVar220 * fVar214 + fVar322 * fVar230 + fVar179 * fVar263 + fVar279 * fVar273;
        fStack_4f8 = fVar160 * fVar216 + fVar328 * fVar232 + fVar177 * fVar274 + fVar257 * fVar204;
        fStack_4f4 = fVar162 * fVar217 + fVar329 * fVar233 + fVar158 * fVar269 + fVar258 * fVar278;
        fStack_4f0 = fVar220 * fVar218 + fVar322 * fVar234 + fVar179 * fVar271 + fVar279 * fVar176;
        fStack_4ec = fVar159 * fVar219 + fVar327 * fVar235 + fVar194 * fVar202 + fVar247 * fVar166;
        fStack_4e8 = fVar160 * fVar221 + fVar328 * fVar163 + fVar177 * fVar296 + fVar257 * fVar195;
        fStack_4e4 = *(float *)(catmullrom_basis0 + lVar125 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar125 + 0x1fb8) +
                     fVar272 + *(float *)(catmullrom_basis1 + lVar125 + 0x4a0);
        auVar240._0_4_ =
             fVar259 * fVar214 + fVar164 * fVar263 + fVar178 * fVar273 + fVar282 * fVar230;
        auVar240._4_4_ =
             fVar260 * fVar215 + fVar246 * fVar199 + fVar196 * fVar276 + fVar291 * fVar231;
        auVar240._8_4_ =
             fVar261 * fVar216 + fVar197 * fVar274 + fVar200 * fVar204 + fVar292 * fVar232;
        auVar240._12_4_ =
             fVar262 * fVar217 + fVar201 * fVar269 + fVar205 * fVar278 + fVar293 * fVar233;
        auVar240._16_4_ =
             fVar259 * fVar218 + fVar164 * fVar271 + fVar178 * fVar176 + fVar282 * fVar234;
        auVar240._20_4_ =
             fVar260 * fVar219 + fVar246 * fVar202 + fVar196 * fVar166 + fVar291 * fVar235;
        auVar240._24_4_ =
             fVar261 * fVar221 + fVar197 * fVar296 + fVar200 * fVar195 + fVar292 * fVar163;
        auVar240._28_4_ =
             fVar165 + fVar272 + *(float *)(catmullrom_basis1 + lVar125 + 0x1c) +
                       fVar272 + *(float *)(catmullrom_basis1 + lVar125 + 0x4a0);
        local_4a0._4_4_ =
             fVar313 * fVar231 + fVar319 * fVar199 + fVar277 * fVar276 + fVar281 * fVar215;
        local_4a0._0_4_ =
             fVar297 * fVar230 + fVar316 * fVar263 + fVar275 * fVar273 + fVar206 * fVar214;
        fStack_498 = fVar314 * fVar232 + fVar320 * fVar274 + fVar294 * fVar204 + fVar270 * fVar216;
        fStack_494 = fVar315 * fVar233 + fVar321 * fVar269 + fVar295 * fVar278 + fVar272 * fVar217;
        fStack_490 = fVar297 * fVar234 + fVar316 * fVar271 + fVar275 * fVar176 + fVar206 * fVar218;
        fStack_48c = fVar313 * fVar235 + fVar319 * fVar202 + fVar277 * fVar166 + fVar281 * fVar219;
        fStack_488 = fVar314 * fVar163 + fVar320 * fVar296 + fVar294 * fVar195 + fVar270 * fVar221;
        fStack_484 = fVar280 + *(float *)(catmullrom_basis0 + lVar125 + 0x122c);
        fVar214 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b18);
        fVar215 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b1c);
        fVar216 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b20);
        fVar217 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b24);
        fVar218 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b28);
        fVar219 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b2c);
        fVar221 = *(float *)(catmullrom_basis1 + lVar125 + 0x1b30);
        fVar230 = *(float *)(catmullrom_basis1 + lVar125 + 0x1f9c);
        fVar231 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fa0);
        fVar232 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fa4);
        fVar233 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fa8);
        fVar234 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fac);
        fVar235 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fb0);
        fVar163 = *(float *)(catmullrom_basis1 + lVar125 + 0x1fb4);
        fVar263 = *(float *)(catmullrom_basis1 + lVar125 + 0x1694);
        fVar199 = *(float *)(catmullrom_basis1 + lVar125 + 0x1698);
        fVar274 = *(float *)(catmullrom_basis1 + lVar125 + 0x169c);
        fVar269 = *(float *)(catmullrom_basis1 + lVar125 + 0x16a0);
        fVar271 = *(float *)(catmullrom_basis1 + lVar125 + 0x16a4);
        fVar202 = *(float *)(catmullrom_basis1 + lVar125 + 0x16a8);
        fVar296 = *(float *)(catmullrom_basis1 + lVar125 + 0x16ac);
        fVar273 = *(float *)(catmullrom_basis1 + lVar125 + 0x1210);
        fVar276 = *(float *)(catmullrom_basis1 + lVar125 + 0x1214);
        fVar204 = *(float *)(catmullrom_basis1 + lVar125 + 0x1218);
        fVar278 = *(float *)(catmullrom_basis1 + lVar125 + 0x121c);
        fVar176 = *(float *)(catmullrom_basis1 + lVar125 + 0x1220);
        fVar166 = *(float *)(catmullrom_basis1 + lVar125 + 0x1224);
        fVar195 = *(float *)(catmullrom_basis1 + lVar125 + 0x1228);
        auVar266._0_4_ =
             fVar220 * fVar273 + fVar322 * fVar263 + fVar179 * fVar214 + fVar279 * fVar230;
        auVar266._4_4_ =
             fVar159 * fVar276 + fVar327 * fVar199 + fVar194 * fVar215 + fVar247 * fVar231;
        auVar266._8_4_ =
             fVar160 * fVar204 + fVar328 * fVar274 + fVar177 * fVar216 + fVar257 * fVar232;
        auVar266._12_4_ =
             fVar162 * fVar278 + fVar329 * fVar269 + fVar158 * fVar217 + fVar258 * fVar233;
        auVar266._16_4_ =
             fVar220 * fVar176 + fVar322 * fVar271 + fVar179 * fVar218 + fVar279 * fVar234;
        auVar266._20_4_ =
             fVar159 * fVar166 + fVar327 * fVar202 + fVar194 * fVar219 + fVar247 * fVar235;
        auVar266._24_4_ =
             fVar160 * fVar195 + fVar328 * fVar296 + fVar177 * fVar221 + fVar257 * fVar163;
        auVar266._28_4_ = fVar158 + fVar158 + fVar272 + fVar280;
        auVar286._0_4_ =
             fVar259 * fVar273 + fVar282 * fVar263 + fVar164 * fVar214 + fVar178 * fVar230;
        auVar286._4_4_ =
             fVar260 * fVar276 + fVar291 * fVar199 + fVar246 * fVar215 + fVar196 * fVar231;
        auVar286._8_4_ =
             fVar261 * fVar204 + fVar292 * fVar274 + fVar197 * fVar216 + fVar200 * fVar232;
        auVar286._12_4_ =
             fVar262 * fVar278 + fVar293 * fVar269 + fVar201 * fVar217 + fVar205 * fVar233;
        auVar286._16_4_ =
             fVar259 * fVar176 + fVar282 * fVar271 + fVar164 * fVar218 + fVar178 * fVar234;
        auVar286._20_4_ =
             fVar260 * fVar166 + fVar291 * fVar202 + fVar246 * fVar219 + fVar196 * fVar235;
        auVar286._24_4_ =
             fVar261 * fVar195 + fVar292 * fVar296 + fVar197 * fVar221 + fVar200 * fVar163;
        auVar286._28_4_ = fVar158 + fVar158 + fVar158 + fVar272;
        auVar175._0_4_ =
             fVar206 * fVar273 + fVar297 * fVar263 + fVar316 * fVar214 + fVar230 * fVar275;
        auVar175._4_4_ =
             fVar281 * fVar276 + fVar313 * fVar199 + fVar319 * fVar215 + fVar231 * fVar277;
        auVar175._8_4_ =
             fVar270 * fVar204 + fVar314 * fVar274 + fVar320 * fVar216 + fVar232 * fVar294;
        auVar175._12_4_ =
             fVar272 * fVar278 + fVar315 * fVar269 + fVar321 * fVar217 + fVar233 * fVar295;
        auVar175._16_4_ =
             fVar206 * fVar176 + fVar297 * fVar271 + fVar316 * fVar218 + fVar234 * fVar275;
        auVar175._20_4_ =
             fVar281 * fVar166 + fVar313 * fVar202 + fVar319 * fVar219 + fVar235 * fVar277;
        auVar175._24_4_ =
             fVar270 * fVar195 + fVar314 * fVar296 + fVar320 * fVar221 + fVar163 * fVar294;
        auVar175._28_4_ =
             *(float *)(catmullrom_basis1 + lVar125 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar125 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar125 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar125 + 0x1fb8);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar25 = vandps_avx(_local_500,auVar209);
        auVar28 = vandps_avx(auVar240,auVar209);
        auVar28 = vmaxps_avx(auVar25,auVar28);
        auVar25 = vandps_avx(auVar209,_local_4a0);
        auVar25 = vmaxps_avx(auVar28,auVar25);
        auVar168 = vpermilps_avx(auVar168,0);
        auVar241._16_16_ = auVar168;
        auVar241._0_16_ = auVar168;
        auVar25 = vcmpps_avx(auVar25,auVar241,1);
        auVar29 = vblendvps_avx(_local_500,auVar26,auVar25);
        auVar30 = vblendvps_avx(auVar240,auVar27,auVar25);
        auVar25 = vandps_avx(auVar266,auVar209);
        auVar28 = vandps_avx(auVar286,auVar209);
        auVar31 = vmaxps_avx(auVar25,auVar28);
        auVar25 = vandps_avx(auVar175,auVar209);
        auVar25 = vmaxps_avx(auVar31,auVar25);
        auVar31 = vcmpps_avx(auVar25,auVar241,1);
        auVar25 = vblendvps_avx(auVar266,auVar26,auVar31);
        auVar26 = vblendvps_avx(auVar286,auVar27,auVar31);
        fVar158 = auVar29._0_4_;
        fVar220 = auVar29._4_4_;
        fVar159 = auVar29._8_4_;
        fVar160 = auVar29._12_4_;
        fVar162 = auVar29._16_4_;
        fVar164 = auVar29._20_4_;
        fVar166 = auVar29._24_4_;
        fVar246 = auVar25._0_4_;
        fVar195 = auVar25._4_4_;
        fVar197 = auVar25._8_4_;
        fVar165 = auVar25._12_4_;
        fVar201 = auVar25._16_4_;
        fVar280 = auVar25._20_4_;
        fVar206 = auVar25._24_4_;
        fVar281 = -auVar25._28_4_;
        fVar214 = auVar30._0_4_;
        fVar218 = auVar30._4_4_;
        fVar231 = auVar30._8_4_;
        fVar235 = auVar30._12_4_;
        fVar274 = auVar30._16_4_;
        fVar296 = auVar30._20_4_;
        fVar278 = auVar30._24_4_;
        auVar139._0_4_ = fVar214 * fVar214 + fVar158 * fVar158;
        auVar139._4_4_ = fVar218 * fVar218 + fVar220 * fVar220;
        auVar139._8_4_ = fVar231 * fVar231 + fVar159 * fVar159;
        auVar139._12_4_ = fVar235 * fVar235 + fVar160 * fVar160;
        auVar139._16_4_ = fVar274 * fVar274 + fVar162 * fVar162;
        auVar139._20_4_ = fVar296 * fVar296 + fVar164 * fVar164;
        auVar139._24_4_ = fVar278 * fVar278 + fVar166 * fVar166;
        auVar139._28_4_ = auVar286._28_4_ + auVar29._28_4_;
        auVar27 = vrsqrtps_avx(auVar139);
        fVar215 = auVar27._0_4_;
        fVar216 = auVar27._4_4_;
        auVar37._4_4_ = fVar216 * 1.5;
        auVar37._0_4_ = fVar215 * 1.5;
        fVar217 = auVar27._8_4_;
        auVar37._8_4_ = fVar217 * 1.5;
        fVar219 = auVar27._12_4_;
        auVar37._12_4_ = fVar219 * 1.5;
        fVar221 = auVar27._16_4_;
        auVar37._16_4_ = fVar221 * 1.5;
        fVar230 = auVar27._20_4_;
        auVar37._20_4_ = fVar230 * 1.5;
        fVar232 = auVar27._24_4_;
        fVar177 = auVar28._28_4_;
        auVar37._24_4_ = fVar232 * 1.5;
        auVar37._28_4_ = fVar177;
        auVar38._4_4_ = fVar216 * fVar216 * fVar216 * auVar139._4_4_ * 0.5;
        auVar38._0_4_ = fVar215 * fVar215 * fVar215 * auVar139._0_4_ * 0.5;
        auVar38._8_4_ = fVar217 * fVar217 * fVar217 * auVar139._8_4_ * 0.5;
        auVar38._12_4_ = fVar219 * fVar219 * fVar219 * auVar139._12_4_ * 0.5;
        auVar38._16_4_ = fVar221 * fVar221 * fVar221 * auVar139._16_4_ * 0.5;
        auVar38._20_4_ = fVar230 * fVar230 * fVar230 * auVar139._20_4_ * 0.5;
        auVar38._24_4_ = fVar232 * fVar232 * fVar232 * auVar139._24_4_ * 0.5;
        auVar38._28_4_ = auVar139._28_4_;
        auVar27 = vsubps_avx(auVar37,auVar38);
        fVar215 = auVar27._0_4_;
        fVar219 = auVar27._4_4_;
        fVar232 = auVar27._8_4_;
        fVar163 = auVar27._12_4_;
        fVar269 = auVar27._16_4_;
        fVar273 = auVar27._20_4_;
        fVar176 = auVar27._24_4_;
        fVar216 = auVar26._0_4_;
        fVar221 = auVar26._4_4_;
        fVar233 = auVar26._8_4_;
        fVar263 = auVar26._12_4_;
        fVar271 = auVar26._16_4_;
        fVar276 = auVar26._20_4_;
        fVar179 = auVar26._24_4_;
        auVar140._0_4_ = fVar216 * fVar216 + fVar246 * fVar246;
        auVar140._4_4_ = fVar221 * fVar221 + fVar195 * fVar195;
        auVar140._8_4_ = fVar233 * fVar233 + fVar197 * fVar197;
        auVar140._12_4_ = fVar263 * fVar263 + fVar165 * fVar165;
        auVar140._16_4_ = fVar271 * fVar271 + fVar201 * fVar201;
        auVar140._20_4_ = fVar276 * fVar276 + fVar280 * fVar280;
        auVar140._24_4_ = fVar179 * fVar179 + fVar206 * fVar206;
        auVar140._28_4_ = auVar25._28_4_ + auVar27._28_4_;
        auVar25 = vrsqrtps_avx(auVar140);
        fVar217 = auVar25._0_4_;
        fVar230 = auVar25._4_4_;
        auVar39._4_4_ = fVar230 * 1.5;
        auVar39._0_4_ = fVar217 * 1.5;
        fVar234 = auVar25._8_4_;
        auVar39._8_4_ = fVar234 * 1.5;
        fVar199 = auVar25._12_4_;
        auVar39._12_4_ = fVar199 * 1.5;
        fVar202 = auVar25._16_4_;
        auVar39._16_4_ = fVar202 * 1.5;
        fVar204 = auVar25._20_4_;
        auVar39._20_4_ = fVar204 * 1.5;
        fVar194 = auVar25._24_4_;
        auVar39._24_4_ = fVar194 * 1.5;
        auVar39._28_4_ = fVar177;
        auVar40._4_4_ = fVar230 * fVar230 * fVar230 * auVar140._4_4_ * 0.5;
        auVar40._0_4_ = fVar217 * fVar217 * fVar217 * auVar140._0_4_ * 0.5;
        auVar40._8_4_ = fVar234 * fVar234 * fVar234 * auVar140._8_4_ * 0.5;
        auVar40._12_4_ = fVar199 * fVar199 * fVar199 * auVar140._12_4_ * 0.5;
        auVar40._16_4_ = fVar202 * fVar202 * fVar202 * auVar140._16_4_ * 0.5;
        auVar40._20_4_ = fVar204 * fVar204 * fVar204 * auVar140._20_4_ * 0.5;
        auVar40._24_4_ = fVar194 * fVar194 * fVar194 * auVar140._24_4_ * 0.5;
        auVar40._28_4_ = auVar140._28_4_;
        auVar25 = vsubps_avx(auVar39,auVar40);
        fVar217 = auVar25._0_4_;
        fVar230 = auVar25._4_4_;
        fVar234 = auVar25._8_4_;
        fVar199 = auVar25._12_4_;
        fVar202 = auVar25._16_4_;
        fVar204 = auVar25._20_4_;
        fVar194 = auVar25._24_4_;
        fVar214 = auVar134._0_4_ * fVar214 * fVar215;
        fVar218 = auVar134._4_4_ * fVar218 * fVar219;
        auVar41._4_4_ = fVar218;
        auVar41._0_4_ = fVar214;
        fVar231 = auVar134._8_4_ * fVar231 * fVar232;
        auVar41._8_4_ = fVar231;
        fVar235 = auVar134._12_4_ * fVar235 * fVar163;
        auVar41._12_4_ = fVar235;
        fVar274 = auVar134._16_4_ * fVar274 * fVar269;
        auVar41._16_4_ = fVar274;
        fVar296 = auVar134._20_4_ * fVar296 * fVar273;
        auVar41._20_4_ = fVar296;
        fVar278 = auVar134._24_4_ * fVar278 * fVar176;
        auVar41._24_4_ = fVar278;
        auVar41._28_4_ = fVar281;
        local_5e0._4_4_ = fVar218 + auVar305._4_4_;
        local_5e0._0_4_ = fVar214 + auVar305._0_4_;
        fStack_5d8 = fVar231 + auVar305._8_4_;
        fStack_5d4 = fVar235 + auVar305._12_4_;
        fStack_5d0 = fVar274 + auVar305._16_4_;
        fStack_5cc = fVar296 + auVar305._20_4_;
        fStack_5c8 = fVar278 + auVar305._24_4_;
        fStack_5c4 = fVar281 + auVar305._28_4_;
        fVar214 = auVar134._0_4_ * fVar215 * -fVar158;
        fVar218 = auVar134._4_4_ * fVar219 * -fVar220;
        auVar42._4_4_ = fVar218;
        auVar42._0_4_ = fVar214;
        fVar231 = auVar134._8_4_ * fVar232 * -fVar159;
        auVar42._8_4_ = fVar231;
        fVar235 = auVar134._12_4_ * fVar163 * -fVar160;
        auVar42._12_4_ = fVar235;
        fVar274 = auVar134._16_4_ * fVar269 * -fVar162;
        auVar42._16_4_ = fVar274;
        fVar296 = auVar134._20_4_ * fVar273 * -fVar164;
        auVar42._20_4_ = fVar296;
        fVar278 = auVar134._24_4_ * fVar176 * -fVar166;
        auVar42._24_4_ = fVar278;
        auVar42._28_4_ = fVar177;
        local_480._4_4_ = fVar218 + auVar255._4_4_;
        local_480._0_4_ = fVar214 + auVar255._0_4_;
        fStack_478 = fVar231 + auVar255._8_4_;
        fStack_474 = fVar235 + auVar255._12_4_;
        auStack_470._0_4_ = fVar274 + auVar255._16_4_;
        auStack_470._4_4_ = fVar296 + auVar255._20_4_;
        fStack_468 = fVar278 + auVar255._24_4_;
        fStack_464 = fVar177 + auVar255._28_4_;
        fVar214 = fVar215 * 0.0 * auVar134._0_4_;
        fVar215 = fVar219 * 0.0 * auVar134._4_4_;
        auVar43._4_4_ = fVar215;
        auVar43._0_4_ = fVar214;
        fVar218 = fVar232 * 0.0 * auVar134._8_4_;
        auVar43._8_4_ = fVar218;
        fVar219 = fVar163 * 0.0 * auVar134._12_4_;
        auVar43._12_4_ = fVar219;
        fVar231 = fVar269 * 0.0 * auVar134._16_4_;
        auVar43._16_4_ = fVar231;
        fVar232 = fVar273 * 0.0 * auVar134._20_4_;
        auVar43._20_4_ = fVar232;
        fVar235 = fVar176 * 0.0 * auVar134._24_4_;
        auVar43._24_4_ = fVar235;
        auVar43._28_4_ = fVar293;
        auVar242._0_4_ = fVar214 + (float)local_580._0_4_;
        auVar242._4_4_ = fVar215 + (float)local_580._4_4_;
        auVar242._8_4_ = fVar218 + fStack_578;
        auVar242._12_4_ = fVar219 + fStack_574;
        auVar242._16_4_ = fVar231 + fStack_570;
        auVar242._20_4_ = fVar232 + fStack_56c;
        auVar242._24_4_ = fVar235 + fStack_568;
        auVar242._28_4_ = fVar293 + fStack_564;
        fVar214 = auVar285._0_4_ * fVar216 * fVar217;
        fVar215 = auVar285._4_4_ * fVar221 * fVar230;
        auVar44._4_4_ = fVar215;
        auVar44._0_4_ = fVar214;
        fVar216 = auVar285._8_4_ * fVar233 * fVar234;
        auVar44._8_4_ = fVar216;
        fVar218 = auVar285._12_4_ * fVar263 * fVar199;
        auVar44._12_4_ = fVar218;
        fVar219 = auVar285._16_4_ * fVar271 * fVar202;
        auVar44._16_4_ = fVar219;
        fVar221 = auVar285._20_4_ * fVar276 * fVar204;
        auVar44._20_4_ = fVar221;
        fVar231 = auVar285._24_4_ * fVar179 * fVar194;
        auVar44._24_4_ = fVar231;
        auVar44._28_4_ = auVar26._28_4_;
        auVar29 = vsubps_avx(auVar305,auVar41);
        auVar287._0_4_ = (float)local_460._0_4_ + fVar214;
        auVar287._4_4_ = (float)local_460._4_4_ + fVar215;
        auVar287._8_4_ = fStack_458 + fVar216;
        auVar287._12_4_ = fStack_454 + fVar218;
        auVar287._16_4_ = fStack_450 + fVar219;
        auVar287._20_4_ = fStack_44c + fVar221;
        auVar287._24_4_ = fStack_448 + fVar231;
        auVar287._28_4_ = fStack_444 + auVar26._28_4_;
        fVar214 = auVar285._0_4_ * -fVar246 * fVar217;
        fVar215 = auVar285._4_4_ * -fVar195 * fVar230;
        auVar45._4_4_ = fVar215;
        auVar45._0_4_ = fVar214;
        fVar216 = auVar285._8_4_ * -fVar197 * fVar234;
        auVar45._8_4_ = fVar216;
        fVar218 = auVar285._12_4_ * -fVar165 * fVar199;
        auVar45._12_4_ = fVar218;
        fVar219 = auVar285._16_4_ * -fVar201 * fVar202;
        auVar45._16_4_ = fVar219;
        fVar221 = auVar285._20_4_ * -fVar280 * fVar204;
        auVar45._20_4_ = fVar221;
        fVar231 = auVar285._24_4_ * -fVar206 * fVar194;
        auVar45._24_4_ = fVar231;
        auVar45._28_4_ = fVar315;
        auVar30 = vsubps_avx(auVar255,auVar42);
        auVar299._0_4_ = fVar214 + (float)local_340._0_4_;
        auVar299._4_4_ = fVar215 + (float)local_340._4_4_;
        auVar299._8_4_ = fVar216 + fStack_338;
        auVar299._12_4_ = fVar218 + fStack_334;
        auVar299._16_4_ = fVar219 + fStack_330;
        auVar299._20_4_ = fVar221 + fStack_32c;
        auVar299._24_4_ = fVar231 + fStack_328;
        auVar299._28_4_ = fVar315 + register0x000012dc;
        fVar214 = fVar217 * 0.0 * auVar285._0_4_;
        fVar215 = fVar230 * 0.0 * auVar285._4_4_;
        auVar46._4_4_ = fVar215;
        auVar46._0_4_ = fVar214;
        fVar216 = fVar234 * 0.0 * auVar285._8_4_;
        auVar46._8_4_ = fVar216;
        fVar217 = fVar199 * 0.0 * auVar285._12_4_;
        auVar46._12_4_ = fVar217;
        fVar218 = fVar202 * 0.0 * auVar285._16_4_;
        auVar46._16_4_ = fVar218;
        fVar219 = fVar204 * 0.0 * auVar285._20_4_;
        auVar46._20_4_ = fVar219;
        fVar221 = fVar194 * 0.0 * auVar285._24_4_;
        auVar46._24_4_ = fVar221;
        auVar46._28_4_ = 0x3f000000;
        auVar32 = vsubps_avx(_local_580,auVar43);
        auVar318._0_4_ = fVar214 + (float)local_4c0._0_4_;
        auVar318._4_4_ = fVar215 + (float)local_4c0._4_4_;
        auVar318._8_4_ = fVar216 + fStack_4b8;
        auVar318._12_4_ = fVar217 + fStack_4b4;
        auVar318._16_4_ = fVar218 + fStack_4b0;
        auVar318._20_4_ = fVar219 + fStack_4ac;
        auVar318._24_4_ = fVar221 + fStack_4a8;
        auVar318._28_4_ = fStack_4a4 + 0.5;
        auVar25 = vsubps_avx(_local_460,auVar44);
        auVar26 = vsubps_avx(_local_340,auVar45);
        auVar136 = vsubps_avx(_local_4c0,auVar46);
        auVar27 = vsubps_avx(auVar299,auVar30);
        auVar28 = vsubps_avx(auVar318,auVar32);
        auVar47._4_4_ = auVar32._4_4_ * auVar27._4_4_;
        auVar47._0_4_ = auVar32._0_4_ * auVar27._0_4_;
        auVar47._8_4_ = auVar32._8_4_ * auVar27._8_4_;
        auVar47._12_4_ = auVar32._12_4_ * auVar27._12_4_;
        auVar47._16_4_ = auVar32._16_4_ * auVar27._16_4_;
        auVar47._20_4_ = auVar32._20_4_ * auVar27._20_4_;
        auVar47._24_4_ = auVar32._24_4_ * auVar27._24_4_;
        auVar47._28_4_ = fVar329;
        auVar48._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = register0x000012dc;
        auVar31 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar29._4_4_ * auVar28._4_4_;
        auVar49._0_4_ = auVar29._0_4_ * auVar28._0_4_;
        auVar49._8_4_ = auVar29._8_4_ * auVar28._8_4_;
        auVar49._12_4_ = auVar29._12_4_ * auVar28._12_4_;
        auVar49._16_4_ = auVar29._16_4_ * auVar28._16_4_;
        auVar49._20_4_ = auVar29._20_4_ * auVar28._20_4_;
        auVar49._24_4_ = auVar29._24_4_ * auVar28._24_4_;
        auVar49._28_4_ = auVar28._28_4_;
        auVar137 = vsubps_avx(auVar287,auVar29);
        auVar50._4_4_ = auVar137._4_4_ * auVar32._4_4_;
        auVar50._0_4_ = auVar137._0_4_ * auVar32._0_4_;
        auVar50._8_4_ = auVar137._8_4_ * auVar32._8_4_;
        auVar50._12_4_ = auVar137._12_4_ * auVar32._12_4_;
        auVar50._16_4_ = auVar137._16_4_ * auVar32._16_4_;
        auVar50._20_4_ = auVar137._20_4_ * auVar32._20_4_;
        auVar50._24_4_ = auVar137._24_4_ * auVar32._24_4_;
        auVar50._28_4_ = fStack_444;
        auVar149 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = auVar137._4_4_ * auVar30._4_4_;
        auVar51._0_4_ = auVar137._0_4_ * auVar30._0_4_;
        auVar51._8_4_ = auVar137._8_4_ * auVar30._8_4_;
        auVar51._12_4_ = auVar137._12_4_ * auVar30._12_4_;
        auVar51._16_4_ = auVar137._16_4_ * auVar30._16_4_;
        auVar51._20_4_ = auVar137._20_4_ * auVar30._20_4_;
        auVar51._24_4_ = auVar137._24_4_ * auVar30._24_4_;
        auVar51._28_4_ = auVar28._28_4_;
        auVar52._4_4_ = auVar29._4_4_ * auVar27._4_4_;
        auVar52._0_4_ = auVar29._0_4_ * auVar27._0_4_;
        auVar52._8_4_ = auVar29._8_4_ * auVar27._8_4_;
        auVar52._12_4_ = auVar29._12_4_ * auVar27._12_4_;
        auVar52._16_4_ = auVar29._16_4_ * auVar27._16_4_;
        auVar52._20_4_ = auVar29._20_4_ * auVar27._20_4_;
        auVar52._24_4_ = auVar29._24_4_ * auVar27._24_4_;
        auVar52._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar52,auVar51);
        auVar141._0_4_ = auVar31._0_4_ * 0.0 + auVar27._0_4_ + auVar149._0_4_ * 0.0;
        auVar141._4_4_ = auVar31._4_4_ * 0.0 + auVar27._4_4_ + auVar149._4_4_ * 0.0;
        auVar141._8_4_ = auVar31._8_4_ * 0.0 + auVar27._8_4_ + auVar149._8_4_ * 0.0;
        auVar141._12_4_ = auVar31._12_4_ * 0.0 + auVar27._12_4_ + auVar149._12_4_ * 0.0;
        auVar141._16_4_ = auVar31._16_4_ * 0.0 + auVar27._16_4_ + auVar149._16_4_ * 0.0;
        auVar141._20_4_ = auVar31._20_4_ * 0.0 + auVar27._20_4_ + auVar149._20_4_ * 0.0;
        auVar141._24_4_ = auVar31._24_4_ * 0.0 + auVar27._24_4_ + auVar149._24_4_ * 0.0;
        auVar141._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar149._28_4_;
        auVar31 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        _local_560 = vblendvps_avx(auVar25,_local_5e0,auVar31);
        _local_5c0 = vblendvps_avx(auVar26,_local_480,auVar31);
        auVar25 = vblendvps_avx(auVar136,auVar242,auVar31);
        auVar26 = vblendvps_avx(auVar29,auVar287,auVar31);
        auVar27 = vblendvps_avx(auVar30,auVar299,auVar31);
        auVar28 = vblendvps_avx(auVar32,auVar318,auVar31);
        auVar29 = vblendvps_avx(auVar287,auVar29,auVar31);
        auVar30 = vblendvps_avx(auVar299,auVar30,auVar31);
        local_6e0 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auStack_6d0 = auVar24._16_16_;
        auVar24 = vblendvps_avx(auVar318,auVar32,auVar31);
        auVar29 = vsubps_avx(auVar29,_local_560);
        auVar32 = vsubps_avx(auVar30,_local_5c0);
        auVar137 = vsubps_avx(auVar24,auVar25);
        auVar24 = vsubps_avx(_local_5c0,auVar27);
        fVar214 = auVar32._0_4_;
        fVar166 = auVar25._0_4_;
        fVar219 = auVar32._4_4_;
        fVar246 = auVar25._4_4_;
        auVar53._4_4_ = fVar246 * fVar219;
        auVar53._0_4_ = fVar166 * fVar214;
        fVar233 = auVar32._8_4_;
        fVar195 = auVar25._8_4_;
        auVar53._8_4_ = fVar195 * fVar233;
        fVar199 = auVar32._12_4_;
        fVar197 = auVar25._12_4_;
        auVar53._12_4_ = fVar197 * fVar199;
        fVar296 = auVar32._16_4_;
        fVar165 = auVar25._16_4_;
        auVar53._16_4_ = fVar165 * fVar296;
        fVar176 = auVar32._20_4_;
        fVar201 = auVar25._20_4_;
        auVar53._20_4_ = fVar201 * fVar176;
        fVar220 = auVar32._24_4_;
        fVar280 = auVar25._24_4_;
        auVar53._24_4_ = fVar280 * fVar220;
        auVar53._28_4_ = auVar30._28_4_;
        fVar215 = local_5c0._0_4_;
        fVar247 = auVar137._0_4_;
        fVar221 = local_5c0._4_4_;
        fVar257 = auVar137._4_4_;
        auVar54._4_4_ = fVar257 * fVar221;
        auVar54._0_4_ = fVar247 * fVar215;
        fVar234 = local_5c0._8_4_;
        fVar258 = auVar137._8_4_;
        auVar54._8_4_ = fVar258 * fVar234;
        fVar274 = local_5c0._12_4_;
        fVar259 = auVar137._12_4_;
        auVar54._12_4_ = fVar259 * fVar274;
        fVar273 = local_5c0._16_4_;
        fVar260 = auVar137._16_4_;
        auVar54._16_4_ = fVar260 * fVar273;
        fVar179 = local_5c0._20_4_;
        fVar261 = auVar137._20_4_;
        auVar54._20_4_ = fVar261 * fVar179;
        fVar159 = local_5c0._24_4_;
        fVar262 = auVar137._24_4_;
        uVar8 = auVar136._28_4_;
        auVar54._24_4_ = fVar262 * fVar159;
        auVar54._28_4_ = uVar8;
        auVar30 = vsubps_avx(auVar54,auVar53);
        fVar216 = local_560._0_4_;
        fVar230 = local_560._4_4_;
        auVar55._4_4_ = fVar257 * fVar230;
        auVar55._0_4_ = fVar247 * fVar216;
        fVar235 = local_560._8_4_;
        auVar55._8_4_ = fVar258 * fVar235;
        fVar269 = local_560._12_4_;
        auVar55._12_4_ = fVar259 * fVar269;
        fVar276 = local_560._16_4_;
        auVar55._16_4_ = fVar260 * fVar276;
        fVar194 = local_560._20_4_;
        auVar55._20_4_ = fVar261 * fVar194;
        fVar160 = local_560._24_4_;
        auVar55._24_4_ = fVar262 * fVar160;
        auVar55._28_4_ = uVar8;
        fVar217 = auVar29._0_4_;
        fVar231 = auVar29._4_4_;
        auVar56._4_4_ = fVar246 * fVar231;
        auVar56._0_4_ = fVar166 * fVar217;
        fVar163 = auVar29._8_4_;
        auVar56._8_4_ = fVar195 * fVar163;
        fVar271 = auVar29._12_4_;
        auVar56._12_4_ = fVar197 * fVar271;
        fVar204 = auVar29._16_4_;
        auVar56._16_4_ = fVar165 * fVar204;
        fVar177 = auVar29._20_4_;
        auVar56._20_4_ = fVar201 * fVar177;
        fVar162 = auVar29._24_4_;
        auVar56._24_4_ = fVar280 * fVar162;
        auVar56._28_4_ = auVar318._28_4_;
        auVar136 = vsubps_avx(auVar56,auVar55);
        auVar57._4_4_ = fVar221 * fVar231;
        auVar57._0_4_ = fVar215 * fVar217;
        auVar57._8_4_ = fVar234 * fVar163;
        auVar57._12_4_ = fVar274 * fVar271;
        auVar57._16_4_ = fVar273 * fVar204;
        auVar57._20_4_ = fVar179 * fVar177;
        auVar57._24_4_ = fVar159 * fVar162;
        auVar57._28_4_ = uVar8;
        auVar324._0_4_ = fVar216 * fVar214;
        auVar324._4_4_ = fVar230 * fVar219;
        auVar324._8_4_ = fVar235 * fVar233;
        auVar324._12_4_ = fVar269 * fVar199;
        auVar324._16_4_ = fVar276 * fVar296;
        auVar324._20_4_ = fVar194 * fVar176;
        auVar324._24_4_ = fVar160 * fVar220;
        auVar324._28_4_ = 0;
        auVar149 = vsubps_avx(auVar324,auVar57);
        auVar150 = vsubps_avx(auVar25,auVar28);
        fVar218 = auVar149._28_4_ + auVar136._28_4_;
        auVar153._0_4_ = auVar149._0_4_ + auVar136._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
        auVar153._4_4_ = auVar149._4_4_ + auVar136._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
        auVar153._8_4_ = auVar149._8_4_ + auVar136._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
        auVar153._12_4_ = auVar149._12_4_ + auVar136._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
        auVar153._16_4_ = auVar149._16_4_ + auVar136._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
        auVar153._20_4_ = auVar149._20_4_ + auVar136._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
        auVar153._24_4_ = auVar149._24_4_ + auVar136._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
        auVar153._28_4_ = fVar218 + auVar30._28_4_;
        fVar206 = auVar24._0_4_;
        fVar281 = auVar24._4_4_;
        auVar58._4_4_ = fVar281 * auVar28._4_4_;
        auVar58._0_4_ = fVar206 * auVar28._0_4_;
        fVar270 = auVar24._8_4_;
        auVar58._8_4_ = fVar270 * auVar28._8_4_;
        fVar272 = auVar24._12_4_;
        auVar58._12_4_ = fVar272 * auVar28._12_4_;
        fVar275 = auVar24._16_4_;
        auVar58._16_4_ = fVar275 * auVar28._16_4_;
        fVar277 = auVar24._20_4_;
        auVar58._20_4_ = fVar277 * auVar28._20_4_;
        fVar279 = auVar24._24_4_;
        auVar58._24_4_ = fVar279 * auVar28._24_4_;
        auVar58._28_4_ = fVar218;
        fVar218 = auVar150._0_4_;
        fVar232 = auVar150._4_4_;
        auVar59._4_4_ = auVar27._4_4_ * fVar232;
        auVar59._0_4_ = auVar27._0_4_ * fVar218;
        fVar263 = auVar150._8_4_;
        auVar59._8_4_ = auVar27._8_4_ * fVar263;
        fVar202 = auVar150._12_4_;
        auVar59._12_4_ = auVar27._12_4_ * fVar202;
        fVar278 = auVar150._16_4_;
        auVar59._16_4_ = auVar27._16_4_ * fVar278;
        fVar158 = auVar150._20_4_;
        auVar59._20_4_ = auVar27._20_4_ * fVar158;
        fVar164 = auVar150._24_4_;
        auVar59._24_4_ = auVar27._24_4_ * fVar164;
        auVar59._28_4_ = auVar149._28_4_;
        auVar24 = vsubps_avx(auVar59,auVar58);
        auVar136 = vsubps_avx(_local_560,auVar26);
        fVar282 = auVar136._0_4_;
        fVar291 = auVar136._4_4_;
        auVar60._4_4_ = fVar291 * auVar28._4_4_;
        auVar60._0_4_ = fVar282 * auVar28._0_4_;
        fVar292 = auVar136._8_4_;
        auVar60._8_4_ = fVar292 * auVar28._8_4_;
        fVar293 = auVar136._12_4_;
        auVar60._12_4_ = fVar293 * auVar28._12_4_;
        fVar294 = auVar136._16_4_;
        auVar60._16_4_ = fVar294 * auVar28._16_4_;
        fVar295 = auVar136._20_4_;
        auVar60._20_4_ = fVar295 * auVar28._20_4_;
        fVar297 = auVar136._24_4_;
        auVar60._24_4_ = fVar297 * auVar28._24_4_;
        auVar60._28_4_ = auVar28._28_4_;
        auVar61._4_4_ = auVar26._4_4_ * fVar232;
        auVar61._0_4_ = auVar26._0_4_ * fVar218;
        auVar61._8_4_ = auVar26._8_4_ * fVar263;
        auVar61._12_4_ = auVar26._12_4_ * fVar202;
        auVar61._16_4_ = auVar26._16_4_ * fVar278;
        auVar61._20_4_ = auVar26._20_4_ * fVar158;
        auVar61._24_4_ = auVar26._24_4_ * fVar164;
        auVar61._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar60,auVar61);
        auVar62._4_4_ = auVar27._4_4_ * fVar291;
        auVar62._0_4_ = auVar27._0_4_ * fVar282;
        auVar62._8_4_ = auVar27._8_4_ * fVar292;
        auVar62._12_4_ = auVar27._12_4_ * fVar293;
        auVar62._16_4_ = auVar27._16_4_ * fVar294;
        auVar62._20_4_ = auVar27._20_4_ * fVar295;
        auVar62._24_4_ = auVar27._24_4_ * fVar297;
        auVar62._28_4_ = auVar28._28_4_;
        auVar63._4_4_ = auVar26._4_4_ * fVar281;
        auVar63._0_4_ = auVar26._0_4_ * fVar206;
        auVar63._8_4_ = auVar26._8_4_ * fVar270;
        auVar63._12_4_ = auVar26._12_4_ * fVar272;
        auVar63._16_4_ = auVar26._16_4_ * fVar275;
        auVar63._20_4_ = auVar26._20_4_ * fVar277;
        auVar63._24_4_ = auVar26._24_4_ * fVar279;
        auVar63._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar63,auVar62);
        auVar210._0_4_ = auVar24._0_4_ * 0.0 + auVar26._0_4_ + auVar30._0_4_ * 0.0;
        auVar210._4_4_ = auVar24._4_4_ * 0.0 + auVar26._4_4_ + auVar30._4_4_ * 0.0;
        auVar210._8_4_ = auVar24._8_4_ * 0.0 + auVar26._8_4_ + auVar30._8_4_ * 0.0;
        auVar210._12_4_ = auVar24._12_4_ * 0.0 + auVar26._12_4_ + auVar30._12_4_ * 0.0;
        auVar210._16_4_ = auVar24._16_4_ * 0.0 + auVar26._16_4_ + auVar30._16_4_ * 0.0;
        auVar210._20_4_ = auVar24._20_4_ * 0.0 + auVar26._20_4_ + auVar30._20_4_ * 0.0;
        auVar210._24_4_ = auVar24._24_4_ * 0.0 + auVar26._24_4_ + auVar30._24_4_ * 0.0;
        auVar210._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar30._28_4_;
        auVar213 = ZEXT3264(auVar210);
        auVar24 = vmaxps_avx(auVar153,auVar210);
        auVar24 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,2);
        auVar168 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar168 = vpand_avx(auVar168,local_6e0);
        auVar182 = vpmovsxwd_avx(auVar168);
        auVar161 = vpunpckhwd_avx(auVar168,auVar168);
        auVar189._16_16_ = auVar161;
        auVar189._0_16_ = auVar182;
        if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar189 >> 0x7f,0) == '\0') &&
              (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar161 >> 0x3f,0) == '\0') &&
            (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar161[0xf]) {
LAB_01084cbd:
          auVar290 = ZEXT3264(auVar284);
          auVar268 = ZEXT3264(auVar135);
          auVar146 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar192 = ZEXT3264(auVar189);
        }
        else {
          auVar64._4_4_ = fVar232 * fVar219;
          auVar64._0_4_ = fVar218 * fVar214;
          auVar64._8_4_ = fVar263 * fVar233;
          auVar64._12_4_ = fVar202 * fVar199;
          auVar64._16_4_ = fVar278 * fVar296;
          auVar64._20_4_ = fVar158 * fVar176;
          auVar64._24_4_ = fVar164 * fVar220;
          auVar64._28_4_ = auVar161._12_4_;
          auVar306._0_4_ = fVar206 * fVar247;
          auVar306._4_4_ = fVar281 * fVar257;
          auVar306._8_4_ = fVar270 * fVar258;
          auVar306._12_4_ = fVar272 * fVar259;
          auVar306._16_4_ = fVar275 * fVar260;
          auVar306._20_4_ = fVar277 * fVar261;
          auVar306._24_4_ = fVar279 * fVar262;
          auVar306._28_4_ = 0;
          auVar24 = vsubps_avx(auVar306,auVar64);
          auVar65._4_4_ = fVar291 * fVar257;
          auVar65._0_4_ = fVar282 * fVar247;
          auVar65._8_4_ = fVar292 * fVar258;
          auVar65._12_4_ = fVar293 * fVar259;
          auVar65._16_4_ = fVar294 * fVar260;
          auVar65._20_4_ = fVar295 * fVar261;
          auVar65._24_4_ = fVar297 * fVar262;
          auVar65._28_4_ = auVar137._28_4_;
          auVar66._4_4_ = fVar232 * fVar231;
          auVar66._0_4_ = fVar218 * fVar217;
          auVar66._8_4_ = fVar263 * fVar163;
          auVar66._12_4_ = fVar202 * fVar271;
          auVar66._16_4_ = fVar278 * fVar204;
          auVar66._20_4_ = fVar158 * fVar177;
          auVar66._24_4_ = fVar164 * fVar162;
          auVar66._28_4_ = auVar150._28_4_;
          auVar27 = vsubps_avx(auVar66,auVar65);
          auVar67._4_4_ = fVar281 * fVar231;
          auVar67._0_4_ = fVar206 * fVar217;
          auVar67._8_4_ = fVar270 * fVar163;
          auVar67._12_4_ = fVar272 * fVar271;
          auVar67._16_4_ = fVar275 * fVar204;
          auVar67._20_4_ = fVar277 * fVar177;
          auVar67._24_4_ = fVar279 * fVar162;
          auVar67._28_4_ = auVar153._28_4_;
          auVar68._4_4_ = fVar291 * fVar219;
          auVar68._0_4_ = fVar282 * fVar214;
          auVar68._8_4_ = fVar292 * fVar233;
          auVar68._12_4_ = fVar293 * fVar199;
          auVar68._16_4_ = fVar294 * fVar296;
          auVar68._20_4_ = fVar295 * fVar176;
          auVar68._24_4_ = fVar297 * fVar220;
          auVar68._28_4_ = auVar32._28_4_;
          auVar28 = vsubps_avx(auVar68,auVar67);
          auVar256._0_4_ = auVar24._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
          auVar256._4_4_ = auVar24._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
          auVar256._8_4_ = auVar24._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
          auVar256._12_4_ = auVar24._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
          auVar256._16_4_ = auVar24._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
          auVar256._20_4_ = auVar24._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
          auVar256._24_4_ = auVar24._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
          auVar256._28_4_ = auVar32._28_4_ + auVar28._28_4_ + auVar153._28_4_;
          auVar26 = vrcpps_avx(auVar256);
          fVar217 = auVar26._0_4_;
          fVar218 = auVar26._4_4_;
          auVar69._4_4_ = auVar256._4_4_ * fVar218;
          auVar69._0_4_ = auVar256._0_4_ * fVar217;
          fVar219 = auVar26._8_4_;
          auVar69._8_4_ = auVar256._8_4_ * fVar219;
          fVar231 = auVar26._12_4_;
          auVar69._12_4_ = auVar256._12_4_ * fVar231;
          fVar232 = auVar26._16_4_;
          auVar69._16_4_ = auVar256._16_4_ * fVar232;
          fVar233 = auVar26._20_4_;
          auVar69._20_4_ = auVar256._20_4_ * fVar233;
          fVar163 = auVar26._24_4_;
          auVar69._24_4_ = auVar256._24_4_ * fVar163;
          auVar69._28_4_ = auVar150._28_4_;
          auVar307._8_4_ = 0x3f800000;
          auVar307._0_8_ = 0x3f8000003f800000;
          auVar307._12_4_ = 0x3f800000;
          auVar307._16_4_ = 0x3f800000;
          auVar307._20_4_ = 0x3f800000;
          auVar307._24_4_ = 0x3f800000;
          auVar307._28_4_ = 0x3f800000;
          auVar30 = vsubps_avx(auVar307,auVar69);
          fVar217 = auVar30._0_4_ * fVar217 + fVar217;
          fVar218 = auVar30._4_4_ * fVar218 + fVar218;
          fVar219 = auVar30._8_4_ * fVar219 + fVar219;
          fVar231 = auVar30._12_4_ * fVar231 + fVar231;
          fVar232 = auVar30._16_4_ * fVar232 + fVar232;
          fVar233 = auVar30._20_4_ * fVar233 + fVar233;
          fVar163 = auVar30._24_4_ * fVar163 + fVar163;
          auVar70._4_4_ =
               (auVar24._4_4_ * fVar230 + auVar27._4_4_ * fVar221 + auVar28._4_4_ * fVar246) *
               fVar218;
          auVar70._0_4_ =
               (auVar24._0_4_ * fVar216 + auVar27._0_4_ * fVar215 + auVar28._0_4_ * fVar166) *
               fVar217;
          auVar70._8_4_ =
               (auVar24._8_4_ * fVar235 + auVar27._8_4_ * fVar234 + auVar28._8_4_ * fVar195) *
               fVar219;
          auVar70._12_4_ =
               (auVar24._12_4_ * fVar269 + auVar27._12_4_ * fVar274 + auVar28._12_4_ * fVar197) *
               fVar231;
          auVar70._16_4_ =
               (auVar24._16_4_ * fVar276 + auVar27._16_4_ * fVar273 + auVar28._16_4_ * fVar165) *
               fVar232;
          auVar70._20_4_ =
               (auVar24._20_4_ * fVar194 + auVar27._20_4_ * fVar179 + auVar28._20_4_ * fVar201) *
               fVar233;
          auVar70._24_4_ =
               (auVar24._24_4_ * fVar160 + auVar27._24_4_ * fVar159 + auVar28._24_4_ * fVar280) *
               fVar163;
          auVar70._28_4_ = local_560._28_4_ + auVar29._28_4_ + auVar25._28_4_;
          auVar182 = vpermilps_avx((undefined1  [16])aVar9,0xff);
          auVar190._16_16_ = auVar182;
          auVar190._0_16_ = auVar182;
          auVar24 = vcmpps_avx(auVar190,auVar70,2);
          fVar214 = ray->tfar;
          auVar227._4_4_ = fVar214;
          auVar227._0_4_ = fVar214;
          auVar227._8_4_ = fVar214;
          auVar227._12_4_ = fVar214;
          auVar227._16_4_ = fVar214;
          auVar227._20_4_ = fVar214;
          auVar227._24_4_ = fVar214;
          auVar227._28_4_ = fVar214;
          auVar25 = vcmpps_avx(auVar70,auVar227,2);
          auVar24 = vandps_avx(auVar25,auVar24);
          auVar182 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
          auVar168 = vpand_avx(auVar168,auVar182);
          auVar182 = vpmovsxwd_avx(auVar168);
          auVar161 = vpshufd_avx(auVar168,0xee);
          auVar161 = vpmovsxwd_avx(auVar161);
          auVar189._16_16_ = auVar161;
          auVar189._0_16_ = auVar182;
          if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar189 >> 0x7f,0) == '\0') &&
                (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar161 >> 0x3f,0) == '\0') &&
              (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar161[0xf]) goto LAB_01084cbd;
          auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar256,4);
          auVar182 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
          auVar168 = vpand_avx(auVar168,auVar182);
          auVar182 = vpmovsxwd_avx(auVar168);
          auVar168 = vpunpckhwd_avx(auVar168,auVar168);
          auVar192 = ZEXT1664(auVar168);
          auVar243._16_16_ = auVar168;
          auVar243._0_16_ = auVar182;
          auVar146 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar268 = ZEXT3264(auVar135);
          auVar290 = ZEXT3264(auVar284);
          if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar243 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar243 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar243 >> 0x7f,0) != '\0') ||
                (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar168 >> 0x3f,0) != '\0') ||
              (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar168[0xf] < '\0') {
            auVar191._0_4_ = auVar153._0_4_ * fVar217;
            auVar191._4_4_ = auVar153._4_4_ * fVar218;
            auVar191._8_4_ = auVar153._8_4_ * fVar219;
            auVar191._12_4_ = auVar153._12_4_ * fVar231;
            auVar191._16_4_ = auVar153._16_4_ * fVar232;
            auVar191._20_4_ = auVar153._20_4_ * fVar233;
            auVar191._24_4_ = auVar153._24_4_ * fVar163;
            auVar191._28_4_ = 0;
            auVar71._4_4_ = auVar210._4_4_ * fVar218;
            auVar71._0_4_ = auVar210._0_4_ * fVar217;
            auVar71._8_4_ = auVar210._8_4_ * fVar219;
            auVar71._12_4_ = auVar210._12_4_ * fVar231;
            auVar71._16_4_ = auVar210._16_4_ * fVar232;
            auVar71._20_4_ = auVar210._20_4_ * fVar233;
            auVar71._24_4_ = auVar210._24_4_ * fVar163;
            auVar71._28_4_ = auVar30._28_4_ + auVar26._28_4_;
            auVar228._8_4_ = 0x3f800000;
            auVar228._0_8_ = 0x3f8000003f800000;
            auVar228._12_4_ = 0x3f800000;
            auVar228._16_4_ = 0x3f800000;
            auVar228._20_4_ = 0x3f800000;
            auVar228._24_4_ = 0x3f800000;
            auVar228._28_4_ = 0x3f800000;
            auVar135 = vsubps_avx(auVar228,auVar191);
            auVar213 = ZEXT3264(auVar135);
            auVar135 = vblendvps_avx(auVar135,auVar191,auVar31);
            auVar268 = ZEXT3264(auVar135);
            auVar135 = vsubps_avx(auVar228,auVar71);
            auVar192 = ZEXT3264(auVar135);
            _local_380 = vblendvps_avx(auVar135,auVar71,auVar31);
            auVar146 = ZEXT3264(auVar243);
            auVar290 = ZEXT3264(auVar70);
          }
        }
        auVar135 = auVar146._0_32_;
        if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0x7f,0) == '\0') &&
              (auVar146 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar135 >> 0xbf,0) == '\0') &&
            (auVar146 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar146[0x1f]) {
          bVar129 = false;
          _local_590 = auVar16;
        }
        else {
          auVar284 = vsubps_avx(auVar285,auVar138);
          fVar215 = auVar134._0_4_ + auVar268._0_4_ * auVar284._0_4_;
          fVar216 = auVar134._4_4_ + auVar268._4_4_ * auVar284._4_4_;
          fVar217 = auVar134._8_4_ + auVar268._8_4_ * auVar284._8_4_;
          fVar218 = auVar134._12_4_ + auVar268._12_4_ * auVar284._12_4_;
          fVar219 = auVar134._16_4_ + auVar268._16_4_ * auVar284._16_4_;
          fVar221 = auVar134._20_4_ + auVar268._20_4_ * auVar284._20_4_;
          fVar230 = auVar134._24_4_ + auVar268._24_4_ * auVar284._24_4_;
          fVar231 = auVar284._28_4_ + 0.0;
          fVar214 = local_7a8->depth_scale;
          auVar72._4_4_ = (fVar216 + fVar216) * fVar214;
          auVar72._0_4_ = (fVar215 + fVar215) * fVar214;
          auVar72._8_4_ = (fVar217 + fVar217) * fVar214;
          auVar72._12_4_ = (fVar218 + fVar218) * fVar214;
          auVar72._16_4_ = (fVar219 + fVar219) * fVar214;
          auVar72._20_4_ = (fVar221 + fVar221) * fVar214;
          auVar72._24_4_ = (fVar230 + fVar230) * fVar214;
          auVar72._28_4_ = fVar231 + fVar231;
          local_2c0 = auVar290._0_32_;
          auVar284 = vcmpps_avx(local_2c0,auVar72,6);
          auVar24 = auVar135 & auVar284;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            local_240 = vandps_avx(auVar284,auVar135);
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
            uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_300 = auVar268._0_32_;
            auVar121 = _local_380;
            auVar135 = _local_380;
            local_2e0 = (float)local_380._0_4_;
            fStack_2dc = (float)local_380._4_4_;
            fStack_2d8 = (float)uStack_378;
            fStack_2d4 = uStack_378._4_4_;
            fStack_2d0 = (float)uStack_370;
            fStack_2cc = uStack_370._4_4_;
            fStack_2c8 = (float)uStack_368;
            fStack_2c4 = uStack_368._4_4_;
            local_2a0 = 0;
            local_29c = uVar122;
            local_290 = local_7a0;
            uStack_288 = local_7a0._8_8_;
            local_280 = local_790;
            uStack_278 = local_790._8_8_;
            local_270 = local_590;
            uStack_268 = uStack_588;
            local_260 = local_6a0;
            uStack_258 = local_6a0._8_8_;
            _local_380 = auVar135;
            if ((pGVar20->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar129 = true, _local_590 = auVar16,
                 pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar170._0_4_ = 1.0 / auVar181._0_4_;
                auVar170._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar168 = vshufps_avx(auVar170,auVar170,0);
                local_220[0] = auVar168._0_4_ * (auVar268._0_4_ + 0.0);
                local_220[1] = auVar168._4_4_ * (auVar268._4_4_ + 1.0);
                local_220[2] = auVar168._8_4_ * (auVar268._8_4_ + 2.0);
                local_220[3] = auVar168._12_4_ * (auVar268._12_4_ + 3.0);
                fStack_210 = auVar168._0_4_ * (auVar268._16_4_ + 4.0);
                fStack_20c = auVar168._4_4_ * (auVar268._20_4_ + 5.0);
                fStack_208 = auVar168._8_4_ * (auVar268._24_4_ + 6.0);
                fStack_204 = auVar268._28_4_ + 7.0;
                uStack_370 = auVar121._16_8_;
                uStack_368 = auVar135._24_8_;
                local_200 = local_380;
                uStack_1f8 = uStack_378;
                uStack_1f0 = uStack_370;
                uStack_1e8 = uStack_368;
                local_1e0 = local_2c0;
                iVar123 = vmovmskps_avx(local_240);
                local_780 = (undefined1  [8])CONCAT44((int)((ulong)context->args >> 0x20),iVar123);
                lVar130 = 0;
                if (local_780 != (undefined1  [8])0x0) {
                  for (; ((ulong)local_780 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
                  }
                }
                if (iVar123 == 0) goto LAB_01083d44;
                _fStack_778 = auVar134._8_20_;
                fStack_764 = 0.0;
                stack0xfffffffffffff9a4 = auVar285._4_28_;
                local_660._0_4_ = ray->tfar;
                local_740 = auVar268._0_32_;
                local_760 = local_2c0;
                fVar214 = (float)local_6a0._0_4_;
                fVar215 = (float)local_6a0._4_4_;
                fVar216 = (float)uStack_698;
                fVar217 = uStack_698._4_4_;
                fVar218 = (float)local_7a0._0_4_;
                fVar219 = (float)local_7a0._4_4_;
                fVar221 = (float)uStack_798;
                fVar230 = uStack_798._4_4_;
                fVar231 = (float)local_790._0_4_;
                fVar232 = (float)local_790._4_4_;
                fVar233 = (float)uStack_788;
                fVar234 = uStack_788._4_4_;
                _local_7a0 = auVar14;
                _local_790 = auVar13;
                _local_6a0 = auVar15;
                _local_590 = auVar16;
                do {
                  local_634 = local_220[lVar130];
                  local_630 = *(undefined4 *)((long)&local_200 + lVar130 * 4);
                  local_6e0._0_8_ = lVar130;
                  ray->tfar = *(float *)(local_1e0 + lVar130 * 4);
                  fVar193 = 1.0 - local_634;
                  fVar196 = local_634 * (fVar193 + fVar193) - fVar193 * fVar193;
                  auVar213 = ZEXT464((uint)fVar196);
                  fVar178 = local_634 * 3.0;
                  auVar168 = ZEXT416((uint)((fVar193 * -2.0 * local_634 + local_634 * local_634) *
                                           0.5));
                  auVar168 = vshufps_avx(auVar168,auVar168,0);
                  auVar182 = ZEXT416((uint)(((fVar193 + fVar193) * (fVar178 + 2.0) +
                                            fVar193 * fVar193 * -3.0) * 0.5));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar161 = ZEXT416((uint)(((local_634 + local_634) * (fVar178 + -5.0) +
                                            local_634 * fVar178) * 0.5));
                  auVar161 = vshufps_avx(auVar161,auVar161,0);
                  auVar10 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.5)),
                                        ZEXT416((uint)(fVar196 * 0.5)),0);
                  auVar184._0_4_ = fVar218 * auVar10._0_4_;
                  auVar184._4_4_ = fVar219 * auVar10._4_4_;
                  auVar184._8_4_ = fVar221 * auVar10._8_4_;
                  auVar184._12_4_ = fVar230 * auVar10._12_4_;
                  auVar192 = ZEXT1664(auVar184);
                  auVar171._0_4_ =
                       auVar184._0_4_ +
                       fVar231 * auVar161._0_4_ +
                       fVar214 * auVar168._0_4_ + auVar182._0_4_ * (float)local_590._0_4_;
                  auVar171._4_4_ =
                       auVar184._4_4_ +
                       fVar232 * auVar161._4_4_ +
                       fVar215 * auVar168._4_4_ + auVar182._4_4_ * (float)local_590._4_4_;
                  auVar171._8_4_ =
                       auVar184._8_4_ +
                       fVar233 * auVar161._8_4_ +
                       fVar216 * auVar168._8_4_ + auVar182._8_4_ * (float)uStack_588;
                  auVar171._12_4_ =
                       auVar184._12_4_ +
                       fVar234 * auVar161._12_4_ +
                       fVar217 * auVar168._12_4_ + auVar182._12_4_ * uStack_588._4_4_;
                  local_690.context = context->user;
                  local_640 = vmovlps_avx(auVar171);
                  local_638 = vextractps_avx(auVar171,2);
                  local_62c = (int)local_608;
                  local_628 = (int)local_6e8;
                  local_624 = (local_690.context)->instID[0];
                  local_620 = (local_690.context)->instPrimID[0];
                  local_7ac = -1;
                  local_690.valid = &local_7ac;
                  local_690.geometryUserPtr = pGVar20->userPtr;
                  local_690.ray = (RTCRayN *)ray;
                  local_690.hit = (RTCHitN *)&local_640;
                  local_690.N = 1;
                  if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01084f18:
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar192 = ZEXT1664(auVar192._0_16_);
                      auVar213 = ZEXT1664(auVar213._0_16_);
                      (*p_Var21)(&local_690);
                      if (*local_690.valid == 0) goto LAB_01084f5d;
                    }
                    bVar129 = true;
                    auVar268 = ZEXT3264(local_740);
                    auVar290 = ZEXT3264(local_760);
                    fVar178 = (float)local_720._0_4_;
                    fVar196 = (float)local_720._4_4_;
                    fVar200 = fStack_718;
                    fVar205 = fStack_714;
                    fVar193 = fStack_710;
                    fVar198 = fStack_70c;
                    fVar203 = fStack_708;
                    fVar207 = fStack_704;
                    auVar14 = _local_7a0;
                    auVar13 = _local_790;
                    auVar15 = _local_6a0;
                    break;
                  }
                  auVar192 = ZEXT1664(auVar184);
                  auVar213 = ZEXT464((uint)fVar196);
                  (*pGVar20->occlusionFilterN)(&local_690);
                  if (*local_690.valid != 0) goto LAB_01084f18;
LAB_01084f5d:
                  ray->tfar = (float)local_660._0_4_;
                  uVar126 = (ulong)local_780 ^ 1L << (local_6e0._0_8_ & 0x3f);
                  lVar130 = 0;
                  if (uVar126 != 0) {
                    for (; (uVar126 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
                    }
                  }
                  bVar129 = false;
                  local_780 = (undefined1  [8])uVar126;
                  auVar268 = ZEXT3264(local_740);
                  auVar290 = ZEXT3264(local_760);
                  fVar214 = (float)local_6a0._0_4_;
                  fVar215 = (float)local_6a0._4_4_;
                  fVar216 = (float)uStack_698;
                  fVar217 = uStack_698._4_4_;
                  fVar178 = (float)local_720._0_4_;
                  fVar196 = (float)local_720._4_4_;
                  fVar200 = fStack_718;
                  fVar205 = fStack_714;
                  fVar193 = fStack_710;
                  fVar198 = fStack_70c;
                  fVar203 = fStack_708;
                  fVar207 = fStack_704;
                  fVar218 = (float)local_7a0._0_4_;
                  fVar219 = (float)local_7a0._4_4_;
                  fVar221 = (float)uStack_798;
                  fVar230 = uStack_798._4_4_;
                  fVar231 = (float)local_790._0_4_;
                  fVar232 = (float)local_790._4_4_;
                  fVar233 = (float)uStack_788;
                  fVar234 = uStack_788._4_4_;
                  auVar14 = _local_7a0;
                  auVar13 = _local_790;
                  auVar15 = _local_6a0;
                } while (uVar126 != 0);
              }
              goto LAB_01083e01;
            }
          }
LAB_01083d44:
          bVar129 = false;
          _local_590 = auVar16;
        }
      }
LAB_01083e01:
      _local_6a0 = auVar15;
      _local_790 = auVar13;
      _local_7a0 = auVar14;
      if (8 < (int)uVar122) {
        _local_480 = vpshufd_avx(ZEXT416(uVar122),0);
        auVar168 = vshufps_avx(local_6c0._0_16_,local_6c0._0_16_,0);
        register0x00001210 = auVar168;
        _local_4c0 = auVar168;
        auVar168 = vpermilps_avx(local_4e0._0_16_,0xff);
        local_e0._16_16_ = auVar168;
        local_e0._0_16_ = auVar168;
        auVar133._0_4_ = 1.0 / (float)local_420._0_4_;
        auVar133._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar168 = vshufps_avx(auVar133,auVar133,0);
        _fStack_410 = auVar168;
        _local_420 = auVar168;
        auVar146 = ZEXT3264(_local_420);
        lVar130 = 8;
        local_740 = auVar268._0_32_;
        local_760 = auVar290._0_32_;
        do {
          pauVar1 = (undefined1 (*) [28])(catmullrom_basis0 + lVar130 * 4 + lVar125);
          fVar214 = *(float *)*pauVar1;
          fVar215 = *(float *)(*pauVar1 + 4);
          fVar216 = *(float *)(*pauVar1 + 8);
          fVar217 = *(float *)(*pauVar1 + 0xc);
          fVar218 = *(float *)(*pauVar1 + 0x10);
          fVar219 = *(float *)(*pauVar1 + 0x14);
          fVar221 = *(float *)(*pauVar1 + 0x18);
          auVar119 = *pauVar1;
          pauVar3 = (undefined1 (*) [28])(lVar125 + 0x21b37f0 + lVar130 * 4);
          fVar230 = *(float *)*pauVar3;
          fVar231 = *(float *)(*pauVar3 + 4);
          fVar232 = *(float *)(*pauVar3 + 8);
          fVar233 = *(float *)(*pauVar3 + 0xc);
          fVar234 = *(float *)(*pauVar3 + 0x10);
          fVar235 = *(float *)(*pauVar3 + 0x14);
          fVar163 = *(float *)(*pauVar3 + 0x18);
          auVar118 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar125 + 0x21b3c74 + lVar130 * 4);
          fVar263 = *(float *)*pauVar3;
          fVar199 = *(float *)(*pauVar3 + 4);
          fVar274 = *(float *)(*pauVar3 + 8);
          fVar269 = *(float *)(*pauVar3 + 0xc);
          fVar271 = *(float *)(*pauVar3 + 0x10);
          fVar202 = *(float *)(*pauVar3 + 0x14);
          fVar296 = *(float *)(*pauVar3 + 0x18);
          auVar117 = *pauVar3;
          pauVar4 = (undefined1 (*) [32])(lVar125 + 0x21b40f8 + lVar130 * 4);
          fVar273 = *(float *)*pauVar4;
          fVar276 = *(float *)(*pauVar4 + 4);
          fVar204 = *(float *)(*pauVar4 + 8);
          fVar278 = *(float *)(*pauVar4 + 0xc);
          fVar176 = *(float *)(*pauVar4 + 0x10);
          fVar179 = *(float *)(*pauVar4 + 0x14);
          fVar194 = *(float *)(*pauVar4 + 0x18);
          auVar116 = *(undefined1 (*) [28])*pauVar4;
          _local_340 = *pauVar4;
          auVar26 = _local_340;
          fVar158 = auVar192._28_4_;
          fVar177 = fVar158 + *(float *)(*pauVar4 + 0x1c);
          fStack_764 = fVar158 + fVar158 + auVar146._28_4_;
          fVar220 = fVar158 + fVar177;
          auVar325._0_4_ =
               (float)local_3e0._0_4_ * fVar214 +
               (float)local_360._0_4_ * fVar230 +
               (float)local_440._0_4_ * fVar263 + (float)local_400._0_4_ * fVar273;
          auVar325._4_4_ =
               (float)local_3e0._4_4_ * fVar215 +
               (float)local_360._4_4_ * fVar231 +
               (float)local_440._4_4_ * fVar199 + (float)local_400._4_4_ * fVar276;
          auVar325._8_4_ =
               fStack_3d8 * fVar216 +
               fStack_358 * fVar232 + fStack_438 * fVar274 + fStack_3f8 * fVar204;
          auVar325._12_4_ =
               fStack_3d4 * fVar217 +
               fStack_354 * fVar233 + fStack_434 * fVar269 + fStack_3f4 * fVar278;
          auVar325._16_4_ =
               fStack_3d0 * fVar218 +
               fStack_350 * fVar234 + fStack_430 * fVar271 + fStack_3f0 * fVar176;
          auVar325._20_4_ =
               fStack_3cc * fVar219 +
               fStack_34c * fVar235 + fStack_42c * fVar202 + fStack_3ec * fVar179;
          auVar325._24_4_ =
               fStack_3c8 * fVar221 +
               fStack_348 * fVar163 + fStack_428 * fVar296 + fStack_3e8 * fVar194;
          auVar325._28_4_ = fVar177 + fStack_764;
          local_6c0._0_4_ =
               (float)local_a0._0_4_ * fVar230 +
               (float)local_3c0._0_4_ * fVar263 + fVar178 * fVar273 +
               (float)local_100._0_4_ * fVar214;
          local_6c0._4_4_ =
               (float)local_a0._4_4_ * fVar231 +
               (float)local_3c0._4_4_ * fVar199 + fVar196 * fVar276 +
               (float)local_100._4_4_ * fVar215;
          local_6c0._8_4_ =
               fStack_98 * fVar232 + fStack_3b8 * fVar274 + fVar200 * fVar204 + fStack_f8 * fVar216;
          local_6c0._12_4_ =
               fStack_94 * fVar233 + fStack_3b4 * fVar269 + fVar205 * fVar278 + fStack_f4 * fVar217;
          local_6c0._16_4_ =
               fStack_90 * fVar234 + fStack_3b0 * fVar271 + fVar193 * fVar176 + fStack_f0 * fVar218;
          local_6c0._20_4_ =
               fStack_8c * fVar235 + fStack_3ac * fVar202 + fVar198 * fVar179 + fStack_ec * fVar219;
          local_6c0._24_4_ =
               fStack_88 * fVar163 + fStack_3a8 * fVar296 + fVar203 * fVar194 + fStack_e8 * fVar221;
          local_6c0._28_4_ = fVar158 + fVar158 + auVar213._28_4_ + fStack_764;
          local_780._0_4_ =
               fVar214 * (float)local_180._0_4_ +
               fVar230 * (float)local_160._0_4_ +
               fVar263 * (float)local_120._0_4_ + fVar273 * (float)local_140._0_4_;
          local_780._4_4_ =
               fVar215 * (float)local_180._4_4_ +
               fVar231 * (float)local_160._4_4_ +
               fVar199 * (float)local_120._4_4_ + fVar276 * (float)local_140._4_4_;
          fStack_778 = fVar216 * fStack_178 +
                       fVar232 * fStack_158 + fVar274 * fStack_118 + fVar204 * fStack_138;
          fStack_774 = fVar217 * fStack_174 +
                       fVar233 * fStack_154 + fVar269 * fStack_114 + fVar278 * fStack_134;
          fStack_770 = fVar218 * fStack_170 +
                       fVar234 * fStack_150 + fVar271 * fStack_110 + fVar176 * fStack_130;
          fStack_76c = fVar219 * fStack_16c +
                       fVar235 * fStack_14c + fVar202 * fStack_10c + fVar179 * fStack_12c;
          fStack_768 = fVar221 * fStack_168 +
                       fVar163 * fStack_148 + fVar296 * fStack_108 + fVar194 * fStack_128;
          fStack_764 = fStack_764 + fVar220;
          pfVar2 = (float *)(catmullrom_basis1 + lVar130 * 4 + lVar125);
          fVar163 = *pfVar2;
          fVar263 = pfVar2[1];
          fVar199 = pfVar2[2];
          fVar274 = pfVar2[3];
          fVar269 = pfVar2[4];
          fVar271 = pfVar2[5];
          fVar202 = pfVar2[6];
          pauVar3 = (undefined1 (*) [28])(lVar125 + 0x21b5c10 + lVar130 * 4);
          fVar219 = *(float *)*pauVar3;
          fVar221 = *(float *)(*pauVar3 + 4);
          fVar231 = *(float *)(*pauVar3 + 8);
          fVar232 = *(float *)(*pauVar3 + 0xc);
          fVar234 = *(float *)(*pauVar3 + 0x10);
          fVar235 = *(float *)(*pauVar3 + 0x14);
          fVar296 = *(float *)(*pauVar3 + 0x18);
          auVar120 = *pauVar3;
          pfVar5 = (float *)(lVar125 + 0x21b6094 + lVar130 * 4);
          fVar273 = *pfVar5;
          fVar276 = pfVar5[1];
          fVar204 = pfVar5[2];
          fVar278 = pfVar5[3];
          fVar176 = pfVar5[4];
          fVar179 = pfVar5[5];
          fVar194 = pfVar5[6];
          auVar135 = *(undefined1 (*) [32])(lVar125 + 0x21b6518 + lVar130 * 4);
          auVar146 = ZEXT3264(auVar135);
          fVar214 = auVar135._0_4_;
          fVar215 = auVar135._4_4_;
          fVar216 = auVar135._8_4_;
          fVar217 = auVar135._12_4_;
          fVar218 = auVar135._16_4_;
          fVar230 = auVar135._20_4_;
          fVar233 = auVar135._24_4_;
          fVar177 = fVar207 + fVar207 + fVar220;
          auVar244._0_4_ =
               fVar163 * (float)local_3e0._0_4_ +
               (float)local_360._0_4_ * fVar219 +
               (float)local_440._0_4_ * fVar273 + (float)local_400._0_4_ * fVar214;
          auVar244._4_4_ =
               fVar263 * (float)local_3e0._4_4_ +
               (float)local_360._4_4_ * fVar221 +
               (float)local_440._4_4_ * fVar276 + (float)local_400._4_4_ * fVar215;
          auVar244._8_4_ =
               fVar199 * fStack_3d8 +
               fStack_358 * fVar231 + fStack_438 * fVar204 + fStack_3f8 * fVar216;
          auVar244._12_4_ =
               fVar274 * fStack_3d4 +
               fStack_354 * fVar232 + fStack_434 * fVar278 + fStack_3f4 * fVar217;
          auVar244._16_4_ =
               fVar269 * fStack_3d0 +
               fStack_350 * fVar234 + fStack_430 * fVar176 + fStack_3f0 * fVar218;
          auVar244._20_4_ =
               fVar271 * fStack_3cc +
               fStack_34c * fVar235 + fStack_42c * fVar179 + fStack_3ec * fVar230;
          auVar244._24_4_ =
               fVar202 * fStack_3c8 +
               fStack_348 * fVar296 + fStack_428 * fVar194 + fStack_3e8 * fVar233;
          auVar244._28_4_ = fStack_3c4 + fVar177;
          local_4e0._0_4_ =
               (float)local_100._0_4_ * fVar163 +
               (float)local_a0._0_4_ * fVar219 +
               (float)local_3c0._0_4_ * fVar273 + fVar178 * fVar214;
          local_4e0._4_4_ =
               (float)local_100._4_4_ * fVar263 +
               (float)local_a0._4_4_ * fVar221 +
               (float)local_3c0._4_4_ * fVar276 + fVar196 * fVar215;
          local_4e0._8_4_ =
               fStack_f8 * fVar199 + fStack_98 * fVar231 + fStack_3b8 * fVar204 + fVar200 * fVar216;
          local_4e0._12_4_ =
               fStack_f4 * fVar274 + fStack_94 * fVar232 + fStack_3b4 * fVar278 + fVar205 * fVar217;
          local_4e0._16_4_ =
               fStack_f0 * fVar269 + fStack_90 * fVar234 + fStack_3b0 * fVar176 + fVar193 * fVar218;
          local_4e0._20_4_ =
               fStack_ec * fVar271 + fStack_8c * fVar235 + fStack_3ac * fVar179 + fVar198 * fVar230;
          local_4e0._24_4_ =
               fStack_e8 * fVar202 + fStack_88 * fVar296 + fStack_3a8 * fVar194 + fVar203 * fVar233;
          local_4e0._28_4_ = fVar177 + fVar207 + fVar207 + *(float *)pauVar1[1];
          local_500._0_4_ =
               fVar219 * (float)local_160._0_4_ +
               fVar273 * (float)local_120._0_4_ + fVar214 * (float)local_140._0_4_ +
               fVar163 * (float)local_180._0_4_;
          local_500._4_4_ =
               fVar221 * (float)local_160._4_4_ +
               fVar276 * (float)local_120._4_4_ + fVar215 * (float)local_140._4_4_ +
               fVar263 * (float)local_180._4_4_;
          fStack_4f8 = fVar231 * fStack_158 + fVar204 * fStack_118 + fVar216 * fStack_138 +
                       fVar199 * fStack_178;
          fStack_4f4 = fVar232 * fStack_154 + fVar278 * fStack_114 + fVar217 * fStack_134 +
                       fVar274 * fStack_174;
          fStack_4f0 = fVar234 * fStack_150 + fVar176 * fStack_110 + fVar218 * fStack_130 +
                       fVar269 * fStack_170;
          fStack_4ec = fVar235 * fStack_14c + fVar179 * fStack_10c + fVar230 * fStack_12c +
                       fVar271 * fStack_16c;
          fStack_4e8 = fVar296 * fStack_148 + fVar194 * fStack_108 + fVar233 * fStack_128 +
                       fVar202 * fStack_168;
          fStack_4e4 = fVar207 + fVar207 + fStack_3e4 + fVar177;
          auVar284 = vsubps_avx(auVar244,auVar325);
          auVar24 = vsubps_avx(local_4e0,local_6c0);
          fVar178 = auVar284._0_4_;
          fVar196 = auVar284._4_4_;
          auVar73._4_4_ = local_6c0._4_4_ * fVar196;
          auVar73._0_4_ = local_6c0._0_4_ * fVar178;
          fVar200 = auVar284._8_4_;
          auVar73._8_4_ = local_6c0._8_4_ * fVar200;
          fVar205 = auVar284._12_4_;
          auVar73._12_4_ = local_6c0._12_4_ * fVar205;
          fVar219 = auVar284._16_4_;
          auVar73._16_4_ = local_6c0._16_4_ * fVar219;
          fVar231 = auVar284._20_4_;
          auVar73._20_4_ = local_6c0._20_4_ * fVar231;
          fVar234 = auVar284._24_4_;
          auVar73._24_4_ = local_6c0._24_4_ * fVar234;
          auVar73._28_4_ = fVar177;
          fVar193 = auVar24._0_4_;
          fVar198 = auVar24._4_4_;
          auVar74._4_4_ = auVar325._4_4_ * fVar198;
          auVar74._0_4_ = auVar325._0_4_ * fVar193;
          fVar203 = auVar24._8_4_;
          auVar74._8_4_ = auVar325._8_4_ * fVar203;
          fVar207 = auVar24._12_4_;
          auVar74._12_4_ = auVar325._12_4_ * fVar207;
          fVar221 = auVar24._16_4_;
          auVar74._16_4_ = auVar325._16_4_ * fVar221;
          fVar232 = auVar24._20_4_;
          auVar74._20_4_ = auVar325._20_4_ * fVar232;
          fVar235 = auVar24._24_4_;
          auVar74._24_4_ = auVar325._24_4_ * fVar235;
          auVar74._28_4_ = local_4e0._28_4_;
          auVar25 = vsubps_avx(auVar73,auVar74);
          auVar135 = vmaxps_avx(_local_780,_local_500);
          auVar75._4_4_ = auVar135._4_4_ * auVar135._4_4_ * (fVar196 * fVar196 + fVar198 * fVar198);
          auVar75._0_4_ = auVar135._0_4_ * auVar135._0_4_ * (fVar178 * fVar178 + fVar193 * fVar193);
          auVar75._8_4_ = auVar135._8_4_ * auVar135._8_4_ * (fVar200 * fVar200 + fVar203 * fVar203);
          auVar75._12_4_ =
               auVar135._12_4_ * auVar135._12_4_ * (fVar205 * fVar205 + fVar207 * fVar207);
          auVar75._16_4_ =
               auVar135._16_4_ * auVar135._16_4_ * (fVar219 * fVar219 + fVar221 * fVar221);
          auVar75._20_4_ =
               auVar135._20_4_ * auVar135._20_4_ * (fVar231 * fVar231 + fVar232 * fVar232);
          auVar75._24_4_ =
               auVar135._24_4_ * auVar135._24_4_ * (fVar234 * fVar234 + fVar235 * fVar235);
          auVar75._28_4_ = auVar244._28_4_ + local_4e0._28_4_;
          auVar76._4_4_ = auVar25._4_4_ * auVar25._4_4_;
          auVar76._0_4_ = auVar25._0_4_ * auVar25._0_4_;
          auVar76._8_4_ = auVar25._8_4_ * auVar25._8_4_;
          auVar76._12_4_ = auVar25._12_4_ * auVar25._12_4_;
          auVar76._16_4_ = auVar25._16_4_ * auVar25._16_4_;
          auVar76._20_4_ = auVar25._20_4_ * auVar25._20_4_;
          auVar76._24_4_ = auVar25._24_4_ * auVar25._24_4_;
          auVar76._28_4_ = auVar25._28_4_;
          auVar213 = ZEXT3264(auVar76);
          auVar135 = vcmpps_avx(auVar76,auVar75,2);
          auVar192 = ZEXT3264(auVar135);
          local_2a0 = (uint)lVar130;
          auVar182 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar168 = vpor_avx(auVar182,_DAT_01f7fcf0);
          auVar182 = vpor_avx(auVar182,_DAT_01fafea0);
          auVar168 = vpcmpgtd_avx(_local_480,auVar168);
          auVar182 = vpcmpgtd_avx(_local_480,auVar182);
          register0x00001250 = auVar182;
          _local_4a0 = auVar168;
          auVar25 = _local_4a0 & auVar135;
          fVar178 = (float)local_720._0_4_;
          fVar196 = (float)local_720._4_4_;
          fVar200 = fStack_718;
          fVar205 = fStack_714;
          fVar193 = fStack_710;
          fVar198 = fStack_70c;
          fVar203 = fStack_708;
          fVar207 = fStack_704;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
LAB_01084750:
            auVar290 = ZEXT3264(local_760);
            auVar268 = ZEXT3264(local_740);
          }
          else {
            local_580._0_4_ = auVar120._0_4_;
            local_580._4_4_ = auVar120._4_4_;
            fStack_578 = auVar120._8_4_;
            fStack_574 = auVar120._12_4_;
            fStack_570 = auVar120._16_4_;
            fStack_56c = auVar120._20_4_;
            fStack_568 = auVar120._24_4_;
            fVar219 = (float)local_320._0_4_ * (float)local_580._0_4_;
            fVar221 = (float)local_320._4_4_ * (float)local_580._4_4_;
            fVar231 = fStack_318 * fStack_578;
            fVar232 = fStack_314 * fStack_574;
            fVar234 = fStack_310 * fStack_570;
            fVar235 = fStack_30c * fStack_56c;
            fVar296 = fStack_308 * fStack_568;
            _local_580 = auVar135;
            local_5e0._0_4_ =
                 fVar163 * (float)local_540._0_4_ +
                 fVar219 + (float)local_c0._0_4_ * fVar273 + (float)local_600._0_4_ * fVar214;
            local_5e0._4_4_ =
                 fVar263 * (float)local_540._4_4_ +
                 fVar221 + (float)local_c0._4_4_ * fVar276 + (float)local_600._4_4_ * fVar215;
            fStack_5d8 = fVar199 * fStack_538 + fVar231 + fStack_b8 * fVar204 + fStack_5f8 * fVar216
            ;
            fStack_5d4 = fVar274 * fStack_534 + fVar232 + fStack_b4 * fVar278 + fStack_5f4 * fVar217
            ;
            fStack_5d0 = fVar269 * fStack_530 + fVar234 + fStack_b0 * fVar176 + fStack_5f0 * fVar218
            ;
            fStack_5cc = fVar271 * fStack_52c + fVar235 + fStack_ac * fVar179 + fStack_5ec * fVar230
            ;
            fStack_5c8 = fVar202 * fStack_528 + fVar296 + fStack_a8 * fVar194 + fStack_5e8 * fVar233
            ;
            fStack_5c4 = fStack_4e4 + pfVar5[7] + auVar182._12_4_ + 0.0;
            local_5c0._0_4_ = auVar118._0_4_;
            local_5c0._4_4_ = auVar118._4_4_;
            fStack_5b8 = auVar118._8_4_;
            fStack_5b4 = auVar118._12_4_;
            fStack_5b0 = auVar118._16_4_;
            fStack_5ac = auVar118._20_4_;
            fStack_5a8 = auVar118._24_4_;
            local_460._0_4_ = auVar117._0_4_;
            local_460._4_4_ = auVar117._4_4_;
            fStack_458 = auVar117._8_4_;
            fStack_454 = auVar117._12_4_;
            fStack_450 = auVar117._16_4_;
            fStack_44c = auVar117._20_4_;
            fStack_448 = auVar117._24_4_;
            fVar177 = (float)local_c0._0_4_ * (float)local_460._0_4_;
            fVar158 = (float)local_c0._4_4_ * (float)local_460._4_4_;
            fVar220 = fStack_b8 * fStack_458;
            fVar159 = fStack_b4 * fStack_454;
            fVar160 = fStack_b0 * fStack_450;
            fVar162 = fStack_ac * fStack_44c;
            fVar164 = fStack_a8 * fStack_448;
            local_340._0_4_ = auVar116._0_4_;
            local_340._4_4_ = auVar116._4_4_;
            fStack_338 = auVar116._8_4_;
            fStack_334 = auVar116._12_4_;
            fStack_330 = auVar116._16_4_;
            fStack_32c = auVar116._20_4_;
            fStack_328 = auVar116._24_4_;
            pfVar5 = (float *)(lVar125 + 0x21b4e84 + lVar130 * 4);
            fVar214 = *pfVar5;
            fVar215 = pfVar5[1];
            fVar216 = pfVar5[2];
            fVar217 = pfVar5[3];
            fVar218 = pfVar5[4];
            fVar219 = pfVar5[5];
            fVar221 = pfVar5[6];
            pfVar6 = (float *)(lVar125 + 0x21b5308 + lVar130 * 4);
            fVar230 = *pfVar6;
            fVar231 = pfVar6[1];
            fVar232 = pfVar6[2];
            fVar233 = pfVar6[3];
            fVar234 = pfVar6[4];
            fVar235 = pfVar6[5];
            fVar163 = pfVar6[6];
            pfVar7 = (float *)(lVar125 + 0x21b4a00 + lVar130 * 4);
            fVar263 = *pfVar7;
            fVar199 = pfVar7[1];
            fVar274 = pfVar7[2];
            fVar269 = pfVar7[3];
            fVar271 = pfVar7[4];
            fVar202 = pfVar7[5];
            fVar296 = pfVar7[6];
            fVar166 = pfVar6[7] + fStack_e4 + 0.0;
            fVar246 = fStack_e4 + pfVar2[7] + fStack_e4 + 0.0;
            pfVar2 = (float *)(lVar125 + 0x21b457c + lVar130 * 4);
            fVar273 = *pfVar2;
            fVar276 = pfVar2[1];
            fVar204 = pfVar2[2];
            fVar278 = pfVar2[3];
            fVar176 = pfVar2[4];
            fVar179 = pfVar2[5];
            fVar194 = pfVar2[6];
            fStack_444 = pfVar5[7] + fVar166;
            local_460._4_4_ =
                 fVar276 * (float)local_3e0._4_4_ +
                 fVar199 * (float)local_360._4_4_ +
                 (float)local_440._4_4_ * fVar215 + (float)local_400._4_4_ * fVar231;
            local_460._0_4_ =
                 fVar273 * (float)local_3e0._0_4_ +
                 fVar263 * (float)local_360._0_4_ +
                 (float)local_440._0_4_ * fVar214 + (float)local_400._0_4_ * fVar230;
            fStack_458 = fVar204 * fStack_3d8 +
                         fVar274 * fStack_358 + fStack_438 * fVar216 + fStack_3f8 * fVar232;
            fStack_454 = fVar278 * fStack_3d4 +
                         fVar269 * fStack_354 + fStack_434 * fVar217 + fStack_3f4 * fVar233;
            fStack_450 = fVar176 * fStack_3d0 +
                         fVar271 * fStack_350 + fStack_430 * fVar218 + fStack_3f0 * fVar234;
            fStack_44c = fVar179 * fStack_3cc +
                         fVar202 * fStack_34c + fStack_42c * fVar219 + fStack_3ec * fVar235;
            fStack_448 = fVar194 * fStack_3c8 +
                         fVar296 * fStack_348 + fStack_428 * fVar221 + fStack_3e8 * fVar163;
            auVar154._0_4_ =
                 fVar273 * (float)local_100._0_4_ +
                 (float)local_3c0._0_4_ * fVar214 + (float)local_720._0_4_ * fVar230 +
                 (float)local_a0._0_4_ * fVar263;
            auVar154._4_4_ =
                 fVar276 * (float)local_100._4_4_ +
                 (float)local_3c0._4_4_ * fVar215 + (float)local_720._4_4_ * fVar231 +
                 (float)local_a0._4_4_ * fVar199;
            auVar154._8_4_ =
                 fVar204 * fStack_f8 +
                 fStack_3b8 * fVar216 + fStack_718 * fVar232 + fStack_98 * fVar274;
            auVar154._12_4_ =
                 fVar278 * fStack_f4 +
                 fStack_3b4 * fVar217 + fStack_714 * fVar233 + fStack_94 * fVar269;
            auVar154._16_4_ =
                 fVar176 * fStack_f0 +
                 fStack_3b0 * fVar218 + fStack_710 * fVar234 + fStack_90 * fVar271;
            auVar154._20_4_ =
                 fVar179 * fStack_ec +
                 fStack_3ac * fVar219 + fStack_70c * fVar235 + fStack_8c * fVar202;
            auVar154._24_4_ =
                 fVar194 * fStack_e8 +
                 fStack_3a8 * fVar221 + fStack_708 * fVar163 + fStack_88 * fVar296;
            auVar154._28_4_ = fVar166 + fVar246;
            auVar311._0_4_ =
                 (float)local_320._0_4_ * fVar263 +
                 (float)local_c0._0_4_ * fVar214 + (float)local_600._0_4_ * fVar230 +
                 fVar273 * (float)local_540._0_4_;
            auVar311._4_4_ =
                 (float)local_320._4_4_ * fVar199 +
                 (float)local_c0._4_4_ * fVar215 + (float)local_600._4_4_ * fVar231 +
                 fVar276 * (float)local_540._4_4_;
            auVar311._8_4_ =
                 fStack_318 * fVar274 + fStack_b8 * fVar216 + fStack_5f8 * fVar232 +
                 fVar204 * fStack_538;
            auVar311._12_4_ =
                 fStack_314 * fVar269 + fStack_b4 * fVar217 + fStack_5f4 * fVar233 +
                 fVar278 * fStack_534;
            auVar311._16_4_ =
                 fStack_310 * fVar271 + fStack_b0 * fVar218 + fStack_5f0 * fVar234 +
                 fVar176 * fStack_530;
            auVar311._20_4_ =
                 fStack_30c * fVar202 + fStack_ac * fVar219 + fStack_5ec * fVar235 +
                 fVar179 * fStack_52c;
            auVar311._24_4_ =
                 fStack_308 * fVar296 + fStack_a8 * fVar221 + fStack_5e8 * fVar163 +
                 fVar194 * fStack_528;
            auVar311._28_4_ = pfVar7[7] + pfVar5[7] + pfVar6[7] + fVar246;
            pfVar2 = (float *)(lVar125 + 0x21b72a4 + lVar130 * 4);
            fVar214 = *pfVar2;
            fVar215 = pfVar2[1];
            fVar216 = pfVar2[2];
            fVar217 = pfVar2[3];
            fVar218 = pfVar2[4];
            fVar219 = pfVar2[5];
            fVar221 = pfVar2[6];
            pfVar5 = (float *)(lVar125 + 0x21b7728 + lVar130 * 4);
            fVar230 = *pfVar5;
            fVar231 = pfVar5[1];
            fVar232 = pfVar5[2];
            fVar233 = pfVar5[3];
            fVar234 = pfVar5[4];
            fVar235 = pfVar5[5];
            fVar163 = pfVar5[6];
            pfVar6 = (float *)(lVar125 + 0x21b6e20 + lVar130 * 4);
            fVar263 = *pfVar6;
            fVar199 = pfVar6[1];
            fVar274 = pfVar6[2];
            fVar269 = pfVar6[3];
            fVar271 = pfVar6[4];
            fVar202 = pfVar6[5];
            fVar296 = pfVar6[6];
            pfVar7 = (float *)(lVar125 + 0x21b699c + lVar130 * 4);
            fVar273 = *pfVar7;
            fVar276 = pfVar7[1];
            fVar204 = pfVar7[2];
            fVar278 = pfVar7[3];
            fVar176 = pfVar7[4];
            fVar179 = pfVar7[5];
            fVar194 = pfVar7[6];
            auVar288._0_4_ =
                 fVar273 * (float)local_3e0._0_4_ +
                 fVar263 * (float)local_360._0_4_ +
                 (float)local_440._0_4_ * fVar214 + (float)local_400._0_4_ * fVar230;
            auVar288._4_4_ =
                 fVar276 * (float)local_3e0._4_4_ +
                 fVar199 * (float)local_360._4_4_ +
                 (float)local_440._4_4_ * fVar215 + (float)local_400._4_4_ * fVar231;
            auVar288._8_4_ =
                 fVar204 * fStack_3d8 +
                 fVar274 * fStack_358 + fStack_438 * fVar216 + fStack_3f8 * fVar232;
            auVar288._12_4_ =
                 fVar278 * fStack_3d4 +
                 fVar269 * fStack_354 + fStack_434 * fVar217 + fStack_3f4 * fVar233;
            auVar288._16_4_ =
                 fVar176 * fStack_3d0 +
                 fVar271 * fStack_350 + fStack_430 * fVar218 + fStack_3f0 * fVar234;
            auVar288._20_4_ =
                 fVar179 * fStack_3cc +
                 fVar202 * fStack_34c + fStack_42c * fVar219 + fStack_3ec * fVar235;
            auVar288._24_4_ =
                 fVar194 * fStack_3c8 +
                 fVar296 * fStack_348 + fStack_428 * fVar221 + fStack_3e8 * fVar163;
            auVar288._28_4_ = fStack_704 + fStack_704 + fStack_3e4 + fStack_444;
            auVar308._0_4_ =
                 fVar273 * (float)local_100._0_4_ +
                 fVar263 * (float)local_a0._0_4_ +
                 (float)local_3c0._0_4_ * fVar214 + (float)local_720._0_4_ * fVar230;
            auVar308._4_4_ =
                 fVar276 * (float)local_100._4_4_ +
                 fVar199 * (float)local_a0._4_4_ +
                 (float)local_3c0._4_4_ * fVar215 + (float)local_720._4_4_ * fVar231;
            auVar308._8_4_ =
                 fVar204 * fStack_f8 +
                 fVar274 * fStack_98 + fStack_3b8 * fVar216 + fStack_718 * fVar232;
            auVar308._12_4_ =
                 fVar278 * fStack_f4 +
                 fVar269 * fStack_94 + fStack_3b4 * fVar217 + fStack_714 * fVar233;
            auVar308._16_4_ =
                 fVar176 * fStack_f0 +
                 fVar271 * fStack_90 + fStack_3b0 * fVar218 + fStack_710 * fVar234;
            auVar308._20_4_ =
                 fVar179 * fStack_ec +
                 fVar202 * fStack_8c + fStack_3ac * fVar219 + fStack_70c * fVar235;
            auVar308._24_4_ =
                 fVar194 * fStack_e8 +
                 fVar296 * fStack_88 + fStack_3a8 * fVar221 + fStack_708 * fVar163;
            auVar308._28_4_ = fStack_704 + fStack_704 + fStack_84 + fStack_704;
            auVar229._8_4_ = 0x7fffffff;
            auVar229._0_8_ = 0x7fffffff7fffffff;
            auVar229._12_4_ = 0x7fffffff;
            auVar229._16_4_ = 0x7fffffff;
            auVar229._20_4_ = 0x7fffffff;
            auVar229._24_4_ = 0x7fffffff;
            auVar229._28_4_ = 0x7fffffff;
            auVar25 = vandps_avx(_local_460,auVar229);
            auVar27 = vandps_avx(auVar154,auVar229);
            auVar27 = vmaxps_avx(auVar25,auVar27);
            auVar25 = vandps_avx(auVar311,auVar229);
            auVar27 = vmaxps_avx(auVar27,auVar25);
            auVar27 = vcmpps_avx(auVar27,_local_4c0,1);
            auVar28 = vblendvps_avx(_local_460,auVar284,auVar27);
            auVar143._0_4_ =
                 fVar273 * (float)local_540._0_4_ +
                 (float)local_320._0_4_ * fVar263 +
                 fVar230 * (float)local_600._0_4_ + (float)local_c0._0_4_ * fVar214;
            auVar143._4_4_ =
                 fVar276 * (float)local_540._4_4_ +
                 (float)local_320._4_4_ * fVar199 +
                 fVar231 * (float)local_600._4_4_ + (float)local_c0._4_4_ * fVar215;
            auVar143._8_4_ =
                 fVar204 * fStack_538 +
                 fStack_318 * fVar274 + fVar232 * fStack_5f8 + fStack_b8 * fVar216;
            auVar143._12_4_ =
                 fVar278 * fStack_534 +
                 fStack_314 * fVar269 + fVar233 * fStack_5f4 + fStack_b4 * fVar217;
            auVar143._16_4_ =
                 fVar176 * fStack_530 +
                 fStack_310 * fVar271 + fVar234 * fStack_5f0 + fStack_b0 * fVar218;
            auVar143._20_4_ =
                 fVar179 * fStack_52c +
                 fStack_30c * fVar202 + fVar235 * fStack_5ec + fStack_ac * fVar219;
            auVar143._24_4_ =
                 fVar194 * fStack_528 +
                 fStack_308 * fVar296 + fVar163 * fStack_5e8 + fStack_a8 * fVar221;
            auVar143._28_4_ = auVar25._28_4_ + pfVar6[7] + pfVar5[7] + pfVar2[7];
            auVar29 = vblendvps_avx(auVar154,auVar24,auVar27);
            auVar25 = vandps_avx(auVar288,auVar229);
            auVar27 = vandps_avx(auVar308,auVar229);
            auVar27 = vmaxps_avx(auVar25,auVar27);
            auVar25 = vandps_avx(auVar143,auVar229);
            auVar25 = vmaxps_avx(auVar27,auVar25);
            local_560._0_4_ = auVar119._0_4_;
            local_560._4_4_ = auVar119._4_4_;
            fStack_558 = auVar119._8_4_;
            fStack_554 = auVar119._12_4_;
            fStack_550 = auVar119._16_4_;
            fStack_54c = auVar119._20_4_;
            fStack_548 = auVar119._24_4_;
            auVar25 = vcmpps_avx(auVar25,_local_4c0,1);
            auVar284 = vblendvps_avx(auVar288,auVar284,auVar25);
            auVar144._0_4_ =
                 (float)local_540._0_4_ * (float)local_560._0_4_ +
                 (float)local_320._0_4_ * (float)local_5c0._0_4_ +
                 fVar177 + (float)local_600._0_4_ * (float)local_340._0_4_;
            auVar144._4_4_ =
                 (float)local_540._4_4_ * (float)local_560._4_4_ +
                 (float)local_320._4_4_ * (float)local_5c0._4_4_ +
                 fVar158 + (float)local_600._4_4_ * (float)local_340._4_4_;
            auVar144._8_4_ =
                 fStack_538 * fStack_558 +
                 fStack_318 * fStack_5b8 + fVar220 + fStack_5f8 * fStack_338;
            auVar144._12_4_ =
                 fStack_534 * fStack_554 +
                 fStack_314 * fStack_5b4 + fVar159 + fStack_5f4 * fStack_334;
            auVar144._16_4_ =
                 fStack_530 * fStack_550 +
                 fStack_310 * fStack_5b0 + fVar160 + fStack_5f0 * fStack_330;
            auVar144._20_4_ =
                 fStack_52c * fStack_54c +
                 fStack_30c * fStack_5ac + fVar162 + fStack_5ec * fStack_32c;
            auVar144._24_4_ =
                 fStack_528 * fStack_548 +
                 fStack_308 * fStack_5a8 + fVar164 + fStack_5e8 * fStack_328;
            auVar144._28_4_ = auVar27._28_4_ + fStack_5c4 + auVar182._12_4_ + 0.0;
            auVar25 = vblendvps_avx(auVar308,auVar24,auVar25);
            fVar166 = auVar28._0_4_;
            fVar246 = auVar28._4_4_;
            fVar195 = auVar28._8_4_;
            fVar197 = auVar28._12_4_;
            fVar165 = auVar28._16_4_;
            fVar201 = auVar28._20_4_;
            fVar280 = auVar28._24_4_;
            fVar206 = auVar28._28_4_;
            fVar263 = auVar284._0_4_;
            fVar274 = auVar284._4_4_;
            fVar271 = auVar284._8_4_;
            fVar296 = auVar284._12_4_;
            fVar276 = auVar284._16_4_;
            fVar278 = auVar284._20_4_;
            fVar179 = auVar284._24_4_;
            fVar214 = auVar29._0_4_;
            fVar216 = auVar29._4_4_;
            fVar218 = auVar29._8_4_;
            fVar221 = auVar29._12_4_;
            fVar231 = auVar29._16_4_;
            fVar233 = auVar29._20_4_;
            fVar235 = auVar29._24_4_;
            auVar300._0_4_ = fVar214 * fVar214 + fVar166 * fVar166;
            auVar300._4_4_ = fVar216 * fVar216 + fVar246 * fVar246;
            auVar300._8_4_ = fVar218 * fVar218 + fVar195 * fVar195;
            auVar300._12_4_ = fVar221 * fVar221 + fVar197 * fVar197;
            auVar300._16_4_ = fVar231 * fVar231 + fVar165 * fVar165;
            auVar300._20_4_ = fVar233 * fVar233 + fVar201 * fVar201;
            auVar300._24_4_ = fVar235 * fVar235 + fVar280 * fVar280;
            auVar300._28_4_ = fStack_3a4 + auVar24._28_4_;
            auVar24 = vrsqrtps_avx(auVar300);
            fVar215 = auVar24._0_4_;
            fVar217 = auVar24._4_4_;
            auVar77._4_4_ = fVar217 * 1.5;
            auVar77._0_4_ = fVar215 * 1.5;
            fVar219 = auVar24._8_4_;
            auVar77._8_4_ = fVar219 * 1.5;
            fVar230 = auVar24._12_4_;
            auVar77._12_4_ = fVar230 * 1.5;
            fVar232 = auVar24._16_4_;
            auVar77._16_4_ = fVar232 * 1.5;
            fVar234 = auVar24._20_4_;
            auVar77._20_4_ = fVar234 * 1.5;
            fVar163 = auVar24._24_4_;
            auVar77._24_4_ = fVar163 * 1.5;
            auVar77._28_4_ = auVar308._28_4_;
            auVar78._4_4_ = fVar217 * fVar217 * fVar217 * auVar300._4_4_ * 0.5;
            auVar78._0_4_ = fVar215 * fVar215 * fVar215 * auVar300._0_4_ * 0.5;
            auVar78._8_4_ = fVar219 * fVar219 * fVar219 * auVar300._8_4_ * 0.5;
            auVar78._12_4_ = fVar230 * fVar230 * fVar230 * auVar300._12_4_ * 0.5;
            auVar78._16_4_ = fVar232 * fVar232 * fVar232 * auVar300._16_4_ * 0.5;
            auVar78._20_4_ = fVar234 * fVar234 * fVar234 * auVar300._20_4_ * 0.5;
            auVar78._24_4_ = fVar163 * fVar163 * fVar163 * auVar300._24_4_ * 0.5;
            auVar78._28_4_ = auVar300._28_4_;
            auVar27 = vsubps_avx(auVar77,auVar78);
            fVar177 = auVar27._0_4_;
            fVar158 = auVar27._4_4_;
            fVar220 = auVar27._8_4_;
            fVar159 = auVar27._12_4_;
            fVar160 = auVar27._16_4_;
            fVar162 = auVar27._20_4_;
            fVar164 = auVar27._24_4_;
            fVar215 = auVar25._0_4_;
            fVar217 = auVar25._4_4_;
            fVar219 = auVar25._8_4_;
            fVar230 = auVar25._12_4_;
            fVar232 = auVar25._16_4_;
            fVar234 = auVar25._20_4_;
            fVar163 = auVar25._24_4_;
            auVar267._0_4_ = fVar215 * fVar215 + fVar263 * fVar263;
            auVar267._4_4_ = fVar217 * fVar217 + fVar274 * fVar274;
            auVar267._8_4_ = fVar219 * fVar219 + fVar271 * fVar271;
            auVar267._12_4_ = fVar230 * fVar230 + fVar296 * fVar296;
            auVar267._16_4_ = fVar232 * fVar232 + fVar276 * fVar276;
            auVar267._20_4_ = fVar234 * fVar234 + fVar278 * fVar278;
            auVar267._24_4_ = fVar163 * fVar163 + fVar179 * fVar179;
            auVar267._28_4_ = auVar24._28_4_ + auVar284._28_4_;
            auVar284 = vrsqrtps_avx(auVar267);
            fVar199 = auVar284._0_4_;
            fVar269 = auVar284._4_4_;
            auVar79._4_4_ = fVar269 * 1.5;
            auVar79._0_4_ = fVar199 * 1.5;
            fVar202 = auVar284._8_4_;
            auVar79._8_4_ = fVar202 * 1.5;
            fVar273 = auVar284._12_4_;
            auVar79._12_4_ = fVar273 * 1.5;
            fVar204 = auVar284._16_4_;
            auVar79._16_4_ = fVar204 * 1.5;
            fVar176 = auVar284._20_4_;
            auVar79._20_4_ = fVar176 * 1.5;
            fVar194 = auVar284._24_4_;
            auVar79._24_4_ = fVar194 * 1.5;
            auVar79._28_4_ = auVar308._28_4_;
            auVar80._4_4_ = fVar269 * fVar269 * fVar269 * auVar267._4_4_ * 0.5;
            auVar80._0_4_ = fVar199 * fVar199 * fVar199 * auVar267._0_4_ * 0.5;
            auVar80._8_4_ = fVar202 * fVar202 * fVar202 * auVar267._8_4_ * 0.5;
            auVar80._12_4_ = fVar273 * fVar273 * fVar273 * auVar267._12_4_ * 0.5;
            auVar80._16_4_ = fVar204 * fVar204 * fVar204 * auVar267._16_4_ * 0.5;
            auVar80._20_4_ = fVar176 * fVar176 * fVar176 * auVar267._20_4_ * 0.5;
            auVar80._24_4_ = fVar194 * fVar194 * fVar194 * auVar267._24_4_ * 0.5;
            auVar80._28_4_ = auVar267._28_4_;
            auVar24 = vsubps_avx(auVar79,auVar80);
            fVar199 = auVar24._0_4_;
            fVar269 = auVar24._4_4_;
            fVar202 = auVar24._8_4_;
            fVar273 = auVar24._12_4_;
            fVar204 = auVar24._16_4_;
            fVar176 = auVar24._20_4_;
            fVar194 = auVar24._24_4_;
            fVar214 = (float)local_780._0_4_ * fVar177 * fVar214;
            fVar216 = (float)local_780._4_4_ * fVar158 * fVar216;
            auVar81._4_4_ = fVar216;
            auVar81._0_4_ = fVar214;
            fVar218 = fStack_778 * fVar220 * fVar218;
            auVar81._8_4_ = fVar218;
            fVar221 = fStack_774 * fVar159 * fVar221;
            auVar81._12_4_ = fVar221;
            fVar231 = fStack_770 * fVar160 * fVar231;
            auVar81._16_4_ = fVar231;
            fVar233 = fStack_76c * fVar162 * fVar233;
            auVar81._20_4_ = fVar233;
            fVar235 = fStack_768 * fVar164 * fVar235;
            auVar81._24_4_ = fVar235;
            auVar81._28_4_ = auVar284._28_4_;
            local_560._4_4_ = fVar216 + auVar325._4_4_;
            local_560._0_4_ = fVar214 + auVar325._0_4_;
            fStack_558 = fVar218 + auVar325._8_4_;
            fStack_554 = fVar221 + auVar325._12_4_;
            fStack_550 = fVar231 + auVar325._16_4_;
            fStack_54c = fVar233 + auVar325._20_4_;
            fStack_548 = fVar235 + auVar325._24_4_;
            fStack_544 = auVar284._28_4_ + auVar325._28_4_;
            fVar214 = (float)local_780._0_4_ * fVar177 * -fVar166;
            fVar216 = (float)local_780._4_4_ * fVar158 * -fVar246;
            auVar82._4_4_ = fVar216;
            auVar82._0_4_ = fVar214;
            fVar218 = fStack_778 * fVar220 * -fVar195;
            auVar82._8_4_ = fVar218;
            fVar221 = fStack_774 * fVar159 * -fVar197;
            auVar82._12_4_ = fVar221;
            fVar231 = fStack_770 * fVar160 * -fVar165;
            auVar82._16_4_ = fVar231;
            fVar233 = fStack_76c * fVar162 * -fVar201;
            auVar82._20_4_ = fVar233;
            fVar235 = fStack_768 * fVar164 * -fVar280;
            auVar82._24_4_ = fVar235;
            auVar82._28_4_ = -fVar206;
            local_5c0._4_4_ = local_6c0._4_4_ + fVar216;
            local_5c0._0_4_ = local_6c0._0_4_ + fVar214;
            fStack_5b8 = local_6c0._8_4_ + fVar218;
            fStack_5b4 = local_6c0._12_4_ + fVar221;
            fStack_5b0 = local_6c0._16_4_ + fVar231;
            fStack_5ac = local_6c0._20_4_ + fVar233;
            fStack_5a8 = local_6c0._24_4_ + fVar235;
            fStack_5a4 = local_6c0._28_4_ + -fVar206;
            fVar214 = fVar177 * 0.0 * (float)local_780._0_4_;
            fVar216 = fVar158 * 0.0 * (float)local_780._4_4_;
            auVar83._4_4_ = fVar216;
            auVar83._0_4_ = fVar214;
            fVar218 = fVar220 * 0.0 * fStack_778;
            auVar83._8_4_ = fVar218;
            fVar221 = fVar159 * 0.0 * fStack_774;
            auVar83._12_4_ = fVar221;
            fVar231 = fVar160 * 0.0 * fStack_770;
            auVar83._16_4_ = fVar231;
            fVar233 = fVar162 * 0.0 * fStack_76c;
            auVar83._20_4_ = fVar233;
            fVar235 = fVar164 * 0.0 * fStack_768;
            auVar83._24_4_ = fVar235;
            auVar83._28_4_ = fVar206;
            auVar30 = vsubps_avx(auVar325,auVar81);
            auVar326._0_4_ = fVar214 + auVar144._0_4_;
            auVar326._4_4_ = fVar216 + auVar144._4_4_;
            auVar326._8_4_ = fVar218 + auVar144._8_4_;
            auVar326._12_4_ = fVar221 + auVar144._12_4_;
            auVar326._16_4_ = fVar231 + auVar144._16_4_;
            auVar326._20_4_ = fVar233 + auVar144._20_4_;
            auVar326._24_4_ = fVar235 + auVar144._24_4_;
            auVar326._28_4_ = fVar206 + auVar144._28_4_;
            fVar214 = (float)local_500._0_4_ * fVar199 * fVar215;
            fVar215 = (float)local_500._4_4_ * fVar269 * fVar217;
            auVar84._4_4_ = fVar215;
            auVar84._0_4_ = fVar214;
            fVar216 = fStack_4f8 * fVar202 * fVar219;
            auVar84._8_4_ = fVar216;
            fVar217 = fStack_4f4 * fVar273 * fVar230;
            auVar84._12_4_ = fVar217;
            fVar218 = fStack_4f0 * fVar204 * fVar232;
            auVar84._16_4_ = fVar218;
            fVar219 = fStack_4ec * fVar176 * fVar234;
            auVar84._20_4_ = fVar219;
            fVar221 = fStack_4e8 * fVar194 * fVar163;
            auVar84._24_4_ = fVar221;
            auVar84._28_4_ = fStack_764;
            auVar137 = vsubps_avx(local_6c0,auVar82);
            auVar312._0_4_ = auVar244._0_4_ + fVar214;
            auVar312._4_4_ = auVar244._4_4_ + fVar215;
            auVar312._8_4_ = auVar244._8_4_ + fVar216;
            auVar312._12_4_ = auVar244._12_4_ + fVar217;
            auVar312._16_4_ = auVar244._16_4_ + fVar218;
            auVar312._20_4_ = auVar244._20_4_ + fVar219;
            auVar312._24_4_ = auVar244._24_4_ + fVar221;
            auVar312._28_4_ = auVar244._28_4_ + fStack_764;
            fVar214 = fVar199 * -fVar263 * (float)local_500._0_4_;
            fVar215 = fVar269 * -fVar274 * (float)local_500._4_4_;
            auVar85._4_4_ = fVar215;
            auVar85._0_4_ = fVar214;
            fVar216 = fVar202 * -fVar271 * fStack_4f8;
            auVar85._8_4_ = fVar216;
            fVar217 = fVar273 * -fVar296 * fStack_4f4;
            auVar85._12_4_ = fVar217;
            fVar218 = fVar204 * -fVar276 * fStack_4f0;
            auVar85._16_4_ = fVar218;
            fVar219 = fVar176 * -fVar278 * fStack_4ec;
            auVar85._20_4_ = fVar219;
            fVar221 = fVar194 * -fVar179 * fStack_4e8;
            auVar85._24_4_ = fVar221;
            auVar85._28_4_ = auVar325._28_4_;
            auVar149 = vsubps_avx(auVar144,auVar83);
            auVar211._0_4_ = (float)local_4e0._0_4_ + fVar214;
            auVar211._4_4_ = local_4e0._4_4_ + fVar215;
            auVar211._8_4_ = local_4e0._8_4_ + fVar216;
            auVar211._12_4_ = local_4e0._12_4_ + fVar217;
            auVar211._16_4_ = local_4e0._16_4_ + fVar218;
            auVar211._20_4_ = local_4e0._20_4_ + fVar219;
            auVar211._24_4_ = local_4e0._24_4_ + fVar221;
            auVar211._28_4_ = local_4e0._28_4_ + auVar325._28_4_;
            fVar214 = fVar199 * 0.0 * (float)local_500._0_4_;
            fVar215 = fVar269 * 0.0 * (float)local_500._4_4_;
            auVar86._4_4_ = fVar215;
            auVar86._0_4_ = fVar214;
            fVar216 = fVar202 * 0.0 * fStack_4f8;
            auVar86._8_4_ = fVar216;
            fVar217 = fVar273 * 0.0 * fStack_4f4;
            auVar86._12_4_ = fVar217;
            fVar218 = fVar204 * 0.0 * fStack_4f0;
            auVar86._16_4_ = fVar218;
            fVar219 = fVar176 * 0.0 * fStack_4ec;
            auVar86._20_4_ = fVar219;
            fVar221 = fVar194 * 0.0 * fStack_4e8;
            auVar86._24_4_ = fVar221;
            auVar86._28_4_ = auVar144._28_4_;
            auVar284 = vsubps_avx(auVar244,auVar84);
            auVar289._0_4_ = (float)local_5e0._0_4_ + fVar214;
            auVar289._4_4_ = (float)local_5e0._4_4_ + fVar215;
            auVar289._8_4_ = fStack_5d8 + fVar216;
            auVar289._12_4_ = fStack_5d4 + fVar217;
            auVar289._16_4_ = fStack_5d0 + fVar218;
            auVar289._20_4_ = fStack_5cc + fVar219;
            auVar289._24_4_ = fStack_5c8 + fVar221;
            auVar289._28_4_ = fStack_5c4 + auVar144._28_4_;
            auVar25 = vsubps_avx(local_4e0,auVar85);
            auVar27 = vsubps_avx(_local_5e0,auVar86);
            auVar28 = vsubps_avx(auVar211,auVar137);
            auVar29 = vsubps_avx(auVar289,auVar149);
            auVar87._4_4_ = auVar149._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar149._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar149._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar149._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar149._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar149._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar149._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar308._28_4_;
            auVar88._4_4_ = auVar137._4_4_ * auVar29._4_4_;
            auVar88._0_4_ = auVar137._0_4_ * auVar29._0_4_;
            auVar88._8_4_ = auVar137._8_4_ * auVar29._8_4_;
            auVar88._12_4_ = auVar137._12_4_ * auVar29._12_4_;
            auVar88._16_4_ = auVar137._16_4_ * auVar29._16_4_;
            auVar88._20_4_ = auVar137._20_4_ * auVar29._20_4_;
            auVar88._24_4_ = auVar137._24_4_ * auVar29._24_4_;
            auVar88._28_4_ = fStack_5c4;
            auVar31 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar89._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar89._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar89._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            auVar89._16_4_ = auVar30._16_4_ * auVar29._16_4_;
            auVar89._20_4_ = auVar30._20_4_ * auVar29._20_4_;
            auVar89._24_4_ = auVar30._24_4_ * auVar29._24_4_;
            auVar89._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar312,auVar30);
            auVar90._4_4_ = auVar149._4_4_ * auVar29._4_4_;
            auVar90._0_4_ = auVar149._0_4_ * auVar29._0_4_;
            auVar90._8_4_ = auVar149._8_4_ * auVar29._8_4_;
            auVar90._12_4_ = auVar149._12_4_ * auVar29._12_4_;
            auVar90._16_4_ = auVar149._16_4_ * auVar29._16_4_;
            auVar90._20_4_ = auVar149._20_4_ * auVar29._20_4_;
            auVar90._24_4_ = auVar149._24_4_ * auVar29._24_4_;
            auVar90._28_4_ = auVar24._28_4_;
            auVar32 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = auVar137._4_4_ * auVar29._4_4_;
            auVar91._0_4_ = auVar137._0_4_ * auVar29._0_4_;
            auVar91._8_4_ = auVar137._8_4_ * auVar29._8_4_;
            auVar91._12_4_ = auVar137._12_4_ * auVar29._12_4_;
            auVar91._16_4_ = auVar137._16_4_ * auVar29._16_4_;
            auVar91._20_4_ = auVar137._20_4_ * auVar29._20_4_;
            auVar91._24_4_ = auVar137._24_4_ * auVar29._24_4_;
            auVar91._28_4_ = auVar24._28_4_;
            auVar92._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar92._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar92._8_4_ = auVar30._8_4_ * auVar28._8_4_;
            auVar92._12_4_ = auVar30._12_4_ * auVar28._12_4_;
            auVar92._16_4_ = auVar30._16_4_ * auVar28._16_4_;
            auVar92._20_4_ = auVar30._20_4_ * auVar28._20_4_;
            auVar92._24_4_ = auVar30._24_4_ * auVar28._24_4_;
            auVar92._28_4_ = auVar28._28_4_;
            auVar24 = vsubps_avx(auVar92,auVar91);
            auVar155._0_4_ = auVar31._0_4_ * 0.0 + auVar24._0_4_ + auVar32._0_4_ * 0.0;
            auVar155._4_4_ = auVar31._4_4_ * 0.0 + auVar24._4_4_ + auVar32._4_4_ * 0.0;
            auVar155._8_4_ = auVar31._8_4_ * 0.0 + auVar24._8_4_ + auVar32._8_4_ * 0.0;
            auVar155._12_4_ = auVar31._12_4_ * 0.0 + auVar24._12_4_ + auVar32._12_4_ * 0.0;
            auVar155._16_4_ = auVar31._16_4_ * 0.0 + auVar24._16_4_ + auVar32._16_4_ * 0.0;
            auVar155._20_4_ = auVar31._20_4_ * 0.0 + auVar24._20_4_ + auVar32._20_4_ * 0.0;
            auVar155._24_4_ = auVar31._24_4_ * 0.0 + auVar24._24_4_ + auVar32._24_4_ * 0.0;
            auVar155._28_4_ = auVar31._28_4_ + auVar24._28_4_ + auVar32._28_4_;
            auVar136 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,2);
            auVar284 = vblendvps_avx(auVar284,_local_560,auVar136);
            auVar192 = ZEXT3264(auVar284);
            auVar24 = vblendvps_avx(auVar25,_local_5c0,auVar136);
            auVar25 = vblendvps_avx(auVar27,auVar326,auVar136);
            auVar27 = vblendvps_avx(auVar30,auVar312,auVar136);
            auVar28 = vblendvps_avx(auVar137,auVar211,auVar136);
            auVar29 = vblendvps_avx(auVar149,auVar289,auVar136);
            auVar30 = vblendvps_avx(auVar312,auVar30,auVar136);
            auVar31 = vblendvps_avx(auVar211,auVar137,auVar136);
            auVar32 = vblendvps_avx(auVar289,auVar149,auVar136);
            local_6c0 = vandps_avx(_local_4a0,auVar135);
            auVar30 = vsubps_avx(auVar30,auVar284);
            auVar150 = vsubps_avx(auVar31,auVar24);
            auVar32 = vsubps_avx(auVar32,auVar25);
            auVar135 = vsubps_avx(auVar24,auVar28);
            fVar214 = auVar150._0_4_;
            fVar247 = auVar25._0_4_;
            fVar230 = auVar150._4_4_;
            fVar257 = auVar25._4_4_;
            auVar93._4_4_ = fVar257 * fVar230;
            auVar93._0_4_ = fVar247 * fVar214;
            fVar263 = auVar150._8_4_;
            fVar258 = auVar25._8_4_;
            auVar93._8_4_ = fVar258 * fVar263;
            fVar273 = auVar150._12_4_;
            fVar259 = auVar25._12_4_;
            auVar93._12_4_ = fVar259 * fVar273;
            fVar177 = auVar150._16_4_;
            fVar260 = auVar25._16_4_;
            auVar93._16_4_ = fVar260 * fVar177;
            fVar166 = auVar150._20_4_;
            fVar261 = auVar25._20_4_;
            auVar93._20_4_ = fVar261 * fVar166;
            fVar206 = auVar150._24_4_;
            fVar262 = auVar25._24_4_;
            auVar93._24_4_ = fVar262 * fVar206;
            auVar93._28_4_ = auVar31._28_4_;
            fVar215 = auVar24._0_4_;
            fVar282 = auVar32._0_4_;
            fVar231 = auVar24._4_4_;
            fVar291 = auVar32._4_4_;
            auVar94._4_4_ = fVar291 * fVar231;
            auVar94._0_4_ = fVar282 * fVar215;
            fVar199 = auVar24._8_4_;
            fVar292 = auVar32._8_4_;
            auVar94._8_4_ = fVar292 * fVar199;
            fVar276 = auVar24._12_4_;
            fVar293 = auVar32._12_4_;
            auVar94._12_4_ = fVar293 * fVar276;
            fVar158 = auVar24._16_4_;
            fVar294 = auVar32._16_4_;
            auVar94._16_4_ = fVar294 * fVar158;
            fVar246 = auVar24._20_4_;
            fVar295 = auVar32._20_4_;
            auVar94._20_4_ = fVar295 * fVar246;
            fVar281 = auVar24._24_4_;
            fVar297 = auVar32._24_4_;
            uVar8 = auVar137._28_4_;
            auVar94._24_4_ = fVar297 * fVar281;
            auVar94._28_4_ = uVar8;
            auVar31 = vsubps_avx(auVar94,auVar93);
            fVar216 = auVar284._0_4_;
            fVar232 = auVar284._4_4_;
            auVar95._4_4_ = fVar291 * fVar232;
            auVar95._0_4_ = fVar282 * fVar216;
            fVar274 = auVar284._8_4_;
            auVar95._8_4_ = fVar292 * fVar274;
            fVar204 = auVar284._12_4_;
            auVar95._12_4_ = fVar293 * fVar204;
            fVar220 = auVar284._16_4_;
            auVar95._16_4_ = fVar294 * fVar220;
            fVar195 = auVar284._20_4_;
            auVar95._20_4_ = fVar295 * fVar195;
            fVar270 = auVar284._24_4_;
            auVar95._24_4_ = fVar297 * fVar270;
            auVar95._28_4_ = uVar8;
            fVar217 = auVar30._0_4_;
            fVar233 = auVar30._4_4_;
            auVar96._4_4_ = fVar257 * fVar233;
            auVar96._0_4_ = fVar247 * fVar217;
            fVar269 = auVar30._8_4_;
            auVar96._8_4_ = fVar258 * fVar269;
            fVar278 = auVar30._12_4_;
            auVar96._12_4_ = fVar259 * fVar278;
            fVar159 = auVar30._16_4_;
            auVar96._16_4_ = fVar260 * fVar159;
            fVar197 = auVar30._20_4_;
            auVar96._20_4_ = fVar261 * fVar197;
            fVar272 = auVar30._24_4_;
            auVar96._24_4_ = fVar262 * fVar272;
            auVar96._28_4_ = auVar312._28_4_;
            auVar137 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar231 * fVar233;
            auVar97._0_4_ = fVar215 * fVar217;
            auVar97._8_4_ = fVar199 * fVar269;
            auVar97._12_4_ = fVar276 * fVar278;
            auVar97._16_4_ = fVar158 * fVar159;
            auVar97._20_4_ = fVar246 * fVar197;
            auVar97._24_4_ = fVar281 * fVar272;
            auVar97._28_4_ = uVar8;
            auVar98._4_4_ = fVar232 * fVar230;
            auVar98._0_4_ = fVar216 * fVar214;
            auVar98._8_4_ = fVar274 * fVar263;
            auVar98._12_4_ = fVar204 * fVar273;
            auVar98._16_4_ = fVar220 * fVar177;
            auVar98._20_4_ = fVar195 * fVar166;
            auVar98._24_4_ = fVar270 * fVar206;
            auVar98._28_4_ = auVar149._28_4_;
            auVar149 = vsubps_avx(auVar98,auVar97);
            auVar151 = vsubps_avx(auVar25,auVar29);
            fVar219 = auVar149._28_4_ + auVar137._28_4_;
            auVar301._0_4_ = auVar149._0_4_ + auVar137._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
            auVar301._4_4_ = auVar149._4_4_ + auVar137._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
            auVar301._8_4_ = auVar149._8_4_ + auVar137._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
            auVar301._12_4_ = auVar149._12_4_ + auVar137._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
            auVar301._16_4_ = auVar149._16_4_ + auVar137._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
            auVar301._20_4_ = auVar149._20_4_ + auVar137._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
            auVar301._24_4_ = auVar149._24_4_ + auVar137._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
            auVar301._28_4_ = fVar219 + auVar31._28_4_;
            fVar218 = auVar135._0_4_;
            fVar234 = auVar135._4_4_;
            auVar99._4_4_ = auVar29._4_4_ * fVar234;
            auVar99._0_4_ = auVar29._0_4_ * fVar218;
            fVar271 = auVar135._8_4_;
            auVar99._8_4_ = auVar29._8_4_ * fVar271;
            fVar176 = auVar135._12_4_;
            auVar99._12_4_ = auVar29._12_4_ * fVar176;
            fVar160 = auVar135._16_4_;
            auVar99._16_4_ = auVar29._16_4_ * fVar160;
            fVar165 = auVar135._20_4_;
            auVar99._20_4_ = auVar29._20_4_ * fVar165;
            fVar275 = auVar135._24_4_;
            auVar99._24_4_ = auVar29._24_4_ * fVar275;
            auVar99._28_4_ = fVar219;
            fVar219 = auVar151._0_4_;
            fVar235 = auVar151._4_4_;
            auVar100._4_4_ = auVar28._4_4_ * fVar235;
            auVar100._0_4_ = auVar28._0_4_ * fVar219;
            fVar202 = auVar151._8_4_;
            auVar100._8_4_ = auVar28._8_4_ * fVar202;
            fVar179 = auVar151._12_4_;
            auVar100._12_4_ = auVar28._12_4_ * fVar179;
            fVar162 = auVar151._16_4_;
            auVar100._16_4_ = auVar28._16_4_ * fVar162;
            fVar201 = auVar151._20_4_;
            auVar100._20_4_ = auVar28._20_4_ * fVar201;
            fVar277 = auVar151._24_4_;
            auVar100._24_4_ = auVar28._24_4_ * fVar277;
            auVar100._28_4_ = auVar149._28_4_;
            auVar135 = vsubps_avx(auVar100,auVar99);
            auVar137 = vsubps_avx(auVar284,auVar27);
            fVar221 = auVar137._0_4_;
            fVar163 = auVar137._4_4_;
            auVar101._4_4_ = auVar29._4_4_ * fVar163;
            auVar101._0_4_ = auVar29._0_4_ * fVar221;
            fVar296 = auVar137._8_4_;
            auVar101._8_4_ = auVar29._8_4_ * fVar296;
            fVar194 = auVar137._12_4_;
            auVar101._12_4_ = auVar29._12_4_ * fVar194;
            fVar164 = auVar137._16_4_;
            auVar101._16_4_ = auVar29._16_4_ * fVar164;
            fVar280 = auVar137._20_4_;
            auVar101._20_4_ = auVar29._20_4_ * fVar280;
            fVar279 = auVar137._24_4_;
            auVar101._24_4_ = auVar29._24_4_ * fVar279;
            auVar101._28_4_ = auVar29._28_4_;
            auVar102._4_4_ = fVar235 * auVar27._4_4_;
            auVar102._0_4_ = fVar219 * auVar27._0_4_;
            auVar102._8_4_ = fVar202 * auVar27._8_4_;
            auVar102._12_4_ = fVar179 * auVar27._12_4_;
            auVar102._16_4_ = fVar162 * auVar27._16_4_;
            auVar102._20_4_ = fVar201 * auVar27._20_4_;
            auVar102._24_4_ = fVar277 * auVar27._24_4_;
            auVar102._28_4_ = auVar31._28_4_;
            auVar29 = vsubps_avx(auVar101,auVar102);
            auVar103._4_4_ = auVar28._4_4_ * fVar163;
            auVar103._0_4_ = auVar28._0_4_ * fVar221;
            auVar103._8_4_ = auVar28._8_4_ * fVar296;
            auVar103._12_4_ = auVar28._12_4_ * fVar194;
            auVar103._16_4_ = auVar28._16_4_ * fVar164;
            auVar103._20_4_ = auVar28._20_4_ * fVar280;
            auVar103._24_4_ = auVar28._24_4_ * fVar279;
            auVar103._28_4_ = auVar28._28_4_;
            auVar104._4_4_ = fVar234 * auVar27._4_4_;
            auVar104._0_4_ = fVar218 * auVar27._0_4_;
            auVar104._8_4_ = fVar271 * auVar27._8_4_;
            auVar104._12_4_ = fVar176 * auVar27._12_4_;
            auVar104._16_4_ = fVar160 * auVar27._16_4_;
            auVar104._20_4_ = fVar165 * auVar27._20_4_;
            auVar104._24_4_ = fVar275 * auVar27._24_4_;
            auVar104._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar104,auVar103);
            auVar145._0_4_ = auVar135._0_4_ * 0.0 + auVar27._0_4_ + auVar29._0_4_ * 0.0;
            auVar145._4_4_ = auVar135._4_4_ * 0.0 + auVar27._4_4_ + auVar29._4_4_ * 0.0;
            auVar145._8_4_ = auVar135._8_4_ * 0.0 + auVar27._8_4_ + auVar29._8_4_ * 0.0;
            auVar145._12_4_ = auVar135._12_4_ * 0.0 + auVar27._12_4_ + auVar29._12_4_ * 0.0;
            auVar145._16_4_ = auVar135._16_4_ * 0.0 + auVar27._16_4_ + auVar29._16_4_ * 0.0;
            auVar145._20_4_ = auVar135._20_4_ * 0.0 + auVar27._20_4_ + auVar29._20_4_ * 0.0;
            auVar145._24_4_ = auVar135._24_4_ * 0.0 + auVar27._24_4_ + auVar29._24_4_ * 0.0;
            auVar145._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar29._28_4_;
            auVar146 = ZEXT3264(auVar145);
            auVar135 = vmaxps_avx(auVar301,auVar145);
            auVar135 = vcmpps_avx(auVar135,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar213 = ZEXT3264(local_6c0);
            auVar27 = local_6c0 & auVar135;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_01084bfc:
              auVar157._8_8_ = uStack_518;
              auVar157._0_8_ = local_520;
              auVar157._16_8_ = uStack_510;
              auVar157._24_8_ = uStack_508;
            }
            else {
              auVar27 = vandps_avx(auVar135,local_6c0);
              auVar105._4_4_ = fVar235 * fVar230;
              auVar105._0_4_ = fVar219 * fVar214;
              auVar105._8_4_ = fVar202 * fVar263;
              auVar105._12_4_ = fVar179 * fVar273;
              auVar105._16_4_ = fVar162 * fVar177;
              auVar105._20_4_ = fVar201 * fVar166;
              auVar105._24_4_ = fVar277 * fVar206;
              auVar105._28_4_ = local_6c0._28_4_;
              auVar106._4_4_ = fVar234 * fVar291;
              auVar106._0_4_ = fVar218 * fVar282;
              auVar106._8_4_ = fVar271 * fVar292;
              auVar106._12_4_ = fVar176 * fVar293;
              auVar106._16_4_ = fVar160 * fVar294;
              auVar106._20_4_ = fVar165 * fVar295;
              auVar106._24_4_ = fVar275 * fVar297;
              auVar106._28_4_ = auVar135._28_4_;
              auVar28 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar163 * fVar291;
              auVar107._0_4_ = fVar221 * fVar282;
              auVar107._8_4_ = fVar296 * fVar292;
              auVar107._12_4_ = fVar194 * fVar293;
              auVar107._16_4_ = fVar164 * fVar294;
              auVar107._20_4_ = fVar280 * fVar295;
              auVar107._24_4_ = fVar279 * fVar297;
              auVar107._28_4_ = auVar32._28_4_;
              auVar108._4_4_ = fVar235 * fVar233;
              auVar108._0_4_ = fVar219 * fVar217;
              auVar108._8_4_ = fVar202 * fVar269;
              auVar108._12_4_ = fVar179 * fVar278;
              auVar108._16_4_ = fVar162 * fVar159;
              auVar108._20_4_ = fVar201 * fVar197;
              auVar108._24_4_ = fVar277 * fVar272;
              auVar108._28_4_ = auVar151._28_4_;
              auVar29 = vsubps_avx(auVar108,auVar107);
              auVar109._4_4_ = fVar234 * fVar233;
              auVar109._0_4_ = fVar218 * fVar217;
              auVar109._8_4_ = fVar271 * fVar269;
              auVar109._12_4_ = fVar176 * fVar278;
              auVar109._16_4_ = fVar160 * fVar159;
              auVar109._20_4_ = fVar165 * fVar197;
              auVar109._24_4_ = fVar275 * fVar272;
              auVar109._28_4_ = auVar30._28_4_;
              auVar110._4_4_ = fVar163 * fVar230;
              auVar110._0_4_ = fVar221 * fVar214;
              auVar110._8_4_ = fVar296 * fVar263;
              auVar110._12_4_ = fVar194 * fVar273;
              auVar110._16_4_ = fVar164 * fVar177;
              auVar110._20_4_ = fVar280 * fVar166;
              auVar110._24_4_ = fVar279 * fVar206;
              auVar110._28_4_ = auVar150._28_4_;
              auVar31 = vsubps_avx(auVar110,auVar109);
              auVar156._0_4_ = auVar28._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
              auVar156._4_4_ = auVar28._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
              auVar156._8_4_ = auVar28._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
              auVar156._12_4_ = auVar28._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
              auVar156._16_4_ = auVar28._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
              auVar156._20_4_ = auVar28._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
              auVar156._24_4_ = auVar28._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
              auVar156._28_4_ = auVar150._28_4_ + auVar31._28_4_ + auVar30._28_4_;
              auVar135 = vrcpps_avx(auVar156);
              fVar217 = auVar135._0_4_;
              fVar218 = auVar135._4_4_;
              auVar111._4_4_ = auVar156._4_4_ * fVar218;
              auVar111._0_4_ = auVar156._0_4_ * fVar217;
              fVar219 = auVar135._8_4_;
              auVar111._8_4_ = auVar156._8_4_ * fVar219;
              fVar221 = auVar135._12_4_;
              auVar111._12_4_ = auVar156._12_4_ * fVar221;
              fVar230 = auVar135._16_4_;
              auVar111._16_4_ = auVar156._16_4_ * fVar230;
              fVar233 = auVar135._20_4_;
              auVar111._20_4_ = auVar156._20_4_ * fVar233;
              fVar234 = auVar135._24_4_;
              auVar111._24_4_ = auVar156._24_4_ * fVar234;
              auVar111._28_4_ = auVar151._28_4_;
              auVar309._8_4_ = 0x3f800000;
              auVar309._0_8_ = 0x3f8000003f800000;
              auVar309._12_4_ = 0x3f800000;
              auVar309._16_4_ = 0x3f800000;
              auVar309._20_4_ = 0x3f800000;
              auVar309._24_4_ = 0x3f800000;
              auVar309._28_4_ = 0x3f800000;
              auVar135 = vsubps_avx(auVar309,auVar111);
              fVar217 = auVar135._0_4_ * fVar217 + fVar217;
              fVar218 = auVar135._4_4_ * fVar218 + fVar218;
              fVar219 = auVar135._8_4_ * fVar219 + fVar219;
              fVar221 = auVar135._12_4_ * fVar221 + fVar221;
              fVar230 = auVar135._16_4_ * fVar230 + fVar230;
              fVar233 = auVar135._20_4_ * fVar233 + fVar233;
              fVar234 = auVar135._24_4_ * fVar234 + fVar234;
              auVar112._4_4_ =
                   (fVar232 * auVar28._4_4_ + auVar29._4_4_ * fVar231 + auVar31._4_4_ * fVar257) *
                   fVar218;
              auVar112._0_4_ =
                   (fVar216 * auVar28._0_4_ + auVar29._0_4_ * fVar215 + auVar31._0_4_ * fVar247) *
                   fVar217;
              auVar112._8_4_ =
                   (fVar274 * auVar28._8_4_ + auVar29._8_4_ * fVar199 + auVar31._8_4_ * fVar258) *
                   fVar219;
              auVar112._12_4_ =
                   (fVar204 * auVar28._12_4_ + auVar29._12_4_ * fVar276 + auVar31._12_4_ * fVar259)
                   * fVar221;
              auVar112._16_4_ =
                   (fVar220 * auVar28._16_4_ + auVar29._16_4_ * fVar158 + auVar31._16_4_ * fVar260)
                   * fVar230;
              auVar112._20_4_ =
                   (fVar195 * auVar28._20_4_ + auVar29._20_4_ * fVar246 + auVar31._20_4_ * fVar261)
                   * fVar233;
              auVar112._24_4_ =
                   (fVar270 * auVar28._24_4_ + auVar29._24_4_ * fVar281 + auVar31._24_4_ * fVar262)
                   * fVar234;
              auVar112._28_4_ = auVar284._28_4_ + auVar24._28_4_ + auVar25._28_4_;
              auVar192 = ZEXT3264(auVar112);
              fVar214 = ray->tfar;
              auVar212._4_4_ = fVar214;
              auVar212._0_4_ = fVar214;
              auVar212._8_4_ = fVar214;
              auVar212._12_4_ = fVar214;
              auVar212._16_4_ = fVar214;
              auVar212._20_4_ = fVar214;
              auVar212._24_4_ = fVar214;
              auVar212._28_4_ = fVar214;
              auVar135 = vcmpps_avx(local_e0,auVar112,2);
              auVar284 = vcmpps_avx(auVar112,auVar212,2);
              auVar213 = ZEXT3264(auVar284);
              auVar135 = vandps_avx(auVar135,auVar284);
              auVar24 = auVar27 & auVar135;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) goto LAB_01084bfc;
              auVar135 = vandps_avx(auVar27,auVar135);
              auVar24 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar156,4);
              auVar25 = auVar135 & auVar24;
              auVar157._8_8_ = uStack_518;
              auVar157._0_8_ = local_520;
              auVar157._16_8_ = uStack_510;
              auVar157._24_8_ = uStack_508;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar157 = vandps_avx(auVar24,auVar135);
                auVar113._4_4_ = fVar218 * auVar301._4_4_;
                auVar113._0_4_ = fVar217 * auVar301._0_4_;
                auVar113._8_4_ = fVar219 * auVar301._8_4_;
                auVar113._12_4_ = fVar221 * auVar301._12_4_;
                auVar113._16_4_ = fVar230 * auVar301._16_4_;
                auVar113._20_4_ = fVar233 * auVar301._20_4_;
                auVar113._24_4_ = fVar234 * auVar301._24_4_;
                auVar113._28_4_ = auVar284._28_4_;
                auVar114._4_4_ = auVar145._4_4_ * fVar218;
                auVar114._0_4_ = auVar145._0_4_ * fVar217;
                auVar114._8_4_ = auVar145._8_4_ * fVar219;
                auVar114._12_4_ = auVar145._12_4_ * fVar221;
                auVar114._16_4_ = auVar145._16_4_ * fVar230;
                auVar114._20_4_ = auVar145._20_4_ * fVar233;
                auVar114._24_4_ = auVar145._24_4_ * fVar234;
                auVar114._28_4_ = auVar145._28_4_;
                auVar245._8_4_ = 0x3f800000;
                auVar245._0_8_ = 0x3f8000003f800000;
                auVar245._12_4_ = 0x3f800000;
                auVar245._16_4_ = 0x3f800000;
                auVar245._20_4_ = 0x3f800000;
                auVar245._24_4_ = 0x3f800000;
                auVar245._28_4_ = 0x3f800000;
                auVar135 = vsubps_avx(auVar245,auVar113);
                local_1a0 = vblendvps_avx(auVar135,auVar113,auVar136);
                auVar135 = vsubps_avx(auVar245,auVar114);
                auVar213 = ZEXT3264(auVar135);
                _local_3a0 = vblendvps_avx(auVar135,auVar114,auVar136);
                auVar146 = ZEXT3264(_local_3a0);
                local_1c0 = auVar112;
              }
            }
            auVar290 = ZEXT3264(local_760);
            auVar268 = ZEXT3264(local_740);
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar157 >> 0x7f,0) == '\0') &&
                  (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar157 >> 0xbf,0) == '\0') &&
                (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar157[0x1f]) goto LAB_01084750;
            auVar135 = vsubps_avx(_local_500,_local_780);
            auVar192 = ZEXT3264(local_1a0);
            fVar215 = (float)local_780._0_4_ + auVar135._0_4_ * local_1a0._0_4_;
            fVar216 = (float)local_780._4_4_ + auVar135._4_4_ * local_1a0._4_4_;
            fVar217 = fStack_778 + auVar135._8_4_ * local_1a0._8_4_;
            fVar218 = fStack_774 + auVar135._12_4_ * local_1a0._12_4_;
            fVar219 = fStack_770 + auVar135._16_4_ * local_1a0._16_4_;
            fVar221 = fStack_76c + auVar135._20_4_ * local_1a0._20_4_;
            fVar230 = fStack_768 + auVar135._24_4_ * local_1a0._24_4_;
            fVar231 = fStack_764 + auVar135._28_4_;
            fVar214 = local_7a8->depth_scale;
            auVar115._4_4_ = (fVar216 + fVar216) * fVar214;
            auVar115._0_4_ = (fVar215 + fVar215) * fVar214;
            auVar115._8_4_ = (fVar217 + fVar217) * fVar214;
            auVar115._12_4_ = (fVar218 + fVar218) * fVar214;
            auVar115._16_4_ = (fVar219 + fVar219) * fVar214;
            auVar115._20_4_ = (fVar221 + fVar221) * fVar214;
            auVar115._24_4_ = (fVar230 + fVar230) * fVar214;
            auVar115._28_4_ = fVar231 + fVar231;
            auVar213 = ZEXT3264(local_1c0);
            auVar135 = vcmpps_avx(local_1c0,auVar115,6);
            auVar146 = ZEXT3264(auVar135);
            auVar284 = auVar157 & auVar135;
            if ((((((((auVar284 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar284 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar284 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar284 >> 0x7f,0) != '\0') ||
                  (auVar284 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar284 >> 0xbf,0) != '\0') ||
                (auVar284 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar284[0x1f] < '\0') {
              local_240 = vandps_avx(auVar135,auVar157);
              auVar146 = ZEXT3264(local_240);
              local_2e0 = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
              fStack_2dc = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
              fStack_2d8 = (float)uStack_398 + (float)uStack_398 + -1.0;
              fStack_2d4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
              fStack_2d0 = (float)uStack_390 + (float)uStack_390 + -1.0;
              fStack_2cc = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
              fStack_2c8 = (float)uStack_388 + (float)uStack_388 + -1.0;
              fStack_2c4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
              local_300 = local_1a0;
              local_2c0 = local_1c0;
              local_29c = uVar122;
              local_290 = local_7a0;
              uStack_288 = uStack_798;
              local_280 = local_790;
              uStack_278 = uStack_788;
              local_270 = local_590;
              uStack_268 = uStack_588;
              local_260 = local_6a0;
              uStack_258 = uStack_698;
              local_660 = (undefined1  [8])(context->scene->geometries).items[local_6e8].ptr;
              local_3a0._4_4_ = fStack_2dc;
              local_3a0._0_4_ = local_2e0;
              uStack_398._0_4_ = fStack_2d8;
              uStack_398._4_4_ = fStack_2d4;
              uStack_390._0_4_ = fStack_2d0;
              uStack_390._4_4_ = fStack_2cc;
              auVar121 = _local_3a0;
              uStack_388._0_4_ = fStack_2c8;
              uStack_388._4_4_ = fStack_2c4;
              auVar135 = _local_3a0;
              if ((((Geometry *)local_660)->mask & ray->mask) == 0) {
                pRVar124 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar124 = context->args;
                if ((pRVar124->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar124 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar124 >> 8),1),
                   ((Geometry *)local_660)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auStack_658 = auVar244._8_24_;
                  local_6c0._0_8_ = context;
                  auVar168 = vshufps_avx(ZEXT416((uint)(float)(int)local_2a0),
                                         ZEXT416((uint)(float)(int)local_2a0),0);
                  local_220[0] = (auVar168._0_4_ + local_1a0._0_4_ + 0.0) * (float)local_420._0_4_;
                  local_220[1] = (auVar168._4_4_ + local_1a0._4_4_ + 1.0) * (float)local_420._4_4_;
                  local_220[2] = (auVar168._8_4_ + local_1a0._8_4_ + 2.0) * fStack_418;
                  local_220[3] = (auVar168._12_4_ + local_1a0._12_4_ + 3.0) * fStack_414;
                  fStack_210 = (auVar168._0_4_ + local_1a0._16_4_ + 4.0) * fStack_410;
                  fStack_20c = (auVar168._4_4_ + local_1a0._20_4_ + 5.0) * fStack_40c;
                  fStack_208 = (auVar168._8_4_ + local_1a0._24_4_ + 6.0) * fStack_408;
                  fStack_204 = auVar168._12_4_ + (float)local_1a0._28_4_ + 7.0;
                  uStack_390 = auVar121._16_8_;
                  uStack_388 = auVar135._24_8_;
                  local_200 = local_3a0;
                  uStack_1f8 = uStack_398;
                  uStack_1f0 = uStack_390;
                  uStack_1e8 = uStack_388;
                  local_1e0 = local_1c0;
                  iVar123 = vmovmskps_avx(local_240);
                  local_6e0._0_8_ = CONCAT44((int)((ulong)pRVar124 >> 0x20),iVar123);
                  lVar23 = 0;
                  if (local_6e0._0_8_ != 0) {
                    for (; ((ulong)local_6e0._0_8_ >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  local_780 = (undefined1  [8])lVar23;
                  stack0xfffffffffffff928 = auVar301._8_24_;
                  _local_3a0 = auVar135;
                  if (iVar123 == 0) {
                    pRVar124 = (RTCIntersectArguments *)0x0;
LAB_01084c2b:
                    auVar268 = ZEXT3264(local_740);
                    auVar290 = ZEXT3264(local_760);
                    context = (RayQueryContext *)local_6c0._0_8_;
                    fVar178 = (float)local_720._0_4_;
                    fVar196 = (float)local_720._4_4_;
                    fVar200 = fStack_718;
                    fVar205 = fStack_714;
                    fVar193 = fStack_710;
                    fVar198 = fStack_70c;
                    fVar203 = fStack_708;
                    fVar207 = fStack_704;
                  }
                  else {
                    local_4e0._0_4_ = ray->tfar;
                    auVar127 = local_660;
                    _local_340 = auVar26;
                    do {
                      local_634 = local_220[(long)local_780];
                      auVar146 = ZEXT464((uint)local_634);
                      local_630 = *(undefined4 *)((long)&local_200 + (long)local_780 * 4);
                      ray->tfar = *(float *)(local_1e0 + (long)local_780 * 4);
                      fVar193 = 1.0 - local_634;
                      fVar196 = local_634 * (fVar193 + fVar193) - fVar193 * fVar193;
                      auVar213 = ZEXT464((uint)fVar196);
                      fVar178 = local_634 * 3.0;
                      auVar168 = ZEXT416((uint)((fVar193 * -2.0 * local_634 + local_634 * local_634)
                                               * 0.5));
                      auVar168 = vshufps_avx(auVar168,auVar168,0);
                      auVar182 = ZEXT416((uint)(((fVar193 + fVar193) * (fVar178 + 2.0) +
                                                fVar193 * fVar193 * -3.0) * 0.5));
                      auVar182 = vshufps_avx(auVar182,auVar182,0);
                      auVar161 = ZEXT416((uint)(((local_634 + local_634) * (fVar178 + -5.0) +
                                                local_634 * fVar178) * 0.5));
                      auVar161 = vshufps_avx(auVar161,auVar161,0);
                      auVar10 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.5)),
                                            ZEXT416((uint)(fVar196 * 0.5)),0);
                      auVar183._0_4_ = (float)local_7a0._0_4_ * auVar10._0_4_;
                      auVar183._4_4_ = (float)local_7a0._4_4_ * auVar10._4_4_;
                      auVar183._8_4_ = (float)uStack_798 * auVar10._8_4_;
                      auVar183._12_4_ = uStack_798._4_4_ * auVar10._12_4_;
                      auVar192 = ZEXT1664(auVar183);
                      auVar169._0_4_ =
                           auVar183._0_4_ +
                           (float)local_790._0_4_ * auVar161._0_4_ +
                           (float)local_6a0._0_4_ * auVar168._0_4_ +
                           auVar182._0_4_ * (float)local_590._0_4_;
                      auVar169._4_4_ =
                           auVar183._4_4_ +
                           (float)local_790._4_4_ * auVar161._4_4_ +
                           (float)local_6a0._4_4_ * auVar168._4_4_ +
                           auVar182._4_4_ * (float)local_590._4_4_;
                      auVar169._8_4_ =
                           auVar183._8_4_ +
                           (float)uStack_788 * auVar161._8_4_ +
                           (float)uStack_698 * auVar168._8_4_ + auVar182._8_4_ * (float)uStack_588;
                      auVar169._12_4_ =
                           auVar183._12_4_ +
                           uStack_788._4_4_ * auVar161._12_4_ +
                           uStack_698._4_4_ * auVar168._12_4_ + auVar182._12_4_ * uStack_588._4_4_;
                      local_690.context = context->user;
                      local_640 = vmovlps_avx(auVar169);
                      local_638 = vextractps_avx(auVar169,2);
                      local_62c = (int)local_608;
                      local_628 = (int)local_6e8;
                      local_624 = (local_690.context)->instID[0];
                      local_620 = (local_690.context)->instPrimID[0];
                      local_7ac = -1;
                      local_690.valid = &local_7ac;
                      local_690.geometryUserPtr = ((Geometry *)auVar127)->userPtr;
                      local_690.ray = (RTCRayN *)ray;
                      local_690.hit = (RTCHitN *)&local_640;
                      local_690.N = 1;
                      if (((Geometry *)auVar127)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01084b0d:
                        pcVar22 = *(code **)(*(byte **)(local_6c0._0_8_ + 0x10) + 0x10);
                        if ((pcVar22 != (code *)0x0) &&
                           (((**(byte **)(local_6c0._0_8_ + 0x10) & 2) != 0 ||
                            ((*(byte *)((long)local_660 + 0x3e) & 0x40) != 0)))) {
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar146._0_8_ = (*pcVar22)(&local_690);
                          auVar146._8_56_ = extraout_var_00;
                          if (*local_690.valid == 0) goto LAB_01084b5b;
                        }
                        pRVar124 = (RTCIntersectArguments *)0x1;
                        goto LAB_01084c2b;
                      }
                      auVar192 = ZEXT1664(auVar183);
                      auVar213 = ZEXT464((uint)fVar196);
                      auVar146._0_8_ = (*((Geometry *)auVar127)->occlusionFilterN)(&local_690);
                      auVar146._8_56_ = extraout_var;
                      if (*local_690.valid != 0) goto LAB_01084b0d;
LAB_01084b5b:
                      auVar146 = ZEXT464((uint)local_4e0._0_4_);
                      ray->tfar = (float)local_4e0._0_4_;
                      uVar126 = local_6e0._0_8_ ^ 1L << ((ulong)local_780 & 0x3f);
                      lVar23 = 0;
                      if (uVar126 != 0) {
                        for (; (uVar126 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                        }
                      }
                      local_780 = (undefined1  [8])lVar23;
                      pRVar124 = (RTCIntersectArguments *)0x0;
                      local_6e0._0_8_ = uVar126;
                      auVar268 = ZEXT3264(local_740);
                      auVar290 = ZEXT3264(local_760);
                      context = (RayQueryContext *)local_6c0._0_8_;
                      auVar127 = local_660;
                      fVar178 = (float)local_720._0_4_;
                      fVar196 = (float)local_720._4_4_;
                      fVar200 = fStack_718;
                      fVar205 = fStack_714;
                      fVar193 = fStack_710;
                      fVar198 = fStack_70c;
                      fVar203 = fStack_708;
                      fVar207 = fStack_704;
                    } while (uVar126 != 0);
                  }
                }
              }
              bVar129 = (bool)(bVar129 | (byte)pRVar124);
            }
          }
          lVar130 = lVar130 + 8;
        } while ((int)lVar130 < (int)uVar122);
      }
      if (bVar129 != false) {
        return bVar129;
      }
      fVar178 = ray->tfar;
      auVar142._4_4_ = fVar178;
      auVar142._0_4_ = fVar178;
      auVar142._8_4_ = fVar178;
      auVar142._12_4_ = fVar178;
      auVar142._16_4_ = fVar178;
      auVar142._20_4_ = fVar178;
      auVar142._24_4_ = fVar178;
      auVar142._28_4_ = fVar178;
      auVar135 = vcmpps_avx(local_80,auVar142,2);
      uVar122 = vmovmskps_avx(auVar135);
      uVar122 = (uint)uVar128 & uVar122;
    } while (uVar122 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }